

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86_avx512.cpp
# Opt level: O1

void ncnn::softmax(float *_ptr,int elemcount,int elempack,int stride,int size1,float *_maxptr,
                  float *_sumptr)

{
  uint *puVar1;
  int *piVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  ulong uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  byte bVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  byte bVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float afVar73 [16];
  undefined1 (*pauVar74) [64];
  uint uVar75;
  ulong uVar76;
  ulong uVar77;
  undefined1 (*pauVar78) [64];
  int iVar79;
  float *pfVar80;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  long lVar81;
  undefined1 (*pauVar82) [64];
  long lVar83;
  uint uVar84;
  ushort uVar85;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar86 [16];
  undefined1 auVar102 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar119 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar101 [16];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar193 [16];
  float fVar192;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [16];
  undefined1 auVar232 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float afVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float afVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  float afVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  float afVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  float afVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float afVar268 [16];
  float afVar269 [16];
  float afVar270 [16];
  undefined1 auVar271 [32];
  float afVar272 [16];
  undefined1 auVar165 [64];
  undefined1 auVar123 [32];
  undefined1 auVar134 [32];
  
  uVar75 = 0;
  pauVar74 = (undefined1 (*) [64])_maxptr;
  if (0xf < size1) {
    uVar75 = size1 & 0x7ffffff0;
    iVar79 = 0xf;
    auVar140 = vpbroadcastd_avx512f(ZEXT416(0xff7fffff));
    do {
      auVar141 = vmovdqu64_avx512f(auVar140);
      *pauVar74 = auVar141;
      pauVar74 = pauVar74 + 1;
      iVar79 = iVar79 + 0x10;
    } while (iVar79 < size1);
  }
  if ((int)(uVar75 | 7) < size1) {
    auVar102._8_4_ = 0xff7fffff;
    auVar102._0_8_ = 0xff7fffffff7fffff;
    auVar102._12_4_ = 0xff7fffff;
    auVar102._16_4_ = 0xff7fffff;
    auVar102._20_4_ = 0xff7fffff;
    auVar102._24_4_ = 0xff7fffff;
    auVar102._28_4_ = 0xff7fffff;
    uVar84 = uVar75;
    do {
      *(undefined1 (*) [32])*pauVar74 = auVar102;
      pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x20);
      uVar75 = uVar84 + 8;
      iVar79 = uVar84 + 0xf;
      uVar84 = uVar75;
    } while (iVar79 < size1);
  }
  if ((int)(uVar75 | 3) < size1) {
    auVar86._8_4_ = 0xff7fffff;
    auVar86._0_8_ = 0xff7fffffff7fffff;
    auVar86._12_4_ = 0xff7fffff;
    uVar84 = uVar75;
    do {
      *(undefined1 (*) [16])*pauVar74 = auVar86;
      pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x10);
      uVar75 = uVar84 + 4;
      iVar79 = uVar84 + 7;
      uVar84 = uVar75;
    } while (iVar79 < size1);
  }
  if ((int)uVar75 < size1) {
    auVar140 = vpbroadcastq_avx512f();
    uVar76 = 0;
    auVar141 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar142 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar143 = vbroadcastss_avx512f(ZEXT416(0xff7fffff));
    do {
      auVar144 = vpbroadcastq_avx512f();
      auVar145 = vporq_avx512f(auVar144,auVar141);
      auVar144 = vporq_avx512f(auVar144,auVar142);
      uVar21 = vpcmpuq_avx512f(auVar144,auVar140,2);
      uVar22 = vpcmpuq_avx512f(auVar145,auVar140,2);
      bVar59 = (byte)uVar22;
      uVar85 = CONCAT11(bVar59,(byte)uVar21);
      puVar1 = (uint *)(*pauVar74 + uVar76 * 4);
      bVar6 = (bool)((byte)uVar21 & 1);
      bVar7 = (bool)((byte)(uVar85 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar85 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar85 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar85 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar85 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar85 >> 6) & 1);
      bVar13 = (bool)((byte)(uVar85 >> 7) & 1);
      bVar14 = (bool)(bVar59 >> 1 & 1);
      bVar15 = (bool)(bVar59 >> 2 & 1);
      bVar16 = (bool)(bVar59 >> 3 & 1);
      bVar17 = (bool)(bVar59 >> 4 & 1);
      bVar18 = (bool)(bVar59 >> 5 & 1);
      bVar19 = (bool)(bVar59 >> 6 & 1);
      *puVar1 = (uint)bVar6 * auVar143._0_4_ | (uint)!bVar6 * *puVar1;
      puVar1[1] = (uint)bVar7 * auVar143._4_4_ | (uint)!bVar7 * puVar1[1];
      puVar1[2] = (uint)bVar8 * auVar143._8_4_ | (uint)!bVar8 * puVar1[2];
      puVar1[3] = (uint)bVar9 * auVar143._12_4_ | (uint)!bVar9 * puVar1[3];
      puVar1[4] = (uint)bVar10 * auVar143._16_4_ | (uint)!bVar10 * puVar1[4];
      puVar1[5] = (uint)bVar11 * auVar143._20_4_ | (uint)!bVar11 * puVar1[5];
      puVar1[6] = (uint)bVar12 * auVar143._24_4_ | (uint)!bVar12 * puVar1[6];
      puVar1[7] = (uint)bVar13 * auVar143._28_4_ | (uint)!bVar13 * puVar1[7];
      puVar1[8] = (uint)(bVar59 & 1) * auVar143._32_4_ | (uint)!(bool)(bVar59 & 1) * puVar1[8];
      puVar1[9] = (uint)bVar14 * auVar143._36_4_ | (uint)!bVar14 * puVar1[9];
      puVar1[10] = (uint)bVar15 * auVar143._40_4_ | (uint)!bVar15 * puVar1[10];
      puVar1[0xb] = (uint)bVar16 * auVar143._44_4_ | (uint)!bVar16 * puVar1[0xb];
      puVar1[0xc] = (uint)bVar17 * auVar143._48_4_ | (uint)!bVar17 * puVar1[0xc];
      puVar1[0xd] = (uint)bVar18 * auVar143._52_4_ | (uint)!bVar18 * puVar1[0xd];
      puVar1[0xe] = (uint)bVar19 * auVar143._56_4_ | (uint)!bVar19 * puVar1[0xe];
      puVar1[0xf] = (uint)(bVar59 >> 7) * auVar143._60_4_ | (uint)!(bool)(bVar59 >> 7) * puVar1[0xf]
      ;
      uVar76 = uVar76 + 0x10;
    } while (((ulong)(~uVar75 + size1) + 0x10 & 0xfffffffffffffff0) != uVar76);
  }
  uVar75 = 0;
  pfVar80 = _sumptr;
  if (0xf < size1) {
    uVar76 = (ulong)(size1 - 0x10U >> 4);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    memset(_sumptr,0,uVar76 * 0x40 + 0x40);
    pfVar80 = _sumptr + uVar76 * 0x10 + 0x10;
    uVar75 = (size1 - 0x10U & 0xfffffff0) + 0x10;
  }
  if ((int)(uVar75 | 7) < size1) {
    uVar84 = (size1 - uVar75) - 8;
    uVar76 = (ulong)(uVar84 >> 3);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    memset(pfVar80,0,uVar76 * 0x20 + 0x20);
    pfVar80 = pfVar80 + uVar76 * 8 + 8;
    uVar75 = uVar75 + (uVar84 & 0xfffffff8) + 8;
  }
  if ((int)(uVar75 | 3) < size1) {
    iVar79 = uVar75 + 7;
    if ((int)(uVar75 + 7) < size1) {
      iVar79 = size1;
    }
    uVar84 = (iVar79 - uVar75) - 4;
    uVar76 = (ulong)(uVar84 >> 2);
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    memset(pfVar80,0,uVar76 * 0x10 + 0x10);
    pfVar80 = pfVar80 + uVar76 * 4 + 4;
    uVar75 = uVar75 + (uVar84 & 0xfffffffc) + 4;
  }
  if ((int)uVar75 < size1) {
    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
    memset(pfVar80,0,(ulong)(~uVar75 + size1) * 4 + 4);
  }
  auVar141 = _DAT_005f99c0;
  auVar140 = _DAT_005f9800;
  if (elempack < 8) {
    if (elempack == 1) {
      if (0 < elemcount) {
        uVar76 = 0;
        do {
          pauVar74 = (undefined1 (*) [64])(_ptr + uVar76 * (long)stride);
          pauVar78 = (undefined1 (*) [64])_maxptr;
          if (size1 < 0x10) {
            uVar75 = 0;
          }
          else {
            iVar79 = 0xf;
            do {
              auVar140 = vmaxps_avx512f(*pauVar78,*pauVar74);
              *pauVar78 = auVar140;
              pauVar74 = pauVar74 + 1;
              pauVar78 = pauVar78 + 1;
              iVar79 = iVar79 + 0x10;
              uVar75 = size1 & 0xfffffff0;
            } while (iVar79 < size1);
          }
          uVar84 = uVar75 | 7;
          while ((int)uVar84 < size1) {
            auVar102 = vmaxps_avx(*(undefined1 (*) [32])*pauVar78,*(undefined1 (*) [32])*pauVar74);
            *(undefined1 (*) [32])*pauVar78 = auVar102;
            pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x20);
            pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x20);
            uVar84 = uVar75 + 0xf;
            uVar75 = uVar75 + 8;
          }
          uVar84 = uVar75 | 3;
          while ((int)uVar84 < size1) {
            auVar86 = vmaxps_avx(*(undefined1 (*) [16])*pauVar78,*(undefined1 (*) [16])*pauVar74);
            *(undefined1 (*) [16])*pauVar78 = auVar86;
            pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x10);
            pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x10);
            uVar84 = uVar75 + 7;
            uVar75 = uVar75 + 4;
          }
          if ((int)uVar75 < size1) {
            lVar81 = 0;
            do {
              auVar86 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar74 + lVar81 * 4)),
                                   ZEXT416(*(uint *)(*pauVar78 + lVar81 * 4)));
              *(int *)(*pauVar78 + lVar81 * 4) = auVar86._0_4_;
              lVar81 = lVar81 + 1;
            } while (size1 - uVar75 != (int)lVar81);
          }
          uVar76 = uVar76 + 1;
        } while (uVar76 != (uint)elemcount);
        if (0 < elemcount) {
          auVar140 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar141 = vxorps_avx512dq(auVar140,(undefined1  [64])::_ps512_cephes_exp_C1);
          auVar140 = vxorps_avx512dq(auVar140,(undefined1  [64])::_ps512_cephes_exp_C2);
          auVar142 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          uVar76 = 0;
          auVar103 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar107 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar109 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
          auVar110 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar116 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar86 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          do {
            afVar255 = ::_ps512_cephes_exp_p5;
            afVar250 = ::_ps512_cephes_exp_p4;
            afVar246 = ::_ps512_cephes_exp_p3;
            afVar242 = ::_ps512_cephes_exp_p2;
            afVar237 = ::_ps512_cephes_exp_p1;
            afVar268 = ::_ps512_cephes_exp_p0;
            afVar269 = ::_ps512_cephes_LOG2EF;
            afVar73 = ::_ps512_exp_lo;
            afVar272 = ::_ps512_exp_hi;
            afVar270 = ::_ps512_1;
            pauVar74 = (undefined1 (*) [64])(_ptr + uVar76 * (long)stride);
            pauVar78 = (undefined1 (*) [64])_sumptr;
            pauVar82 = (undefined1 (*) [64])_maxptr;
            if (size1 < 0x10) {
              uVar75 = 0;
            }
            else {
              iVar79 = 0xf;
              do {
                auVar143 = vsubps_avx512f(*pauVar74,*pauVar82);
                auVar143 = vminps_avx512f(auVar143,(undefined1  [64])afVar272);
                auVar143 = vmaxps_avx512f(auVar143,(undefined1  [64])afVar73);
                auVar144 = vfmadd213ps_avx512f((undefined1  [64])afVar269,auVar143,
                                               (undefined1  [64])afVar255);
                auVar145 = vrndscaleps_avx512f(auVar144,1);
                uVar77 = vcmpps_avx512f(auVar144,auVar145,1);
                auVar144 = vsubps_avx512f(auVar145,(undefined1  [64])afVar270);
                bVar6 = (bool)((byte)uVar77 & 1);
                auVar179._0_4_ = (uint)bVar6 * auVar144._0_4_ | (uint)!bVar6 * auVar145._0_4_;
                bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
                auVar179._4_4_ = (uint)bVar6 * auVar144._4_4_ | (uint)!bVar6 * auVar145._4_4_;
                bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                auVar179._8_4_ = (uint)bVar6 * auVar144._8_4_ | (uint)!bVar6 * auVar145._8_4_;
                bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
                auVar179._12_4_ = (uint)bVar6 * auVar144._12_4_ | (uint)!bVar6 * auVar145._12_4_;
                bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
                auVar179._16_4_ = (uint)bVar6 * auVar144._16_4_ | (uint)!bVar6 * auVar145._16_4_;
                bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
                auVar179._20_4_ = (uint)bVar6 * auVar144._20_4_ | (uint)!bVar6 * auVar145._20_4_;
                bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
                auVar179._24_4_ = (uint)bVar6 * auVar144._24_4_ | (uint)!bVar6 * auVar145._24_4_;
                bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
                auVar179._28_4_ = (uint)bVar6 * auVar144._28_4_ | (uint)!bVar6 * auVar145._28_4_;
                bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
                auVar179._32_4_ = (uint)bVar6 * auVar144._32_4_ | (uint)!bVar6 * auVar145._32_4_;
                bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
                auVar179._36_4_ = (uint)bVar6 * auVar144._36_4_ | (uint)!bVar6 * auVar145._36_4_;
                bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
                auVar179._40_4_ = (uint)bVar6 * auVar144._40_4_ | (uint)!bVar6 * auVar145._40_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
                auVar179._44_4_ = (uint)bVar6 * auVar144._44_4_ | (uint)!bVar6 * auVar145._44_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
                auVar179._48_4_ = (uint)bVar6 * auVar144._48_4_ | (uint)!bVar6 * auVar145._48_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
                auVar179._52_4_ = (uint)bVar6 * auVar144._52_4_ | (uint)!bVar6 * auVar145._52_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
                auVar179._56_4_ = (uint)bVar6 * auVar144._56_4_ | (uint)!bVar6 * auVar145._56_4_;
                bVar6 = SUB81(uVar77 >> 0xf,0);
                auVar179._60_4_ = (uint)bVar6 * auVar144._60_4_ | (uint)!bVar6 * auVar145._60_4_;
                auVar143 = vfmadd231ps_avx512f(auVar143,auVar179,auVar141);
                auVar143 = vfmadd231ps_avx512f(auVar143,auVar179,auVar140);
                auVar144 = vmulps_avx512f(auVar143,auVar143);
                auVar145 = vfmadd213ps_avx512f(auVar143,(undefined1  [64])afVar268,
                                               (undefined1  [64])afVar237);
                auVar145 = vfmadd213ps_avx512f(auVar145,auVar143,(undefined1  [64])afVar242);
                auVar145 = vfmadd213ps_avx512f(auVar145,auVar143,(undefined1  [64])afVar246);
                auVar145 = vfmadd213ps_avx512f(auVar145,auVar143,(undefined1  [64])afVar250);
                auVar145 = vfmadd213ps_avx512f(auVar145,auVar143,(undefined1  [64])afVar255);
                auVar143 = vfmadd213ps_avx512f(auVar145,auVar144,auVar143);
                auVar143 = vaddps_avx512f(auVar143,(undefined1  [64])afVar270);
                auVar144 = vcvttps2dq_avx512f(auVar179);
                auVar144 = vpaddd_avx512f(auVar144,auVar142);
                auVar144 = vpslld_avx512f(auVar144,0x17);
                auVar143 = vmulps_avx512f(auVar143,auVar144);
                auVar144 = vaddps_avx512f(auVar143,*pauVar78);
                *pauVar74 = auVar143;
                *pauVar78 = auVar144;
                pauVar74 = pauVar74 + 1;
                pauVar82 = pauVar82 + 1;
                pauVar78 = pauVar78 + 1;
                iVar79 = iVar79 + 0x10;
                uVar75 = size1 & 0xfffffff0;
              } while (iVar79 < size1);
            }
            auVar95._8_4_ = 0x3f000000;
            auVar95._0_8_ = 0x3f0000003f000000;
            auVar95._12_4_ = 0x3f000000;
            auVar97._8_4_ = 0x3fb8aa3b;
            auVar97._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar97._12_4_ = 0x3fb8aa3b;
            auVar99._8_4_ = 0xbf800000;
            auVar99._0_8_ = 0xbf800000bf800000;
            auVar99._12_4_ = 0xbf800000;
            auVar231._8_4_ = 0x3f318000;
            auVar231._0_8_ = 0x3f3180003f318000;
            auVar231._12_4_ = 0x3f318000;
            auVar244._8_4_ = 0x39506967;
            auVar244._0_8_ = 0x3950696739506967;
            auVar244._12_4_ = 0x39506967;
            auVar253._8_4_ = 0x3c088908;
            auVar253._0_8_ = 0x3c0889083c088908;
            auVar253._12_4_ = 0x3c088908;
            auVar257._8_4_ = 0x3d2aa9c1;
            auVar257._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar257._12_4_ = 0x3d2aa9c1;
            auVar260._8_4_ = 0x3e2aaaaa;
            auVar260._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar260._12_4_ = 0x3e2aaaaa;
            auVar263._8_4_ = 0x3f800000;
            auVar263._0_8_ = 0x3f8000003f800000;
            auVar263._12_4_ = 0x3f800000;
            uVar84 = uVar75 | 7;
            while ((int)uVar84 < size1) {
              auVar118 = vsubps_avx(*(undefined1 (*) [32])*pauVar74,*(undefined1 (*) [32])*pauVar82)
              ;
              auVar118 = vminps_avx512vl(auVar118,auVar103);
              auVar120 = vmaxps_avx512vl(auVar118,auVar104);
              auVar121 = vfmadd231ps_avx512vl(auVar105,auVar120,auVar106);
              auVar118 = vroundps_avx(auVar121,1);
              uVar77 = vcmpps_avx512vl(auVar121,auVar118,1);
              auVar122 = vaddps_avx512vl(auVar118,auVar107);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar123._0_4_ = (float)((uint)bVar6 * auVar122._0_4_ | (uint)!bVar6 * auVar118._0_4_)
              ;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar123._4_4_ = (float)((uint)bVar6 * auVar122._4_4_ | (uint)!bVar6 * auVar118._4_4_)
              ;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar123._8_4_ = (float)((uint)bVar6 * auVar122._8_4_ | (uint)!bVar6 * auVar118._8_4_)
              ;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar123._12_4_ =
                   (float)((uint)bVar6 * auVar122._12_4_ | (uint)!bVar6 * auVar118._12_4_);
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar123._16_4_ =
                   (float)((uint)bVar6 * auVar122._16_4_ | (uint)!bVar6 * auVar118._16_4_);
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar123._20_4_ =
                   (float)((uint)bVar6 * auVar122._20_4_ | (uint)!bVar6 * auVar118._20_4_);
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar123._24_4_ =
                   (float)((uint)bVar6 * auVar122._24_4_ | (uint)!bVar6 * auVar118._24_4_);
              bVar6 = SUB81(uVar77 >> 7,0);
              auVar123._28_4_ =
                   (float)((uint)bVar6 * auVar122._28_4_ | (uint)!bVar6 * auVar118._28_4_);
              auVar118 = vfmsub231ps_avx512vl(auVar120,auVar123,auVar108);
              auVar118 = vfmsub231ps_avx512vl(auVar118,auVar123,auVar109);
              auVar60._4_4_ = auVar118._4_4_ * auVar118._4_4_;
              auVar60._0_4_ = auVar118._0_4_ * auVar118._0_4_;
              auVar60._8_4_ = auVar118._8_4_ * auVar118._8_4_;
              auVar60._12_4_ = auVar118._12_4_ * auVar118._12_4_;
              auVar60._16_4_ = auVar118._16_4_ * auVar118._16_4_;
              auVar60._20_4_ = auVar118._20_4_ * auVar118._20_4_;
              auVar60._24_4_ = auVar118._24_4_ * auVar118._24_4_;
              auVar60._28_4_ = auVar121._28_4_;
              auVar120 = vfmadd213ps_avx512vl(auVar110,auVar118,auVar102);
              auVar120 = vfmadd213ps_avx512vl(auVar120,auVar118,auVar111);
              auVar120 = vfmadd213ps_avx512vl(auVar120,auVar118,auVar112);
              auVar120 = vfmadd213ps_avx512vl(auVar120,auVar118,auVar114);
              auVar120 = vfmadd213ps_avx512vl(auVar120,auVar118,auVar105);
              auVar88 = vfmadd213ps_fma(auVar120,auVar60,auVar118);
              auVar199._0_4_ = (int)auVar123._0_4_;
              auVar199._4_4_ = (int)auVar123._4_4_;
              auVar199._8_4_ = (int)auVar123._8_4_;
              auVar199._12_4_ = (int)auVar123._12_4_;
              auVar199._16_4_ = (int)auVar123._16_4_;
              auVar199._20_4_ = (int)auVar123._20_4_;
              auVar199._24_4_ = (int)auVar123._24_4_;
              auVar199._28_4_ = (int)auVar123._28_4_;
              auVar118 = vpslld_avx2(auVar199,0x17);
              auVar118 = vpaddd_avx512vl(auVar118,auVar116);
              auVar88 = vfmadd213ps_fma(auVar118,ZEXT1632(auVar88),auVar118);
              auVar209._0_4_ = auVar88._0_4_ + *(float *)*pauVar78;
              auVar209._4_4_ = auVar88._4_4_ + *(float *)(*pauVar78 + 4);
              auVar209._8_4_ = auVar88._8_4_ + *(float *)(*pauVar78 + 8);
              auVar209._12_4_ = auVar88._12_4_ + *(float *)(*pauVar78 + 0xc);
              auVar209._16_4_ = *(float *)(*pauVar78 + 0x10) + 0.0;
              auVar209._20_4_ = *(float *)(*pauVar78 + 0x14) + 0.0;
              auVar209._24_4_ = *(float *)(*pauVar78 + 0x18) + 0.0;
              auVar209._28_4_ = *(float *)(*pauVar78 + 0x1c) + 0.0;
              *(undefined1 (*) [32])*pauVar74 = ZEXT1632(auVar88);
              *(undefined1 (*) [32])*pauVar78 = auVar209;
              pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x20);
              pauVar82 = (undefined1 (*) [64])(*pauVar82 + 0x20);
              pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x20);
              uVar84 = uVar75 + 0xf;
              uVar75 = uVar75 + 8;
            }
            auVar239._8_4_ = 0x395e8083;
            auVar239._0_8_ = 0x395e8083395e8083;
            auVar239._12_4_ = 0x395e8083;
            auVar248._8_4_ = 0x3ab743ce;
            auVar248._0_8_ = 0x3ab743ce3ab743ce;
            auVar248._12_4_ = 0x3ab743ce;
            uVar84 = uVar75 | 3;
            while ((int)uVar84 < size1) {
              auVar88 = vsubps_avx(*(undefined1 (*) [16])*pauVar74,*(undefined1 (*) [16])*pauVar82);
              auVar88 = vminps_avx512vl(auVar88,auVar87);
              auVar90 = vmaxps_avx512vl(auVar88,auVar86);
              auVar89 = vfmadd231ps_fma(auVar95,auVar90,auVar97);
              auVar215._0_4_ = (int)auVar89._0_4_;
              auVar215._4_4_ = (int)auVar89._4_4_;
              auVar215._8_4_ = (int)auVar89._8_4_;
              auVar215._12_4_ = (int)auVar89._12_4_;
              auVar88 = vcvtdq2ps_avx(auVar215);
              uVar77 = vcmpps_avx512vl(auVar89,auVar88,1);
              auVar89 = vaddps_avx512vl(auVar88,auVar99);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar101._0_4_ = (float)((uint)bVar6 * auVar89._0_4_ | (uint)!bVar6 * auVar88._0_4_);
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar101._4_4_ = (float)((uint)bVar6 * auVar89._4_4_ | (uint)!bVar6 * auVar88._4_4_);
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar101._8_4_ = (float)((uint)bVar6 * auVar89._8_4_ | (uint)!bVar6 * auVar88._8_4_);
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar101._12_4_ =
                   (float)((uint)bVar6 * auVar89._12_4_ | (uint)!bVar6 * auVar88._12_4_);
              auVar88 = vfmsub231ps_fma(auVar90,auVar101,auVar231);
              auVar89 = vfmsub231ps_fma(auVar88,auVar101,auVar239);
              auVar207._0_4_ = auVar89._0_4_ * auVar89._0_4_;
              auVar207._4_4_ = auVar89._4_4_ * auVar89._4_4_;
              auVar207._8_4_ = auVar89._8_4_ * auVar89._8_4_;
              auVar207._12_4_ = auVar89._12_4_ * auVar89._12_4_;
              auVar88 = vfmadd213ps_fma(auVar244,auVar89,auVar248);
              auVar88 = vfmadd213ps_fma(auVar88,auVar89,auVar253);
              auVar88 = vfmadd213ps_fma(auVar88,auVar89,auVar257);
              auVar88 = vfmadd213ps_fma(auVar88,auVar89,auVar260);
              auVar88 = vfmadd213ps_fma(auVar88,auVar89,auVar95);
              auVar89 = vfmadd213ps_fma(auVar88,auVar207,auVar89);
              auVar193._0_4_ = (int)auVar101._0_4_;
              auVar193._4_4_ = (int)auVar101._4_4_;
              auVar193._8_4_ = (int)auVar101._8_4_;
              auVar193._12_4_ = (int)auVar101._12_4_;
              auVar88 = vpslld_avx(auVar193,0x17);
              auVar88 = vpaddd_avx(auVar263,auVar88);
              auVar88 = vfmadd213ps_fma(auVar88,auVar89,auVar88);
              auVar208._0_4_ = auVar88._0_4_ + *(float *)*pauVar78;
              auVar208._4_4_ = auVar88._4_4_ + *(float *)(*pauVar78 + 4);
              auVar208._8_4_ = auVar88._8_4_ + *(float *)(*pauVar78 + 8);
              auVar208._12_4_ = auVar88._12_4_ + *(float *)(*pauVar78 + 0xc);
              *(undefined1 (*) [16])*pauVar74 = auVar88;
              *(undefined1 (*) [16])*pauVar78 = auVar208;
              pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x10);
              pauVar82 = (undefined1 (*) [64])(*pauVar82 + 0x10);
              pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x10);
              uVar84 = uVar75 + 7;
              uVar75 = uVar75 + 4;
            }
            if ((int)uVar75 < size1) {
              lVar81 = 0;
              do {
                fVar192 = expf(*(float *)(*pauVar74 + lVar81 * 4) -
                               *(float *)(*pauVar82 + lVar81 * 4));
                *(float *)(*pauVar74 + lVar81 * 4) = fVar192;
                *(float *)(*pauVar78 + lVar81 * 4) = fVar192 + *(float *)(*pauVar78 + lVar81 * 4);
                lVar81 = lVar81 + 1;
              } while (size1 - uVar75 != (int)lVar81);
            }
            uVar76 = uVar76 + 1;
            auVar142 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
            auVar103 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
            auVar104 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
            auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
            auVar107 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
            auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
            auVar110 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
            auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
            auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
            auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar116 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar87 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
            auVar86 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          } while (uVar76 != (uint)elemcount);
        }
      }
      uVar75 = 0;
      pauVar74 = (undefined1 (*) [64])_sumptr;
      if (0xf < size1) {
        iVar79 = 0xf;
        auVar140 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        do {
          auVar141 = vdivps_avx512f(auVar140,*pauVar74);
          *pauVar74 = auVar141;
          pauVar74 = pauVar74 + 1;
          iVar79 = iVar79 + 0x10;
        } while (iVar79 < size1);
        uVar75 = size1 & 0x7ffffff0;
      }
      if ((int)(uVar75 | 7) < size1) {
        auVar200._8_4_ = 0x3f800000;
        auVar200._0_8_ = 0x3f8000003f800000;
        auVar200._12_4_ = 0x3f800000;
        auVar200._16_4_ = 0x3f800000;
        auVar200._20_4_ = 0x3f800000;
        auVar200._24_4_ = 0x3f800000;
        auVar200._28_4_ = 0x3f800000;
        uVar84 = uVar75;
        do {
          auVar102 = vdivps_avx(auVar200,*(undefined1 (*) [32])*pauVar74);
          *(undefined1 (*) [32])*pauVar74 = auVar102;
          pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x20);
          uVar75 = uVar84 + 8;
          iVar79 = uVar84 + 0xf;
          uVar84 = uVar75;
        } while (iVar79 < size1);
      }
      if ((int)(uVar75 | 3) < size1) {
        auVar195._8_4_ = 0x3f800000;
        auVar195._0_8_ = 0x3f8000003f800000;
        auVar195._12_4_ = 0x3f800000;
        uVar84 = uVar75;
        do {
          auVar86 = vdivps_avx(auVar195,*(undefined1 (*) [16])*pauVar74);
          *(undefined1 (*) [16])*pauVar74 = auVar86;
          pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x10);
          uVar75 = uVar84 + 4;
          iVar79 = uVar84 + 7;
          uVar84 = uVar75;
        } while (iVar79 < size1);
      }
      if ((int)uVar75 < size1) {
        auVar140 = vpbroadcastq_avx512f();
        uVar76 = 0;
        auVar141 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar142 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar143 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        do {
          auVar144 = vpbroadcastq_avx512f();
          auVar145 = vporq_avx512f(auVar144,auVar141);
          auVar144 = vporq_avx512f(auVar144,auVar142);
          uVar21 = vpcmpuq_avx512f(auVar144,auVar140,2);
          bVar59 = (byte)uVar21;
          uVar21 = vpcmpuq_avx512f(auVar145,auVar140,2);
          bVar62 = (byte)uVar21;
          uVar85 = CONCAT11(bVar62,bVar59);
          piVar2 = (int *)(*pauVar74 + uVar76 * 4);
          auVar191._4_4_ = (uint)((byte)(uVar85 >> 1) & 1) * piVar2[1];
          auVar191._0_4_ = (uint)(bVar59 & 1) * *piVar2;
          auVar191._8_4_ = (uint)((byte)(uVar85 >> 2) & 1) * piVar2[2];
          auVar191._12_4_ = (uint)((byte)(uVar85 >> 3) & 1) * piVar2[3];
          auVar191._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * piVar2[4];
          auVar191._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * piVar2[5];
          auVar191._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * piVar2[6];
          auVar191._28_4_ = (uint)((byte)(uVar85 >> 7) & 1) * piVar2[7];
          auVar191._32_4_ = (uint)(bVar62 & 1) * piVar2[8];
          auVar191._36_4_ = (uint)(bVar62 >> 1 & 1) * piVar2[9];
          auVar191._40_4_ = (uint)(bVar62 >> 2 & 1) * piVar2[10];
          auVar191._44_4_ = (uint)(bVar62 >> 3 & 1) * piVar2[0xb];
          auVar191._48_4_ = (uint)(bVar62 >> 4 & 1) * piVar2[0xc];
          auVar191._52_4_ = (uint)(bVar62 >> 5 & 1) * piVar2[0xd];
          auVar191._56_4_ = (uint)(bVar62 >> 6 & 1) * piVar2[0xe];
          auVar191._60_4_ = (uint)(bVar62 >> 7) * piVar2[0xf];
          auVar144 = vdivps_avx512f(auVar143,auVar191);
          puVar1 = (uint *)(*pauVar74 + uVar76 * 4);
          bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
          bVar13 = (bool)(bVar62 >> 1 & 1);
          bVar14 = (bool)(bVar62 >> 2 & 1);
          bVar15 = (bool)(bVar62 >> 3 & 1);
          bVar16 = (bool)(bVar62 >> 4 & 1);
          bVar17 = (bool)(bVar62 >> 5 & 1);
          bVar18 = (bool)(bVar62 >> 6 & 1);
          *puVar1 = (uint)(bVar59 & 1) * auVar144._0_4_ | (uint)!(bool)(bVar59 & 1) * *puVar1;
          puVar1[1] = (uint)bVar6 * auVar144._4_4_ | (uint)!bVar6 * puVar1[1];
          puVar1[2] = (uint)bVar7 * auVar144._8_4_ | (uint)!bVar7 * puVar1[2];
          puVar1[3] = (uint)bVar8 * auVar144._12_4_ | (uint)!bVar8 * puVar1[3];
          puVar1[4] = (uint)bVar9 * auVar144._16_4_ | (uint)!bVar9 * puVar1[4];
          puVar1[5] = (uint)bVar10 * auVar144._20_4_ | (uint)!bVar10 * puVar1[5];
          puVar1[6] = (uint)bVar11 * auVar144._24_4_ | (uint)!bVar11 * puVar1[6];
          puVar1[7] = (uint)bVar12 * auVar144._28_4_ | (uint)!bVar12 * puVar1[7];
          puVar1[8] = (uint)(bVar62 & 1) * auVar144._32_4_ | (uint)!(bool)(bVar62 & 1) * puVar1[8];
          puVar1[9] = (uint)bVar13 * auVar144._36_4_ | (uint)!bVar13 * puVar1[9];
          puVar1[10] = (uint)bVar14 * auVar144._40_4_ | (uint)!bVar14 * puVar1[10];
          puVar1[0xb] = (uint)bVar15 * auVar144._44_4_ | (uint)!bVar15 * puVar1[0xb];
          puVar1[0xc] = (uint)bVar16 * auVar144._48_4_ | (uint)!bVar16 * puVar1[0xc];
          puVar1[0xd] = (uint)bVar17 * auVar144._52_4_ | (uint)!bVar17 * puVar1[0xd];
          puVar1[0xe] = (uint)bVar18 * auVar144._56_4_ | (uint)!bVar18 * puVar1[0xe];
          puVar1[0xf] = (uint)(bVar62 >> 7) * auVar144._60_4_ |
                        (uint)!(bool)(bVar62 >> 7) * puVar1[0xf];
          uVar76 = uVar76 + 0x10;
        } while (((ulong)(~uVar75 + size1) + 0x10 & 0xfffffffffffffff0) != uVar76);
      }
      if (0 < elemcount) {
        uVar76 = 0;
        do {
          pauVar74 = (undefined1 (*) [64])(_ptr + uVar76 * (long)stride);
          pauVar78 = (undefined1 (*) [64])_sumptr;
          if (size1 < 0x10) {
            uVar75 = 0;
          }
          else {
            iVar79 = 0xf;
            do {
              auVar140 = vmulps_avx512f(*pauVar78,*pauVar74);
              *pauVar74 = auVar140;
              pauVar74 = pauVar74 + 1;
              pauVar78 = pauVar78 + 1;
              iVar79 = iVar79 + 0x10;
              uVar75 = size1 & 0xfffffff0;
            } while (iVar79 < size1);
          }
          uVar84 = uVar75 | 7;
          while ((int)uVar84 < size1) {
            auVar67._4_4_ = *(float *)(*pauVar78 + 4) * *(float *)(*pauVar74 + 4);
            auVar67._0_4_ = *(float *)*pauVar78 * *(float *)*pauVar74;
            auVar67._8_4_ = *(float *)(*pauVar78 + 8) * *(float *)(*pauVar74 + 8);
            auVar67._12_4_ = *(float *)(*pauVar78 + 0xc) * *(float *)(*pauVar74 + 0xc);
            auVar67._16_4_ = *(float *)(*pauVar78 + 0x10) * *(float *)(*pauVar74 + 0x10);
            auVar67._20_4_ = *(float *)(*pauVar78 + 0x14) * *(float *)(*pauVar74 + 0x14);
            auVar67._24_4_ = *(float *)(*pauVar78 + 0x18) * *(float *)(*pauVar74 + 0x18);
            auVar67._28_4_ = *(undefined4 *)(*pauVar78 + 0x1c);
            *(undefined1 (*) [32])*pauVar74 = auVar67;
            pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x20);
            pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x20);
            uVar84 = uVar75 + 0xf;
            uVar75 = uVar75 + 8;
          }
          uVar84 = uVar75 | 3;
          while ((int)uVar84 < size1) {
            auVar196._0_4_ = *(float *)*pauVar78 * *(float *)*pauVar74;
            auVar196._4_4_ = *(float *)(*pauVar78 + 4) * *(float *)(*pauVar74 + 4);
            auVar196._8_4_ = *(float *)(*pauVar78 + 8) * *(float *)(*pauVar74 + 8);
            auVar196._12_4_ = *(float *)(*pauVar78 + 0xc) * *(float *)(*pauVar74 + 0xc);
            *(undefined1 (*) [16])*pauVar74 = auVar196;
            pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x10);
            pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x10);
            uVar84 = uVar75 + 7;
            uVar75 = uVar75 + 4;
          }
          if ((int)uVar75 < size1) {
            lVar81 = 0;
            do {
              *(float *)(*pauVar74 + lVar81 * 4) =
                   *(float *)(*pauVar74 + lVar81 * 4) * *(float *)(*pauVar78 + lVar81 * 4);
              lVar81 = lVar81 + 1;
            } while (size1 - uVar75 != (int)lVar81);
          }
          uVar76 = uVar76 + 1;
        } while (uVar76 != (uint)elemcount);
      }
    }
    else if (elempack == 4) {
      if (0 < elemcount) {
        uVar76 = 0;
        do {
          pauVar74 = (undefined1 (*) [64])(_ptr + uVar76 * (long)stride);
          pauVar78 = (undefined1 (*) [64])_maxptr;
          if (size1 < 0x10) {
            uVar75 = 0;
          }
          else {
            iVar79 = 0xf;
            do {
              auVar141 = vunpcklps_avx512f(*pauVar74,pauVar74[1]);
              auVar142 = vunpckhps_avx512f(*pauVar74,pauVar74[1]);
              auVar141 = vmaxps_avx512f(auVar141,auVar142);
              auVar142 = vunpcklps_avx512f(pauVar74[2],pauVar74[3]);
              auVar143 = vunpckhps_avx512f(pauVar74[2],pauVar74[3]);
              auVar142 = vmaxps_avx512f(auVar142,auVar143);
              auVar143 = vunpcklps_avx512f(auVar141,auVar142);
              auVar141 = vunpckhps_avx512f(auVar141,auVar142);
              auVar141 = vmaxps_avx512f(auVar143,auVar141);
              auVar141 = vpermps_avx512f(auVar140,auVar141);
              auVar141 = vmaxps_avx512f(auVar141,*pauVar78);
              *pauVar78 = auVar141;
              pauVar74 = pauVar74 + 4;
              pauVar78 = pauVar78 + 1;
              iVar79 = iVar79 + 0x10;
              uVar75 = size1 & 0xfffffff0;
            } while (iVar79 < size1);
          }
          uVar84 = uVar75 | 7;
          while ((int)uVar84 < size1) {
            auVar103 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar74,
                                     *(undefined1 (*) [32])(*pauVar74 + 0x20));
            auVar102 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar74,
                                     *(undefined1 (*) [32])(*pauVar74 + 0x20));
            auVar102 = vmaxps_avx(auVar103,auVar102);
            auVar104 = vunpcklps_avx(*(undefined1 (*) [32])pauVar74[1],
                                     *(undefined1 (*) [32])(pauVar74[1] + 0x20));
            auVar103 = vunpckhps_avx(*(undefined1 (*) [32])pauVar74[1],
                                     *(undefined1 (*) [32])(pauVar74[1] + 0x20));
            auVar103 = vmaxps_avx(auVar104,auVar103);
            auVar220._16_16_ = auVar103._0_16_;
            auVar220._0_16_ = auVar102._0_16_;
            auVar102 = vperm2f128_avx(auVar102,auVar103,0x31);
            auVar103 = vunpcklps_avx(auVar220,auVar102);
            auVar102 = vunpckhps_avx(auVar220,auVar102);
            auVar102 = vmaxps_avx(auVar103,auVar102);
            auVar102 = vmaxps_avx(auVar102,*(undefined1 (*) [32])*pauVar78);
            *(undefined1 (*) [32])*pauVar78 = auVar102;
            pauVar74 = pauVar74 + 2;
            pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x20);
            uVar84 = uVar75 + 0xf;
            uVar75 = uVar75 + 8;
          }
          uVar84 = uVar75 | 3;
          while ((int)uVar84 < size1) {
            auVar87 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar74,
                                    *(undefined1 (*) [16])(*pauVar74 + 0x10));
            auVar90 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar74 + 0x20),
                                    *(undefined1 (*) [16])(*pauVar74 + 0x30));
            auVar88 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar74,
                                    *(undefined1 (*) [16])(*pauVar74 + 0x10));
            auVar89 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar74 + 0x20),
                                    *(undefined1 (*) [16])(*pauVar74 + 0x30));
            auVar86 = vmovlhps_avx(auVar87,auVar90);
            auVar87 = vunpckhpd_avx(auVar87,auVar90);
            auVar86 = vmaxps_avx(auVar86,auVar87);
            auVar87 = vmovlhps_avx(auVar88,auVar89);
            auVar88 = vunpckhpd_avx(auVar88,auVar89);
            auVar87 = vmaxps_avx(auVar87,auVar88);
            auVar86 = vmaxps_avx(auVar86,auVar87);
            auVar86 = vmaxps_avx(auVar86,*(undefined1 (*) [16])*pauVar78);
            *(undefined1 (*) [16])*pauVar78 = auVar86;
            pauVar74 = pauVar74 + 1;
            pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x10);
            uVar84 = uVar75 + 7;
            uVar75 = uVar75 + 4;
          }
          if ((int)uVar75 < size1) {
            lVar81 = 0;
            do {
              auVar205._8_8_ = *(undefined8 *)(*pauVar74 + 8);
              auVar205._0_8_ = *(undefined8 *)(*pauVar74 + 8);
              auVar86 = vmaxps_avx(auVar205,*(undefined1 (*) [16])*pauVar74);
              auVar87 = vmovshdup_avx(auVar86);
              auVar86 = vmaxss_avx(auVar86,auVar87);
              auVar86 = vmaxss_avx(auVar86,ZEXT416(*(uint *)(*pauVar78 + lVar81 * 4)));
              *(int *)(*pauVar78 + lVar81 * 4) = auVar86._0_4_;
              pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x10);
              lVar81 = lVar81 + 1;
            } while (size1 - uVar75 != (int)lVar81);
          }
          afVar272 = ::_ps512_cephes_exp_p5;
          afVar270 = ::_ps512_1;
          uVar76 = uVar76 + 1;
        } while (uVar76 != (uint)elemcount);
        if (0 < elemcount) {
          auVar140 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar141 = vxorps_avx512dq(auVar140,(undefined1  [64])::_ps512_cephes_exp_C1);
          auVar140 = vxorps_avx512dq(auVar140,(undefined1  [64])::_ps512_cephes_exp_C2);
          auVar142 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          uVar76 = 0;
          auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar230._8_4_ = 0x39506967;
          auVar230._0_8_ = 0x3950696739506967;
          auVar230._12_4_ = 0x39506967;
          auVar219._8_4_ = 0x3d2aa9c1;
          auVar219._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar219._12_4_ = 0x3d2aa9c1;
          auVar243._8_4_ = 0x3e2aaaaa;
          auVar243._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar243._12_4_ = 0x3e2aaaaa;
          auVar247._8_4_ = 0x3f800000;
          auVar247._0_8_ = 0x3f8000003f800000;
          auVar247._12_4_ = 0x3f800000;
          do {
            afVar255 = ::_ps512_cephes_exp_p4;
            afVar250 = ::_ps512_cephes_exp_p3;
            afVar246 = ::_ps512_cephes_exp_p2;
            afVar242 = ::_ps512_cephes_exp_p1;
            afVar237 = ::_ps512_cephes_exp_p0;
            afVar268 = ::_ps512_cephes_LOG2EF;
            afVar269 = ::_ps512_exp_lo;
            afVar73 = ::_ps512_exp_hi;
            auVar156 = _DAT_005f9980;
            auVar189 = _DAT_005f9940;
            auVar188 = _DAT_005f9900;
            auVar145 = _DAT_005f98c0;
            auVar144 = _DAT_005f9880;
            auVar143 = _DAT_005f9840;
            pauVar74 = (undefined1 (*) [64])(_ptr + uVar76 * (long)stride);
            pauVar78 = (undefined1 (*) [64])_sumptr;
            pauVar82 = (undefined1 (*) [64])_maxptr;
            if (size1 < 0x10) {
              uVar75 = 0;
            }
            else {
              iVar79 = 0xf;
              do {
                auVar149 = *pauVar82;
                auVar146 = vpermps_avx512f(auVar143,auVar149);
                auVar146 = vsubps_avx512f(*pauVar74,auVar146);
                auVar147 = vpermps_avx512f(auVar144,auVar149);
                auVar147 = vsubps_avx512f(pauVar74[1],auVar147);
                auVar148 = vpermps_avx512f(auVar145,auVar149);
                auVar148 = vsubps_avx512f(pauVar74[2],auVar148);
                auVar149 = vpermps_avx512f(auVar188,auVar149);
                auVar149 = vsubps_avx512f(pauVar74[3],auVar149);
                auVar146 = vminps_avx512f(auVar146,(undefined1  [64])afVar73);
                auVar146 = vmaxps_avx512f(auVar146,(undefined1  [64])afVar269);
                auVar150 = vfmadd213ps_avx512f((undefined1  [64])afVar268,auVar146,
                                               (undefined1  [64])afVar272);
                auVar151 = vrndscaleps_avx512f(auVar150,1);
                uVar77 = vcmpps_avx512f(auVar150,auVar151,1);
                auVar150 = vsubps_avx512f(auVar151,(undefined1  [64])afVar270);
                bVar6 = (bool)((byte)uVar77 & 1);
                auVar152._0_4_ = (uint)bVar6 * auVar150._0_4_ | (uint)!bVar6 * auVar151._0_4_;
                bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
                auVar152._4_4_ = (uint)bVar6 * auVar150._4_4_ | (uint)!bVar6 * auVar151._4_4_;
                bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                auVar152._8_4_ = (uint)bVar6 * auVar150._8_4_ | (uint)!bVar6 * auVar151._8_4_;
                bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
                auVar152._12_4_ = (uint)bVar6 * auVar150._12_4_ | (uint)!bVar6 * auVar151._12_4_;
                bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
                auVar152._16_4_ = (uint)bVar6 * auVar150._16_4_ | (uint)!bVar6 * auVar151._16_4_;
                bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
                auVar152._20_4_ = (uint)bVar6 * auVar150._20_4_ | (uint)!bVar6 * auVar151._20_4_;
                bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
                auVar152._24_4_ = (uint)bVar6 * auVar150._24_4_ | (uint)!bVar6 * auVar151._24_4_;
                bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
                auVar152._28_4_ = (uint)bVar6 * auVar150._28_4_ | (uint)!bVar6 * auVar151._28_4_;
                bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
                auVar152._32_4_ = (uint)bVar6 * auVar150._32_4_ | (uint)!bVar6 * auVar151._32_4_;
                bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
                auVar152._36_4_ = (uint)bVar6 * auVar150._36_4_ | (uint)!bVar6 * auVar151._36_4_;
                bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
                auVar152._40_4_ = (uint)bVar6 * auVar150._40_4_ | (uint)!bVar6 * auVar151._40_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
                auVar152._44_4_ = (uint)bVar6 * auVar150._44_4_ | (uint)!bVar6 * auVar151._44_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
                auVar152._48_4_ = (uint)bVar6 * auVar150._48_4_ | (uint)!bVar6 * auVar151._48_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
                auVar152._52_4_ = (uint)bVar6 * auVar150._52_4_ | (uint)!bVar6 * auVar151._52_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
                auVar152._56_4_ = (uint)bVar6 * auVar150._56_4_ | (uint)!bVar6 * auVar151._56_4_;
                bVar6 = SUB81(uVar77 >> 0xf,0);
                auVar152._60_4_ = (uint)bVar6 * auVar150._60_4_ | (uint)!bVar6 * auVar151._60_4_;
                auVar146 = vfmadd231ps_avx512f(auVar146,auVar152,auVar141);
                auVar146 = vfmadd231ps_avx512f(auVar146,auVar152,auVar140);
                auVar150 = vmulps_avx512f(auVar146,auVar146);
                auVar151 = vfmadd213ps_avx512f(auVar146,(undefined1  [64])afVar237,
                                               (undefined1  [64])afVar242);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar146,(undefined1  [64])afVar246);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar146,(undefined1  [64])afVar250);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar146,(undefined1  [64])afVar255);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar146,(undefined1  [64])afVar272);
                auVar146 = vfmadd213ps_avx512f(auVar151,auVar150,auVar146);
                auVar146 = vaddps_avx512f(auVar146,(undefined1  [64])afVar270);
                auVar150 = vcvttps2dq_avx512f(auVar152);
                auVar150 = vpaddd_avx512f(auVar150,auVar142);
                auVar150 = vpslld_avx512f(auVar150,0x17);
                auVar146 = vmulps_avx512f(auVar146,auVar150);
                auVar147 = vminps_avx512f(auVar147,(undefined1  [64])afVar73);
                auVar147 = vmaxps_avx512f(auVar147,(undefined1  [64])afVar269);
                auVar150 = vfmadd213ps_avx512f((undefined1  [64])afVar268,auVar147,
                                               (undefined1  [64])afVar272);
                auVar151 = vrndscaleps_avx512f(auVar150,1);
                uVar77 = vcmpps_avx512f(auVar150,auVar151,1);
                auVar150 = vsubps_avx512f(auVar151,(undefined1  [64])afVar270);
                bVar6 = (bool)((byte)uVar77 & 1);
                auVar153._0_4_ = (uint)bVar6 * auVar150._0_4_ | (uint)!bVar6 * auVar151._0_4_;
                bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
                auVar153._4_4_ = (uint)bVar6 * auVar150._4_4_ | (uint)!bVar6 * auVar151._4_4_;
                bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                auVar153._8_4_ = (uint)bVar6 * auVar150._8_4_ | (uint)!bVar6 * auVar151._8_4_;
                bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
                auVar153._12_4_ = (uint)bVar6 * auVar150._12_4_ | (uint)!bVar6 * auVar151._12_4_;
                bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
                auVar153._16_4_ = (uint)bVar6 * auVar150._16_4_ | (uint)!bVar6 * auVar151._16_4_;
                bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
                auVar153._20_4_ = (uint)bVar6 * auVar150._20_4_ | (uint)!bVar6 * auVar151._20_4_;
                bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
                auVar153._24_4_ = (uint)bVar6 * auVar150._24_4_ | (uint)!bVar6 * auVar151._24_4_;
                bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
                auVar153._28_4_ = (uint)bVar6 * auVar150._28_4_ | (uint)!bVar6 * auVar151._28_4_;
                bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
                auVar153._32_4_ = (uint)bVar6 * auVar150._32_4_ | (uint)!bVar6 * auVar151._32_4_;
                bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
                auVar153._36_4_ = (uint)bVar6 * auVar150._36_4_ | (uint)!bVar6 * auVar151._36_4_;
                bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
                auVar153._40_4_ = (uint)bVar6 * auVar150._40_4_ | (uint)!bVar6 * auVar151._40_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
                auVar153._44_4_ = (uint)bVar6 * auVar150._44_4_ | (uint)!bVar6 * auVar151._44_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
                auVar153._48_4_ = (uint)bVar6 * auVar150._48_4_ | (uint)!bVar6 * auVar151._48_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
                auVar153._52_4_ = (uint)bVar6 * auVar150._52_4_ | (uint)!bVar6 * auVar151._52_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
                auVar153._56_4_ = (uint)bVar6 * auVar150._56_4_ | (uint)!bVar6 * auVar151._56_4_;
                bVar6 = SUB81(uVar77 >> 0xf,0);
                auVar153._60_4_ = (uint)bVar6 * auVar150._60_4_ | (uint)!bVar6 * auVar151._60_4_;
                auVar147 = vfmadd231ps_avx512f(auVar147,auVar153,auVar141);
                auVar147 = vfmadd231ps_avx512f(auVar147,auVar153,auVar140);
                auVar150 = vmulps_avx512f(auVar147,auVar147);
                auVar151 = vfmadd213ps_avx512f(auVar147,(undefined1  [64])afVar237,
                                               (undefined1  [64])afVar242);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar147,(undefined1  [64])afVar246);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar147,(undefined1  [64])afVar250);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar147,(undefined1  [64])afVar255);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar147,(undefined1  [64])afVar272);
                auVar147 = vfmadd213ps_avx512f(auVar151,auVar150,auVar147);
                auVar147 = vaddps_avx512f(auVar147,(undefined1  [64])afVar270);
                auVar150 = vcvttps2dq_avx512f(auVar153);
                auVar150 = vpaddd_avx512f(auVar150,auVar142);
                auVar150 = vpslld_avx512f(auVar150,0x17);
                auVar147 = vmulps_avx512f(auVar147,auVar150);
                auVar148 = vminps_avx512f(auVar148,(undefined1  [64])afVar73);
                auVar148 = vmaxps_avx512f(auVar148,(undefined1  [64])afVar269);
                auVar150 = vfmadd213ps_avx512f((undefined1  [64])afVar268,auVar148,
                                               (undefined1  [64])afVar272);
                auVar151 = vrndscaleps_avx512f(auVar150,1);
                uVar77 = vcmpps_avx512f(auVar150,auVar151,1);
                auVar150 = vsubps_avx512f(auVar151,(undefined1  [64])afVar270);
                bVar6 = (bool)((byte)uVar77 & 1);
                auVar154._0_4_ = (uint)bVar6 * auVar150._0_4_ | (uint)!bVar6 * auVar151._0_4_;
                bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
                auVar154._4_4_ = (uint)bVar6 * auVar150._4_4_ | (uint)!bVar6 * auVar151._4_4_;
                bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                auVar154._8_4_ = (uint)bVar6 * auVar150._8_4_ | (uint)!bVar6 * auVar151._8_4_;
                bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
                auVar154._12_4_ = (uint)bVar6 * auVar150._12_4_ | (uint)!bVar6 * auVar151._12_4_;
                bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
                auVar154._16_4_ = (uint)bVar6 * auVar150._16_4_ | (uint)!bVar6 * auVar151._16_4_;
                bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
                auVar154._20_4_ = (uint)bVar6 * auVar150._20_4_ | (uint)!bVar6 * auVar151._20_4_;
                bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
                auVar154._24_4_ = (uint)bVar6 * auVar150._24_4_ | (uint)!bVar6 * auVar151._24_4_;
                bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
                auVar154._28_4_ = (uint)bVar6 * auVar150._28_4_ | (uint)!bVar6 * auVar151._28_4_;
                bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
                auVar154._32_4_ = (uint)bVar6 * auVar150._32_4_ | (uint)!bVar6 * auVar151._32_4_;
                bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
                auVar154._36_4_ = (uint)bVar6 * auVar150._36_4_ | (uint)!bVar6 * auVar151._36_4_;
                bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
                auVar154._40_4_ = (uint)bVar6 * auVar150._40_4_ | (uint)!bVar6 * auVar151._40_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
                auVar154._44_4_ = (uint)bVar6 * auVar150._44_4_ | (uint)!bVar6 * auVar151._44_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
                auVar154._48_4_ = (uint)bVar6 * auVar150._48_4_ | (uint)!bVar6 * auVar151._48_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
                auVar154._52_4_ = (uint)bVar6 * auVar150._52_4_ | (uint)!bVar6 * auVar151._52_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
                auVar154._56_4_ = (uint)bVar6 * auVar150._56_4_ | (uint)!bVar6 * auVar151._56_4_;
                bVar6 = SUB81(uVar77 >> 0xf,0);
                auVar154._60_4_ = (uint)bVar6 * auVar150._60_4_ | (uint)!bVar6 * auVar151._60_4_;
                auVar148 = vfmadd231ps_avx512f(auVar148,auVar154,auVar141);
                auVar148 = vfmadd231ps_avx512f(auVar148,auVar154,auVar140);
                auVar150 = vmulps_avx512f(auVar148,auVar148);
                auVar151 = vfmadd213ps_avx512f(auVar148,(undefined1  [64])afVar237,
                                               (undefined1  [64])afVar242);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar148,(undefined1  [64])afVar246);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar148,(undefined1  [64])afVar250);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar148,(undefined1  [64])afVar255);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar148,(undefined1  [64])afVar272);
                auVar148 = vfmadd213ps_avx512f(auVar151,auVar150,auVar148);
                auVar148 = vaddps_avx512f(auVar148,(undefined1  [64])afVar270);
                auVar150 = vcvttps2dq_avx512f(auVar154);
                auVar150 = vpaddd_avx512f(auVar150,auVar142);
                auVar150 = vpslld_avx512f(auVar150,0x17);
                auVar148 = vmulps_avx512f(auVar148,auVar150);
                auVar149 = vminps_avx512f(auVar149,(undefined1  [64])afVar73);
                auVar149 = vmaxps_avx512f(auVar149,(undefined1  [64])afVar269);
                auVar150 = vfmadd213ps_avx512f((undefined1  [64])afVar268,auVar149,
                                               (undefined1  [64])afVar272);
                auVar151 = vrndscaleps_avx512f(auVar150,1);
                uVar77 = vcmpps_avx512f(auVar150,auVar151,1);
                auVar150 = vsubps_avx512f(auVar151,(undefined1  [64])afVar270);
                bVar6 = (bool)((byte)uVar77 & 1);
                auVar155._0_4_ = (uint)bVar6 * auVar150._0_4_ | (uint)!bVar6 * auVar151._0_4_;
                bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
                auVar155._4_4_ = (uint)bVar6 * auVar150._4_4_ | (uint)!bVar6 * auVar151._4_4_;
                bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                auVar155._8_4_ = (uint)bVar6 * auVar150._8_4_ | (uint)!bVar6 * auVar151._8_4_;
                bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
                auVar155._12_4_ = (uint)bVar6 * auVar150._12_4_ | (uint)!bVar6 * auVar151._12_4_;
                bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
                auVar155._16_4_ = (uint)bVar6 * auVar150._16_4_ | (uint)!bVar6 * auVar151._16_4_;
                bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
                auVar155._20_4_ = (uint)bVar6 * auVar150._20_4_ | (uint)!bVar6 * auVar151._20_4_;
                bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
                auVar155._24_4_ = (uint)bVar6 * auVar150._24_4_ | (uint)!bVar6 * auVar151._24_4_;
                bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
                auVar155._28_4_ = (uint)bVar6 * auVar150._28_4_ | (uint)!bVar6 * auVar151._28_4_;
                bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
                auVar155._32_4_ = (uint)bVar6 * auVar150._32_4_ | (uint)!bVar6 * auVar151._32_4_;
                bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
                auVar155._36_4_ = (uint)bVar6 * auVar150._36_4_ | (uint)!bVar6 * auVar151._36_4_;
                bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
                auVar155._40_4_ = (uint)bVar6 * auVar150._40_4_ | (uint)!bVar6 * auVar151._40_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
                auVar155._44_4_ = (uint)bVar6 * auVar150._44_4_ | (uint)!bVar6 * auVar151._44_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
                auVar155._48_4_ = (uint)bVar6 * auVar150._48_4_ | (uint)!bVar6 * auVar151._48_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
                auVar155._52_4_ = (uint)bVar6 * auVar150._52_4_ | (uint)!bVar6 * auVar151._52_4_;
                bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
                auVar155._56_4_ = (uint)bVar6 * auVar150._56_4_ | (uint)!bVar6 * auVar151._56_4_;
                bVar6 = SUB81(uVar77 >> 0xf,0);
                auVar155._60_4_ = (uint)bVar6 * auVar150._60_4_ | (uint)!bVar6 * auVar151._60_4_;
                auVar149 = vfmadd231ps_avx512f(auVar149,auVar155,auVar141);
                auVar149 = vfmadd231ps_avx512f(auVar149,auVar155,auVar140);
                auVar150 = vmulps_avx512f(auVar149,auVar149);
                auVar151 = vfmadd213ps_avx512f(auVar149,(undefined1  [64])afVar237,
                                               (undefined1  [64])afVar242);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar149,(undefined1  [64])afVar246);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar149,(undefined1  [64])afVar250);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar149,(undefined1  [64])afVar255);
                auVar151 = vfmadd213ps_avx512f(auVar151,auVar149,(undefined1  [64])afVar272);
                auVar149 = vfmadd213ps_avx512f(auVar151,auVar150,auVar149);
                auVar149 = vaddps_avx512f(auVar149,(undefined1  [64])afVar270);
                auVar150 = vcvttps2dq_avx512f(auVar155);
                auVar150 = vpaddd_avx512f(auVar150,auVar142);
                auVar150 = vpslld_avx512f(auVar150,0x17);
                auVar149 = vmulps_avx512f(auVar149,auVar150);
                *pauVar74 = auVar146;
                pauVar74[1] = auVar147;
                pauVar74[2] = auVar148;
                pauVar74[3] = auVar149;
                auVar150 = vunpcklps_avx512f(auVar146,auVar147);
                auVar146 = vunpckhps_avx512f(auVar146,auVar147);
                auVar146 = vaddps_avx512f(auVar150,auVar146);
                auVar147 = vunpcklps_avx512f(auVar148,auVar149);
                auVar149 = vunpckhps_avx512f(auVar148,auVar149);
                auVar149 = vaddps_avx512f(auVar147,auVar149);
                auVar147 = vpermt2ps_avx512f(auVar146,auVar189,auVar149);
                auVar149 = vpermt2ps_avx512f(auVar146,auVar156,auVar149);
                auVar149 = vaddps_avx512f(auVar149,auVar147);
                auVar149 = vaddps_avx512f(auVar149,*pauVar78);
                *pauVar78 = auVar149;
                pauVar74 = pauVar74 + 4;
                pauVar82 = pauVar82 + 1;
                pauVar78 = pauVar78 + 1;
                iVar79 = iVar79 + 0x10;
                uVar75 = size1 & 0xfffffff0;
              } while (iVar79 < size1);
            }
            uVar84 = uVar75 | 7;
            auVar206._8_4_ = 0x3fb8aa3b;
            auVar206._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar206._12_4_ = 0x3fb8aa3b;
            auVar216._8_4_ = 0x42b0c0a5;
            auVar216._0_8_ = 0x42b0c0a542b0c0a5;
            auVar216._12_4_ = 0x42b0c0a5;
            auVar216._16_4_ = 0x42b0c0a5;
            auVar216._20_4_ = 0x42b0c0a5;
            auVar216._24_4_ = 0x42b0c0a5;
            auVar216._28_4_ = 0x42b0c0a5;
            auVar240._8_4_ = 0xc2b0c0a5;
            auVar240._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar240._12_4_ = 0xc2b0c0a5;
            auVar240._16_4_ = 0xc2b0c0a5;
            auVar240._20_4_ = 0xc2b0c0a5;
            auVar240._24_4_ = 0xc2b0c0a5;
            auVar240._28_4_ = 0xc2b0c0a5;
            auVar261._8_4_ = 0x3fb8aa3b;
            auVar261._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar261._12_4_ = 0x3fb8aa3b;
            auVar261._16_4_ = 0x3fb8aa3b;
            auVar261._20_4_ = 0x3fb8aa3b;
            auVar261._24_4_ = 0x3fb8aa3b;
            auVar261._28_4_ = 0x3fb8aa3b;
            auVar264._8_4_ = 0x39506967;
            auVar264._0_8_ = 0x3950696739506967;
            auVar264._12_4_ = 0x39506967;
            auVar264._16_4_ = 0x39506967;
            auVar264._20_4_ = 0x39506967;
            auVar264._24_4_ = 0x39506967;
            auVar264._28_4_ = 0x39506967;
            auVar266._8_4_ = 0x3f800000;
            auVar266._0_8_ = 0x3f8000003f800000;
            auVar266._12_4_ = 0x3f800000;
            auVar266._16_4_ = 0x3f800000;
            auVar266._20_4_ = 0x3f800000;
            auVar266._24_4_ = 0x3f800000;
            auVar266._28_4_ = 0x3f800000;
            auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
            auVar104 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
            auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar107 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
            while ((int)uVar84 < size1) {
              auVar87 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar82));
              auVar88 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar82 + 4)));
              auVar110 = vinsertf32x4_avx512vl(ZEXT1632(auVar87),auVar88,1);
              auVar110 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar74,auVar110);
              auVar110 = vminps_avx(auVar110,auVar216);
              auVar110 = vmaxps_avx(auVar110,auVar240);
              auVar111 = vfmadd213ps_avx512vl(auVar261,auVar110,auVar102);
              auVar112 = vrndscaleps_avx512vl(auVar111,1);
              uVar77 = vcmpps_avx512vl(auVar111,auVar112,1);
              auVar111 = vsubps_avx512vl(auVar112,auVar266);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar113._0_4_ = (uint)bVar6 * auVar111._0_4_ | (uint)!bVar6 * auVar112._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar113._4_4_ = (uint)bVar6 * auVar111._4_4_ | (uint)!bVar6 * auVar112._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar113._8_4_ = (uint)bVar6 * auVar111._8_4_ | (uint)!bVar6 * auVar112._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar113._12_4_ = (uint)bVar6 * auVar111._12_4_ | (uint)!bVar6 * auVar112._12_4_;
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar113._16_4_ = (uint)bVar6 * auVar111._16_4_ | (uint)!bVar6 * auVar112._16_4_;
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar113._20_4_ = (uint)bVar6 * auVar111._20_4_ | (uint)!bVar6 * auVar112._20_4_;
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar113._24_4_ = (uint)bVar6 * auVar111._24_4_ | (uint)!bVar6 * auVar112._24_4_;
              bVar6 = SUB81(uVar77 >> 7,0);
              auVar113._28_4_ = (uint)bVar6 * auVar111._28_4_ | (uint)!bVar6 * auVar112._28_4_;
              auVar110 = vfmsub231ps_avx512vl(auVar110,auVar113,auVar103);
              auVar110 = vfnmsub231ps_avx512vl(auVar110,auVar113,auVar104);
              auVar111 = vmulps_avx512vl(auVar110,auVar110);
              auVar112 = vfmadd213ps_avx512vl(auVar264,auVar110,auVar105);
              auVar112 = vfmadd213ps_avx512vl(auVar112,auVar110,auVar108);
              auVar112 = vfmadd213ps_avx512vl(auVar112,auVar110,auVar109);
              auVar112 = vfmadd213ps_avx512vl(auVar112,auVar110,auVar106);
              auVar112 = vfmadd213ps_avx512vl(auVar112,auVar110,auVar102);
              auVar110 = vfmadd213ps_avx512vl(auVar112,auVar111,auVar110);
              auVar111 = vcvttps2dq_avx512vl(auVar113);
              auVar111 = vpslld_avx2(auVar111,0x17);
              auVar111 = vpaddd_avx512vl(auVar111,auVar107);
              auVar87 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar82 + 8)));
              auVar111 = vfmadd213ps_avx512vl(auVar111,auVar110,auVar111);
              auVar88 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar82 + 0xc)));
              auVar110 = vinsertf32x4_avx512vl(ZEXT1632(auVar87),auVar88,1);
              auVar110 = vsubps_avx512vl(*(undefined1 (*) [32])(*pauVar74 + 0x20),auVar110);
              auVar110 = vminps_avx512vl(auVar110,auVar216);
              auVar110 = vmaxps_avx512vl(auVar110,auVar240);
              auVar112 = vfmadd213ps_avx512vl(auVar261,auVar110,auVar102);
              auVar114 = vrndscaleps_avx512vl(auVar112,1);
              uVar77 = vcmpps_avx512vl(auVar112,auVar114,1);
              auVar112 = vsubps_avx512vl(auVar114,auVar266);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar115._0_4_ = (uint)bVar6 * auVar112._0_4_ | (uint)!bVar6 * auVar114._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar115._4_4_ = (uint)bVar6 * auVar112._4_4_ | (uint)!bVar6 * auVar114._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar115._8_4_ = (uint)bVar6 * auVar112._8_4_ | (uint)!bVar6 * auVar114._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar115._12_4_ = (uint)bVar6 * auVar112._12_4_ | (uint)!bVar6 * auVar114._12_4_;
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar115._16_4_ = (uint)bVar6 * auVar112._16_4_ | (uint)!bVar6 * auVar114._16_4_;
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar115._20_4_ = (uint)bVar6 * auVar112._20_4_ | (uint)!bVar6 * auVar114._20_4_;
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar115._24_4_ = (uint)bVar6 * auVar112._24_4_ | (uint)!bVar6 * auVar114._24_4_;
              bVar6 = SUB81(uVar77 >> 7,0);
              auVar115._28_4_ = (uint)bVar6 * auVar112._28_4_ | (uint)!bVar6 * auVar114._28_4_;
              auVar110 = vfmsub231ps_avx512vl(auVar110,auVar115,auVar103);
              auVar110 = vfnmsub231ps_avx512vl(auVar110,auVar115,auVar104);
              auVar112 = vmulps_avx512vl(auVar110,auVar110);
              auVar114 = vfmadd213ps_avx512vl(auVar264,auVar110,auVar105);
              auVar114 = vfmadd213ps_avx512vl(auVar114,auVar110,auVar108);
              auVar114 = vfmadd213ps_avx512vl(auVar114,auVar110,auVar109);
              auVar114 = vfmadd213ps_avx512vl(auVar114,auVar110,auVar106);
              auVar114 = vfmadd213ps_avx512vl(auVar114,auVar110,auVar102);
              auVar110 = vfmadd213ps_avx512vl(auVar114,auVar112,auVar110);
              auVar112 = vcvttps2dq_avx512vl(auVar115);
              auVar112 = vpslld_avx512vl(auVar112,0x17);
              auVar112 = vpaddd_avx512vl(auVar112,auVar107);
              auVar112 = vfmadd213ps_avx512vl(auVar112,auVar110,auVar112);
              auVar87 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar82 + 0x10)));
              auVar88 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar82 + 0x14)));
              auVar110 = vinsertf32x4_avx512vl(ZEXT1632(auVar87),auVar88,1);
              auVar110 = vsubps_avx512vl(*(undefined1 (*) [32])pauVar74[1],auVar110);
              auVar110 = vminps_avx512vl(auVar110,auVar216);
              auVar110 = vmaxps_avx512vl(auVar110,auVar240);
              auVar114 = vfmadd213ps_avx512vl(auVar261,auVar110,auVar102);
              auVar116 = vrndscaleps_avx512vl(auVar114,1);
              uVar77 = vcmpps_avx512vl(auVar114,auVar116,1);
              auVar114 = vsubps_avx512vl(auVar116,auVar266);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar117._0_4_ = (uint)bVar6 * auVar114._0_4_ | (uint)!bVar6 * auVar116._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar117._4_4_ = (uint)bVar6 * auVar114._4_4_ | (uint)!bVar6 * auVar116._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar117._8_4_ = (uint)bVar6 * auVar114._8_4_ | (uint)!bVar6 * auVar116._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar117._12_4_ = (uint)bVar6 * auVar114._12_4_ | (uint)!bVar6 * auVar116._12_4_;
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar117._16_4_ = (uint)bVar6 * auVar114._16_4_ | (uint)!bVar6 * auVar116._16_4_;
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar117._20_4_ = (uint)bVar6 * auVar114._20_4_ | (uint)!bVar6 * auVar116._20_4_;
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar117._24_4_ = (uint)bVar6 * auVar114._24_4_ | (uint)!bVar6 * auVar116._24_4_;
              bVar6 = SUB81(uVar77 >> 7,0);
              auVar117._28_4_ = (uint)bVar6 * auVar114._28_4_ | (uint)!bVar6 * auVar116._28_4_;
              auVar110 = vfmsub231ps_avx512vl(auVar110,auVar117,auVar103);
              auVar110 = vfnmsub231ps_avx512vl(auVar110,auVar117,auVar104);
              auVar114 = vmulps_avx512vl(auVar110,auVar110);
              auVar116 = vfmadd213ps_avx512vl(auVar264,auVar110,auVar105);
              auVar116 = vfmadd213ps_avx512vl(auVar116,auVar110,auVar108);
              auVar116 = vfmadd213ps_avx512vl(auVar116,auVar110,auVar109);
              auVar116 = vfmadd213ps_avx512vl(auVar116,auVar110,auVar106);
              auVar116 = vfmadd213ps_avx512vl(auVar116,auVar110,auVar102);
              auVar110 = vfmadd213ps_avx512vl(auVar116,auVar114,auVar110);
              auVar114 = vcvttps2dq_avx512vl(auVar117);
              auVar114 = vpslld_avx512vl(auVar114,0x17);
              auVar114 = vpaddd_avx512vl(auVar114,auVar107);
              auVar87 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar82 + 0x18)));
              auVar88 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar82 + 0x1c)));
              auVar114 = vfmadd213ps_avx512vl(auVar114,auVar110,auVar114);
              auVar110 = vinsertf32x4_avx512vl(ZEXT1632(auVar87),auVar88,1);
              auVar110 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar74[1] + 0x20),auVar110);
              auVar110 = vminps_avx(auVar110,auVar216);
              auVar110 = vmaxps_avx(auVar110,auVar240);
              auVar116 = vfmadd213ps_avx512vl(auVar261,auVar110,auVar102);
              auVar118 = vrndscaleps_avx512vl(auVar116,1);
              uVar77 = vcmpps_avx512vl(auVar116,auVar118,1);
              auVar116 = vsubps_avx512vl(auVar118,auVar266);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar119._0_4_ = (uint)bVar6 * auVar116._0_4_ | (uint)!bVar6 * auVar118._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar119._4_4_ = (uint)bVar6 * auVar116._4_4_ | (uint)!bVar6 * auVar118._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar119._8_4_ = (uint)bVar6 * auVar116._8_4_ | (uint)!bVar6 * auVar118._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar119._12_4_ = (uint)bVar6 * auVar116._12_4_ | (uint)!bVar6 * auVar118._12_4_;
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar119._16_4_ = (uint)bVar6 * auVar116._16_4_ | (uint)!bVar6 * auVar118._16_4_;
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar119._20_4_ = (uint)bVar6 * auVar116._20_4_ | (uint)!bVar6 * auVar118._20_4_;
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar119._24_4_ = (uint)bVar6 * auVar116._24_4_ | (uint)!bVar6 * auVar118._24_4_;
              bVar6 = SUB81(uVar77 >> 7,0);
              auVar119._28_4_ = (uint)bVar6 * auVar116._28_4_ | (uint)!bVar6 * auVar118._28_4_;
              auVar110 = vfmsub231ps_avx512vl(auVar110,auVar119,auVar103);
              auVar110 = vfnmsub231ps_avx512vl(auVar110,auVar119,auVar104);
              auVar116 = vmulps_avx512vl(auVar110,auVar110);
              auVar118 = vfmadd213ps_avx512vl(auVar264,auVar110,auVar105);
              auVar118 = vfmadd213ps_avx512vl(auVar118,auVar110,auVar108);
              auVar118 = vfmadd213ps_avx512vl(auVar118,auVar110,auVar109);
              auVar118 = vfmadd213ps_avx512vl(auVar118,auVar110,auVar106);
              auVar118 = vfmadd213ps_avx512vl(auVar118,auVar110,auVar102);
              auVar110 = vfmadd213ps_avx512vl(auVar118,auVar116,auVar110);
              auVar116 = vcvttps2dq_avx512vl(auVar119);
              auVar116 = vpslld_avx2(auVar116,0x17);
              auVar116 = vpaddd_avx512vl(auVar116,auVar107);
              auVar110 = vfmadd213ps_avx512vl(auVar116,auVar110,auVar116);
              *(undefined1 (*) [32])*pauVar74 = auVar111;
              *(undefined1 (*) [32])(*pauVar74 + 0x20) = auVar112;
              *(undefined1 (*) [32])pauVar74[1] = auVar114;
              *(undefined1 (*) [32])(pauVar74[1] + 0x20) = auVar110;
              auVar116 = vunpcklps_avx512vl(auVar111,auVar112);
              auVar111 = vunpckhps_avx512vl(auVar111,auVar112);
              auVar111 = vaddps_avx512vl(auVar116,auVar111);
              auVar112 = vunpcklps_avx512vl(auVar114,auVar110);
              auVar110 = vunpckhps_avx512vl(auVar114,auVar110);
              auVar110 = vaddps_avx512vl(auVar112,auVar110);
              auVar112 = vinsertf32x4_avx512vl(auVar111,auVar110._0_16_,1);
              auVar110 = vperm2f128_avx(auVar111,auVar110,0x31);
              auVar111 = vunpcklps_avx512vl(auVar112,auVar110);
              auVar110 = vunpckhps_avx512vl(auVar112,auVar110);
              auVar254._0_4_ = auVar110._0_4_ + *(float *)*pauVar78 + auVar111._0_4_;
              auVar254._4_4_ = auVar110._4_4_ + *(float *)(*pauVar78 + 4) + auVar111._4_4_;
              auVar254._8_4_ = auVar110._8_4_ + *(float *)(*pauVar78 + 8) + auVar111._8_4_;
              auVar254._12_4_ = auVar110._12_4_ + *(float *)(*pauVar78 + 0xc) + auVar111._12_4_;
              auVar254._16_4_ = auVar110._16_4_ + *(float *)(*pauVar78 + 0x10) + auVar111._16_4_;
              auVar254._20_4_ = auVar110._20_4_ + *(float *)(*pauVar78 + 0x14) + auVar111._20_4_;
              auVar254._24_4_ = auVar110._24_4_ + *(float *)(*pauVar78 + 0x18) + auVar111._24_4_;
              auVar254._28_4_ = auVar110._28_4_ + *(float *)(*pauVar78 + 0x1c) + auVar111._28_4_;
              *(undefined1 (*) [32])*pauVar78 = auVar254;
              pauVar74 = pauVar74 + 2;
              pauVar82 = (undefined1 (*) [64])(*pauVar82 + 0x20);
              pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x20);
              uVar84 = uVar75 + 0xf;
              uVar75 = uVar75 + 8;
            }
            uVar84 = uVar75 | 3;
            auVar214._8_4_ = 0xc2b0c0a5;
            auVar214._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar214._12_4_ = 0xc2b0c0a5;
            auVar238._8_4_ = 0x42b0c0a5;
            auVar238._0_8_ = 0x42b0c0a542b0c0a5;
            auVar238._12_4_ = 0x42b0c0a5;
            auVar259._8_4_ = 0x3f318000;
            auVar259._0_8_ = 0x3f3180003f318000;
            auVar259._12_4_ = 0x3f318000;
            auVar262._8_4_ = 0x3ab743ce;
            auVar262._0_8_ = 0x3ab743ce3ab743ce;
            auVar262._12_4_ = 0x3ab743ce;
            auVar265._8_4_ = 0x3c088908;
            auVar265._0_8_ = 0x3c0889083c088908;
            auVar265._12_4_ = 0x3c088908;
            auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar88 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            while ((int)uVar84 < size1) {
              uVar3 = *(undefined4 *)*pauVar82;
              auVar23._4_4_ = uVar3;
              auVar23._0_4_ = uVar3;
              auVar23._8_4_ = uVar3;
              auVar23._12_4_ = uVar3;
              auVar89 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar74,auVar23);
              auVar89 = vminps_avx(auVar89,auVar238);
              auVar89 = vmaxps_avx(auVar89,auVar214);
              auVar90 = vfmadd213ps_avx512vl(auVar206,auVar89,auVar86);
              auVar91 = vcvttps2dq_avx512vl(auVar90);
              auVar91 = vcvtdq2ps_avx512vl(auVar91);
              uVar77 = vcmpps_avx512vl(auVar90,auVar91,1);
              auVar90 = vsubps_avx512vl(auVar91,auVar87);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar92._0_4_ = (uint)bVar6 * auVar90._0_4_ | (uint)!bVar6 * auVar91._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar92._4_4_ = (uint)bVar6 * auVar90._4_4_ | (uint)!bVar6 * auVar91._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar92._8_4_ = (uint)bVar6 * auVar90._8_4_ | (uint)!bVar6 * auVar91._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar92._12_4_ = (uint)bVar6 * auVar90._12_4_ | (uint)!bVar6 * auVar91._12_4_;
              auVar89 = vfmsub231ps_avx512vl(auVar89,auVar92,auVar259);
              auVar89 = vfnmsub231ps_avx512vl(auVar89,auVar92,auVar88);
              auVar90 = vmulps_avx512vl(auVar89,auVar89);
              auVar91 = vfmadd213ps_avx512vl(auVar230,auVar89,auVar262);
              auVar91 = vfmadd213ps_avx512vl(auVar91,auVar89,auVar265);
              auVar91 = vfmadd213ps_avx512vl(auVar91,auVar89,auVar219);
              auVar91 = vfmadd213ps_avx512vl(auVar91,auVar89,auVar243);
              auVar91 = vfmadd213ps_avx512vl(auVar91,auVar89,auVar86);
              auVar90 = vfmadd213ps_avx512vl(auVar91,auVar90,auVar89);
              auVar89 = vcvttps2dq_avx512vl(auVar92);
              auVar89 = vpslld_avx(auVar89,0x17);
              auVar89 = vpaddd_avx(auVar89,auVar247);
              auVar90 = vfmadd213ps_avx512vl(auVar89,auVar90,auVar89);
              uVar3 = *(undefined4 *)(*pauVar82 + 4);
              auVar24._4_4_ = uVar3;
              auVar24._0_4_ = uVar3;
              auVar24._8_4_ = uVar3;
              auVar24._12_4_ = uVar3;
              auVar89 = vsubps_avx512vl(*(undefined1 (*) [16])(*pauVar74 + 0x10),auVar24);
              auVar89 = vminps_avx512vl(auVar89,auVar238);
              auVar89 = vmaxps_avx512vl(auVar89,auVar214);
              auVar91 = vfmadd213ps_avx512vl(auVar206,auVar89,auVar86);
              auVar93 = vcvttps2dq_avx512vl(auVar91);
              auVar93 = vcvtdq2ps_avx512vl(auVar93);
              uVar77 = vcmpps_avx512vl(auVar91,auVar93,1);
              auVar91 = vsubps_avx512vl(auVar93,auVar87);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar94._0_4_ = (uint)bVar6 * auVar91._0_4_ | (uint)!bVar6 * auVar93._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar94._4_4_ = (uint)bVar6 * auVar91._4_4_ | (uint)!bVar6 * auVar93._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar94._8_4_ = (uint)bVar6 * auVar91._8_4_ | (uint)!bVar6 * auVar93._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar94._12_4_ = (uint)bVar6 * auVar91._12_4_ | (uint)!bVar6 * auVar93._12_4_;
              auVar89 = vfmsub231ps_avx512vl(auVar89,auVar94,auVar259);
              auVar89 = vfnmsub231ps_avx512vl(auVar89,auVar94,auVar88);
              auVar91 = vmulps_avx512vl(auVar89,auVar89);
              auVar93 = vfmadd213ps_avx512vl(auVar230,auVar89,auVar262);
              auVar93 = vfmadd213ps_avx512vl(auVar93,auVar89,auVar265);
              auVar93 = vfmadd213ps_avx512vl(auVar93,auVar89,auVar219);
              auVar93 = vfmadd213ps_avx512vl(auVar93,auVar89,auVar243);
              auVar93 = vfmadd213ps_avx512vl(auVar93,auVar89,auVar86);
              auVar89 = vfmadd213ps_avx512vl(auVar93,auVar91,auVar89);
              auVar91 = vcvttps2dq_avx512vl(auVar94);
              auVar91 = vpslld_avx512vl(auVar91,0x17);
              auVar91 = vpaddd_avx512vl(auVar91,auVar247);
              auVar91 = vfmadd213ps_avx512vl(auVar91,auVar89,auVar91);
              uVar3 = *(undefined4 *)(*pauVar82 + 8);
              auVar25._4_4_ = uVar3;
              auVar25._0_4_ = uVar3;
              auVar25._8_4_ = uVar3;
              auVar25._12_4_ = uVar3;
              auVar89 = vsubps_avx512vl(*(undefined1 (*) [16])(*pauVar74 + 0x20),auVar25);
              auVar89 = vminps_avx512vl(auVar89,auVar238);
              auVar89 = vmaxps_avx512vl(auVar89,auVar214);
              auVar93 = vfmadd213ps_avx512vl(auVar206,auVar89,auVar86);
              auVar95 = vcvttps2dq_avx512vl(auVar93);
              auVar95 = vcvtdq2ps_avx512vl(auVar95);
              uVar77 = vcmpps_avx512vl(auVar93,auVar95,1);
              auVar93 = vsubps_avx512vl(auVar95,auVar87);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar96._0_4_ = (uint)bVar6 * auVar93._0_4_ | (uint)!bVar6 * auVar95._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar96._4_4_ = (uint)bVar6 * auVar93._4_4_ | (uint)!bVar6 * auVar95._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar96._8_4_ = (uint)bVar6 * auVar93._8_4_ | (uint)!bVar6 * auVar95._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar96._12_4_ = (uint)bVar6 * auVar93._12_4_ | (uint)!bVar6 * auVar95._12_4_;
              auVar89 = vfmsub231ps_avx512vl(auVar89,auVar96,auVar259);
              auVar89 = vfnmsub231ps_avx512vl(auVar89,auVar96,auVar88);
              auVar93 = vmulps_avx512vl(auVar89,auVar89);
              auVar95 = vfmadd213ps_avx512vl(auVar230,auVar89,auVar262);
              auVar95 = vfmadd213ps_avx512vl(auVar95,auVar89,auVar265);
              auVar95 = vfmadd213ps_avx512vl(auVar95,auVar89,auVar219);
              auVar95 = vfmadd213ps_avx512vl(auVar95,auVar89,auVar243);
              auVar95 = vfmadd213ps_avx512vl(auVar95,auVar89,auVar86);
              auVar89 = vfmadd213ps_avx512vl(auVar95,auVar93,auVar89);
              auVar93 = vcvttps2dq_avx512vl(auVar96);
              auVar93 = vpslld_avx512vl(auVar93,0x17);
              auVar93 = vpaddd_avx512vl(auVar93,auVar247);
              auVar93 = vfmadd213ps_avx512vl(auVar93,auVar89,auVar93);
              uVar3 = *(undefined4 *)(*pauVar82 + 0xc);
              auVar26._4_4_ = uVar3;
              auVar26._0_4_ = uVar3;
              auVar26._8_4_ = uVar3;
              auVar26._12_4_ = uVar3;
              auVar89 = vsubps_avx512vl(*(undefined1 (*) [16])(*pauVar74 + 0x30),auVar26);
              auVar89 = vminps_avx(auVar89,auVar238);
              auVar89 = vmaxps_avx(auVar89,auVar214);
              auVar95 = vfmadd213ps_avx512vl(auVar206,auVar89,auVar86);
              auVar97 = vcvttps2dq_avx512vl(auVar95);
              auVar97 = vcvtdq2ps_avx512vl(auVar97);
              uVar77 = vcmpps_avx512vl(auVar95,auVar97,1);
              auVar95 = vsubps_avx512vl(auVar97,auVar87);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar98._0_4_ = (uint)bVar6 * auVar95._0_4_ | (uint)!bVar6 * auVar97._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar98._4_4_ = (uint)bVar6 * auVar95._4_4_ | (uint)!bVar6 * auVar97._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar98._8_4_ = (uint)bVar6 * auVar95._8_4_ | (uint)!bVar6 * auVar97._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar98._12_4_ = (uint)bVar6 * auVar95._12_4_ | (uint)!bVar6 * auVar97._12_4_;
              auVar89 = vfmsub231ps_avx512vl(auVar89,auVar98,auVar259);
              auVar89 = vfnmsub231ps_avx512vl(auVar89,auVar98,auVar88);
              auVar95 = vmulps_avx512vl(auVar89,auVar89);
              auVar97 = vfmadd213ps_avx512vl(auVar230,auVar89,auVar262);
              auVar97 = vfmadd213ps_avx512vl(auVar97,auVar89,auVar265);
              auVar97 = vfmadd213ps_avx512vl(auVar97,auVar89,auVar219);
              auVar97 = vfmadd213ps_avx512vl(auVar97,auVar89,auVar243);
              auVar97 = vfmadd213ps_avx512vl(auVar97,auVar89,auVar86);
              auVar95 = vfmadd213ps_avx512vl(auVar97,auVar95,auVar89);
              auVar89 = vcvttps2dq_avx512vl(auVar98);
              auVar89 = vpslld_avx(auVar89,0x17);
              auVar89 = vpaddd_avx(auVar89,auVar247);
              auVar89 = vfmadd213ps_avx512vl(auVar89,auVar95,auVar89);
              *(undefined1 (*) [16])*pauVar74 = auVar90;
              *(undefined1 (*) [16])(*pauVar74 + 0x10) = auVar91;
              *(undefined1 (*) [16])(*pauVar74 + 0x20) = auVar93;
              *(undefined1 (*) [16])(*pauVar74 + 0x30) = auVar89;
              auVar95 = vunpcklps_avx512vl(auVar90,auVar91);
              auVar97 = vunpcklps_avx512vl(auVar93,auVar89);
              auVar99 = vunpckhps_avx512vl(auVar90,auVar91);
              auVar89 = vunpckhps_avx512vl(auVar93,auVar89);
              auVar90 = vmovlhps_avx512f(auVar95,auVar97);
              auVar93 = vunpckhpd_avx512vl(auVar95,auVar97);
              auVar91 = vmovlhps_avx512f(auVar99,auVar89);
              auVar89 = vunpckhpd_avx(auVar99,auVar89);
              auVar89 = vaddps_avx512vl(auVar90,auVar89);
              auVar89 = vaddps_avx512vl(auVar89,auVar91);
              auVar90 = vaddps_avx512vl(auVar93,*(undefined1 (*) [16])*pauVar78);
              auVar251._0_4_ = auVar90._0_4_ + auVar89._0_4_;
              auVar251._4_4_ = auVar90._4_4_ + auVar89._4_4_;
              auVar251._8_4_ = auVar90._8_4_ + auVar89._8_4_;
              auVar251._12_4_ = auVar90._12_4_ + auVar89._12_4_;
              *(undefined1 (*) [16])*pauVar78 = auVar251;
              pauVar74 = pauVar74 + 1;
              pauVar82 = (undefined1 (*) [64])(*pauVar82 + 0x10);
              pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x10);
              uVar84 = uVar75 + 7;
              uVar75 = uVar75 + 4;
            }
            auVar87 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
            auVar88 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
            if ((int)uVar75 < size1) {
              lVar81 = 0;
              do {
                uVar3 = *(undefined4 *)(*pauVar82 + lVar81 * 4);
                auVar27._4_4_ = uVar3;
                auVar27._0_4_ = uVar3;
                auVar27._8_4_ = uVar3;
                auVar27._12_4_ = uVar3;
                auVar89 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar74,auVar27);
                auVar89 = vminps_avx(auVar89,auVar238);
                auVar89 = vmaxps_avx(auVar89,auVar214);
                auVar90 = vfmadd231ps_fma(auVar86,auVar89,auVar206);
                auVar91 = vcvttps2dq_avx512vl(auVar90);
                auVar91 = vcvtdq2ps_avx512vl(auVar91);
                uVar77 = vcmpps_avx512vl(auVar90,auVar91,1);
                auVar90 = vaddps_avx512vl(auVar91,auVar87);
                bVar6 = (bool)((byte)uVar77 & 1);
                auVar100._0_4_ = (uint)bVar6 * auVar90._0_4_ | (uint)!bVar6 * auVar91._0_4_;
                bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
                auVar100._4_4_ = (uint)bVar6 * auVar90._4_4_ | (uint)!bVar6 * auVar91._4_4_;
                bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
                auVar100._8_4_ = (uint)bVar6 * auVar90._8_4_ | (uint)!bVar6 * auVar91._8_4_;
                bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
                auVar100._12_4_ = (uint)bVar6 * auVar90._12_4_ | (uint)!bVar6 * auVar91._12_4_;
                auVar89 = vfmsub231ps_avx512vl(auVar89,auVar100,auVar259);
                auVar89 = vfmsub231ps_avx512vl(auVar89,auVar100,auVar88);
                auVar256._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                auVar256._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                auVar256._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                auVar256._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                auVar90 = vfmadd213ps_avx512vl(auVar230,auVar89,auVar262);
                auVar90 = vfmadd213ps_avx512vl(auVar90,auVar89,auVar265);
                auVar90 = vfmadd213ps_avx512vl(auVar90,auVar89,auVar219);
                auVar90 = vfmadd213ps_avx512vl(auVar90,auVar89,auVar243);
                auVar90 = vfmadd213ps_avx512vl(auVar90,auVar89,auVar86);
                auVar90 = vfmadd213ps_avx512vl(auVar90,auVar256,auVar89);
                auVar89 = vcvttps2dq_avx512vl(auVar100);
                auVar89 = vpslld_avx(auVar89,0x17);
                auVar89 = vpaddd_avx(auVar89,auVar247);
                auVar90 = vfmadd213ps_avx512vl(auVar89,auVar90,auVar89);
                *(undefined1 (*) [16])*pauVar74 = auVar90;
                auVar89 = vshufpd_avx(auVar90,auVar90,1);
                auVar252._0_4_ = auVar89._0_4_ + auVar90._0_4_;
                auVar252._4_4_ = auVar89._4_4_ + auVar90._4_4_;
                auVar252._8_4_ = auVar89._8_4_ + auVar90._8_4_;
                auVar252._12_4_ = auVar89._12_4_ + auVar90._12_4_;
                auVar89 = vmovshdup_avx(auVar252);
                *(float *)(*pauVar78 + lVar81 * 4) =
                     auVar89._0_4_ + *(float *)(*pauVar78 + lVar81 * 4) + auVar252._0_4_;
                pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x10);
                lVar81 = lVar81 + 1;
              } while (size1 - uVar75 != (int)lVar81);
            }
            uVar76 = uVar76 + 1;
            auVar142 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          } while (uVar76 != (uint)elemcount);
        }
      }
      uVar75 = 0;
      pauVar74 = (undefined1 (*) [64])_sumptr;
      if (0xf < size1) {
        iVar79 = 0xf;
        auVar140 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        do {
          auVar141 = vdivps_avx512f(auVar140,*pauVar74);
          *pauVar74 = auVar141;
          pauVar74 = pauVar74 + 1;
          iVar79 = iVar79 + 0x10;
        } while (iVar79 < size1);
        uVar75 = size1 & 0x7ffffff0;
      }
      if ((int)(uVar75 | 7) < size1) {
        auVar197._8_4_ = 0x3f800000;
        auVar197._0_8_ = 0x3f8000003f800000;
        auVar197._12_4_ = 0x3f800000;
        auVar197._16_4_ = 0x3f800000;
        auVar197._20_4_ = 0x3f800000;
        auVar197._24_4_ = 0x3f800000;
        auVar197._28_4_ = 0x3f800000;
        uVar84 = uVar75;
        do {
          auVar102 = vdivps_avx(auVar197,*(undefined1 (*) [32])*pauVar74);
          *(undefined1 (*) [32])*pauVar74 = auVar102;
          pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x20);
          uVar75 = uVar84 + 8;
          iVar79 = uVar84 + 0xf;
          uVar84 = uVar75;
        } while (iVar79 < size1);
      }
      if ((int)(uVar75 | 3) < size1) {
        auVar194._8_4_ = 0x3f800000;
        auVar194._0_8_ = 0x3f8000003f800000;
        auVar194._12_4_ = 0x3f800000;
        uVar84 = uVar75;
        do {
          auVar86 = vdivps_avx(auVar194,*(undefined1 (*) [16])*pauVar74);
          *(undefined1 (*) [16])*pauVar74 = auVar86;
          pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x10);
          uVar75 = uVar84 + 4;
          iVar79 = uVar84 + 7;
          uVar84 = uVar75;
        } while (iVar79 < size1);
      }
      if ((int)uVar75 < size1) {
        auVar140 = vpbroadcastq_avx512f();
        uVar76 = 0;
        auVar141 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar142 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar143 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        do {
          auVar144 = vpbroadcastq_avx512f();
          auVar145 = vporq_avx512f(auVar144,auVar141);
          auVar144 = vporq_avx512f(auVar144,auVar142);
          uVar21 = vpcmpuq_avx512f(auVar144,auVar140,2);
          bVar59 = (byte)uVar21;
          uVar21 = vpcmpuq_avx512f(auVar145,auVar140,2);
          bVar62 = (byte)uVar21;
          uVar85 = CONCAT11(bVar62,bVar59);
          piVar2 = (int *)(*pauVar74 + uVar76 * 4);
          auVar187._4_4_ = (uint)((byte)(uVar85 >> 1) & 1) * piVar2[1];
          auVar187._0_4_ = (uint)(bVar59 & 1) * *piVar2;
          auVar187._8_4_ = (uint)((byte)(uVar85 >> 2) & 1) * piVar2[2];
          auVar187._12_4_ = (uint)((byte)(uVar85 >> 3) & 1) * piVar2[3];
          auVar187._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * piVar2[4];
          auVar187._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * piVar2[5];
          auVar187._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * piVar2[6];
          auVar187._28_4_ = (uint)((byte)(uVar85 >> 7) & 1) * piVar2[7];
          auVar187._32_4_ = (uint)(bVar62 & 1) * piVar2[8];
          auVar187._36_4_ = (uint)(bVar62 >> 1 & 1) * piVar2[9];
          auVar187._40_4_ = (uint)(bVar62 >> 2 & 1) * piVar2[10];
          auVar187._44_4_ = (uint)(bVar62 >> 3 & 1) * piVar2[0xb];
          auVar187._48_4_ = (uint)(bVar62 >> 4 & 1) * piVar2[0xc];
          auVar187._52_4_ = (uint)(bVar62 >> 5 & 1) * piVar2[0xd];
          auVar187._56_4_ = (uint)(bVar62 >> 6 & 1) * piVar2[0xe];
          auVar187._60_4_ = (uint)(bVar62 >> 7) * piVar2[0xf];
          auVar144 = vdivps_avx512f(auVar143,auVar187);
          puVar1 = (uint *)(*pauVar74 + uVar76 * 4);
          bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
          bVar13 = (bool)(bVar62 >> 1 & 1);
          bVar14 = (bool)(bVar62 >> 2 & 1);
          bVar15 = (bool)(bVar62 >> 3 & 1);
          bVar16 = (bool)(bVar62 >> 4 & 1);
          bVar17 = (bool)(bVar62 >> 5 & 1);
          bVar18 = (bool)(bVar62 >> 6 & 1);
          *puVar1 = (uint)(bVar59 & 1) * auVar144._0_4_ | (uint)!(bool)(bVar59 & 1) * *puVar1;
          puVar1[1] = (uint)bVar6 * auVar144._4_4_ | (uint)!bVar6 * puVar1[1];
          puVar1[2] = (uint)bVar7 * auVar144._8_4_ | (uint)!bVar7 * puVar1[2];
          puVar1[3] = (uint)bVar8 * auVar144._12_4_ | (uint)!bVar8 * puVar1[3];
          puVar1[4] = (uint)bVar9 * auVar144._16_4_ | (uint)!bVar9 * puVar1[4];
          puVar1[5] = (uint)bVar10 * auVar144._20_4_ | (uint)!bVar10 * puVar1[5];
          puVar1[6] = (uint)bVar11 * auVar144._24_4_ | (uint)!bVar11 * puVar1[6];
          puVar1[7] = (uint)bVar12 * auVar144._28_4_ | (uint)!bVar12 * puVar1[7];
          puVar1[8] = (uint)(bVar62 & 1) * auVar144._32_4_ | (uint)!(bool)(bVar62 & 1) * puVar1[8];
          puVar1[9] = (uint)bVar13 * auVar144._36_4_ | (uint)!bVar13 * puVar1[9];
          puVar1[10] = (uint)bVar14 * auVar144._40_4_ | (uint)!bVar14 * puVar1[10];
          puVar1[0xb] = (uint)bVar15 * auVar144._44_4_ | (uint)!bVar15 * puVar1[0xb];
          puVar1[0xc] = (uint)bVar16 * auVar144._48_4_ | (uint)!bVar16 * puVar1[0xc];
          puVar1[0xd] = (uint)bVar17 * auVar144._52_4_ | (uint)!bVar17 * puVar1[0xd];
          puVar1[0xe] = (uint)bVar18 * auVar144._56_4_ | (uint)!bVar18 * puVar1[0xe];
          puVar1[0xf] = (uint)(bVar62 >> 7) * auVar144._60_4_ |
                        (uint)!(bool)(bVar62 >> 7) * puVar1[0xf];
          uVar76 = uVar76 + 0x10;
        } while (((ulong)(~uVar75 + size1) + 0x10 & 0xfffffffffffffff0) != uVar76);
      }
      auVar143 = _DAT_005f9900;
      auVar142 = _DAT_005f98c0;
      auVar141 = _DAT_005f9880;
      auVar140 = _DAT_005f9840;
      if (0 < elemcount) {
        uVar76 = 0;
        do {
          pauVar74 = (undefined1 (*) [64])(_ptr + uVar76 * (long)stride);
          pauVar78 = (undefined1 (*) [64])_sumptr;
          if (size1 < 0x10) {
            uVar75 = 0;
          }
          else {
            iVar79 = 0xf;
            do {
              auVar144 = *pauVar78;
              auVar145 = vpermps_avx512f(auVar140,auVar144);
              auVar188 = vpermps_avx512f(auVar141,auVar144);
              auVar189 = vpermps_avx512f(auVar142,auVar144);
              auVar144 = vpermps_avx512f(auVar143,auVar144);
              auVar145 = vmulps_avx512f(auVar145,*pauVar74);
              auVar188 = vmulps_avx512f(auVar188,pauVar74[1]);
              auVar189 = vmulps_avx512f(auVar189,pauVar74[2]);
              auVar144 = vmulps_avx512f(auVar144,pauVar74[3]);
              *pauVar74 = auVar145;
              pauVar74[1] = auVar188;
              pauVar74[2] = auVar189;
              pauVar74[3] = auVar144;
              pauVar74 = pauVar74 + 4;
              pauVar78 = pauVar78 + 1;
              iVar79 = iVar79 + 0x10;
              uVar75 = size1 & 0xfffffff0;
            } while (iVar79 < size1);
          }
          uVar84 = uVar75 | 7;
          while ((int)uVar84 < size1) {
            fVar192 = *(float *)*pauVar78;
            fVar5 = *(float *)(*pauVar78 + 4);
            auVar63._4_4_ = fVar192 * *(float *)(*pauVar74 + 4);
            auVar63._0_4_ = fVar192 * *(float *)*pauVar74;
            auVar63._8_4_ = fVar192 * *(float *)(*pauVar74 + 8);
            auVar63._12_4_ = fVar192 * *(float *)(*pauVar74 + 0xc);
            auVar63._16_4_ = fVar5 * *(float *)(*pauVar74 + 0x10);
            auVar63._20_4_ = fVar5 * *(float *)(*pauVar74 + 0x14);
            auVar63._24_4_ = fVar5 * *(float *)(*pauVar74 + 0x18);
            auVar63._28_4_ = fVar5;
            fVar192 = *(float *)(*pauVar78 + 8);
            fVar5 = *(float *)(*pauVar78 + 0xc);
            auVar64._4_4_ = fVar192 * *(float *)(*pauVar74 + 0x24);
            auVar64._0_4_ = fVar192 * *(float *)(*pauVar74 + 0x20);
            auVar64._8_4_ = fVar192 * *(float *)(*pauVar74 + 0x28);
            auVar64._12_4_ = fVar192 * *(float *)(*pauVar74 + 0x2c);
            auVar64._16_4_ = fVar5 * *(float *)(*pauVar74 + 0x30);
            auVar64._20_4_ = fVar5 * *(float *)(*pauVar74 + 0x34);
            auVar64._24_4_ = fVar5 * *(float *)(*pauVar74 + 0x38);
            auVar64._28_4_ = fVar5;
            fVar192 = *(float *)(*pauVar78 + 0x10);
            fVar5 = *(float *)(*pauVar78 + 0x14);
            auVar65._4_4_ = fVar192 * *(float *)(pauVar74[1] + 4);
            auVar65._0_4_ = fVar192 * *(float *)pauVar74[1];
            auVar65._8_4_ = fVar192 * *(float *)(pauVar74[1] + 8);
            auVar65._12_4_ = fVar192 * *(float *)(pauVar74[1] + 0xc);
            auVar65._16_4_ = fVar5 * *(float *)(pauVar74[1] + 0x10);
            auVar65._20_4_ = fVar5 * *(float *)(pauVar74[1] + 0x14);
            auVar65._24_4_ = fVar5 * *(float *)(pauVar74[1] + 0x18);
            auVar65._28_4_ = fVar5;
            fVar192 = *(float *)(*pauVar78 + 0x18);
            fVar5 = *(float *)(*pauVar78 + 0x1c);
            auVar66._4_4_ = fVar192 * *(float *)(pauVar74[1] + 0x24);
            auVar66._0_4_ = fVar192 * *(float *)(pauVar74[1] + 0x20);
            auVar66._8_4_ = fVar192 * *(float *)(pauVar74[1] + 0x28);
            auVar66._12_4_ = fVar192 * *(float *)(pauVar74[1] + 0x2c);
            auVar66._16_4_ = fVar5 * *(float *)(pauVar74[1] + 0x30);
            auVar66._20_4_ = fVar5 * *(float *)(pauVar74[1] + 0x34);
            auVar66._24_4_ = fVar5 * *(float *)(pauVar74[1] + 0x38);
            auVar66._28_4_ = fVar5;
            *(undefined1 (*) [32])*pauVar74 = auVar63;
            *(undefined1 (*) [32])(*pauVar74 + 0x20) = auVar64;
            *(undefined1 (*) [32])pauVar74[1] = auVar65;
            *(undefined1 (*) [32])(pauVar74[1] + 0x20) = auVar66;
            pauVar74 = pauVar74 + 2;
            pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x20);
            uVar84 = uVar75 + 0xf;
            uVar75 = uVar75 + 8;
          }
          uVar84 = uVar75 | 3;
          while ((int)uVar84 < size1) {
            fVar192 = *(float *)*pauVar78;
            auVar225._0_4_ = fVar192 * *(float *)*pauVar74;
            auVar225._4_4_ = fVar192 * *(float *)(*pauVar74 + 4);
            auVar225._8_4_ = fVar192 * *(float *)(*pauVar74 + 8);
            auVar225._12_4_ = fVar192 * *(float *)(*pauVar74 + 0xc);
            fVar192 = *(float *)(*pauVar78 + 4);
            auVar227._0_4_ = fVar192 * *(float *)(*pauVar74 + 0x10);
            auVar227._4_4_ = fVar192 * *(float *)(*pauVar74 + 0x14);
            auVar227._8_4_ = fVar192 * *(float *)(*pauVar74 + 0x18);
            auVar227._12_4_ = fVar192 * *(float *)(*pauVar74 + 0x1c);
            fVar192 = *(float *)(*pauVar78 + 8);
            auVar229._0_4_ = fVar192 * *(float *)(*pauVar74 + 0x20);
            auVar229._4_4_ = fVar192 * *(float *)(*pauVar74 + 0x24);
            auVar229._8_4_ = fVar192 * *(float *)(*pauVar74 + 0x28);
            auVar229._12_4_ = fVar192 * *(float *)(*pauVar74 + 0x2c);
            fVar192 = *(float *)(*pauVar78 + 0xc);
            auVar232._0_4_ = fVar192 * *(float *)(*pauVar74 + 0x30);
            auVar232._4_4_ = fVar192 * *(float *)(*pauVar74 + 0x34);
            auVar232._8_4_ = fVar192 * *(float *)(*pauVar74 + 0x38);
            auVar232._12_4_ = fVar192 * *(float *)(*pauVar74 + 0x3c);
            *(undefined1 (*) [16])*pauVar74 = auVar225;
            *(undefined1 (*) [16])(*pauVar74 + 0x10) = auVar227;
            *(undefined1 (*) [16])(*pauVar74 + 0x20) = auVar229;
            *(undefined1 (*) [16])(*pauVar74 + 0x30) = auVar232;
            pauVar74 = pauVar74 + 1;
            pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x10);
            uVar84 = uVar75 + 7;
            uVar75 = uVar75 + 4;
          }
          if ((int)uVar75 < size1) {
            lVar81 = 0;
            do {
              fVar192 = *(float *)(*pauVar78 + lVar81 * 4);
              auVar226._0_4_ = fVar192 * *(float *)*pauVar74;
              auVar226._4_4_ = fVar192 * *(float *)(*pauVar74 + 4);
              auVar226._8_4_ = fVar192 * *(float *)(*pauVar74 + 8);
              auVar226._12_4_ = fVar192 * *(float *)(*pauVar74 + 0xc);
              *(undefined1 (*) [16])*pauVar74 = auVar226;
              pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x10);
              lVar81 = lVar81 + 1;
            } while (size1 - uVar75 != (int)lVar81);
          }
          uVar76 = uVar76 + 1;
        } while (uVar76 != (uint)elemcount);
      }
    }
  }
  else if (elempack == 8) {
    if (0 < elemcount) {
      uVar76 = 0;
      do {
        pauVar74 = (undefined1 (*) [64])(_ptr + uVar76 * (long)stride);
        pauVar78 = (undefined1 (*) [64])_maxptr;
        if (size1 < 0x10) {
          uVar75 = 0;
        }
        else {
          iVar79 = 0xf;
          do {
            auVar140 = vunpcklps_avx512f(*pauVar74,pauVar74[1]);
            auVar142 = vunpckhps_avx512f(*pauVar74,pauVar74[1]);
            auVar140 = vmaxps_avx512f(auVar140,auVar142);
            auVar142 = vunpcklps_avx512f(pauVar74[2],pauVar74[3]);
            auVar143 = vunpckhps_avx512f(pauVar74[2],pauVar74[3]);
            auVar142 = vmaxps_avx512f(auVar142,auVar143);
            auVar143 = vunpcklps_avx512f(pauVar74[4],pauVar74[5]);
            auVar144 = vunpckhps_avx512f(pauVar74[4],pauVar74[5]);
            auVar143 = vmaxps_avx512f(auVar143,auVar144);
            auVar144 = vunpcklps_avx512f(pauVar74[6],pauVar74[7]);
            auVar145 = vunpckhps_avx512f(pauVar74[6],pauVar74[7]);
            auVar144 = vmaxps_avx512f(auVar144,auVar145);
            auVar145 = vunpcklps_avx512f(auVar140,auVar142);
            auVar140 = vunpckhps_avx512f(auVar140,auVar142);
            auVar140 = vmaxps_avx512f(auVar145,auVar140);
            auVar142 = vunpcklps_avx512f(auVar143,auVar144);
            auVar143 = vunpckhps_avx512f(auVar143,auVar144);
            auVar142 = vmaxps_avx512f(auVar142,auVar143);
            auVar143 = vshuff64x2_avx512f(auVar140,auVar142,0x88);
            auVar140 = vshuff64x2_avx512f(auVar140,auVar142,0xdd);
            auVar140 = vmaxps_avx512f(auVar143,auVar140);
            auVar140 = vpermps_avx512f(auVar141,auVar140);
            auVar140 = vmaxps_avx512f(auVar140,*pauVar78);
            *pauVar78 = auVar140;
            pauVar74 = pauVar74 + 8;
            pauVar78 = pauVar78 + 1;
            iVar79 = iVar79 + 0x10;
            uVar75 = size1 & 0xfffffff0;
          } while (iVar79 < size1);
        }
        uVar84 = uVar75 | 7;
        while ((int)uVar84 < size1) {
          auVar103 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar74,*(undefined1 (*) [32])pauVar74[2]
                                  );
          auVar102 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar74,*(undefined1 (*) [32])pauVar74[2]
                                  );
          auVar102 = vmaxps_avx(auVar103,auVar102);
          auVar104 = vunpcklps_avx(*(undefined1 (*) [32])pauVar74[1],
                                   *(undefined1 (*) [32])pauVar74[3]);
          auVar103 = vunpckhps_avx(*(undefined1 (*) [32])pauVar74[1],
                                   *(undefined1 (*) [32])pauVar74[3]);
          auVar103 = vmaxps_avx(auVar104,auVar103);
          auVar105 = vunpcklps_avx(*(undefined1 (*) [32])(*pauVar74 + 0x20),
                                   *(undefined1 (*) [32])(pauVar74[2] + 0x20));
          auVar104 = vunpckhps_avx(*(undefined1 (*) [32])(*pauVar74 + 0x20),
                                   *(undefined1 (*) [32])(pauVar74[2] + 0x20));
          auVar104 = vmaxps_avx(auVar105,auVar104);
          auVar106 = vunpcklps_avx(*(undefined1 (*) [32])(pauVar74[1] + 0x20),
                                   *(undefined1 (*) [32])(pauVar74[3] + 0x20));
          auVar105 = vunpckhps_avx(*(undefined1 (*) [32])(pauVar74[1] + 0x20),
                                   *(undefined1 (*) [32])(pauVar74[3] + 0x20));
          auVar105 = vmaxps_avx(auVar106,auVar105);
          auVar106 = vunpcklps_avx(auVar102,auVar103);
          auVar102 = vunpckhps_avx(auVar102,auVar103);
          auVar102 = vmaxps_avx(auVar106,auVar102);
          auVar106 = vunpcklps_avx(auVar104,auVar105);
          auVar103 = vunpckhps_avx(auVar104,auVar105);
          auVar103 = vmaxps_avx(auVar106,auVar103);
          auVar104 = vunpcklps_avx(auVar102,auVar103);
          auVar102 = vunpckhps_avx(auVar102,auVar103);
          auVar103._16_16_ = auVar102._0_16_;
          auVar103._0_16_ = auVar104._0_16_;
          auVar102 = vperm2f128_avx(auVar104,auVar102,0x31);
          auVar102 = vmaxps_avx(auVar103,auVar102);
          auVar102 = vmaxps_avx(auVar102,*(undefined1 (*) [32])*pauVar78);
          *(undefined1 (*) [32])*pauVar78 = auVar102;
          pauVar74 = pauVar74 + 4;
          pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x20);
          uVar84 = uVar75 + 0xf;
          uVar75 = uVar75 + 8;
        }
        if ((int)uVar75 < size1) {
          lVar81 = 0;
          do {
            auVar86 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar74 + 0x10),
                                 *(undefined1 (*) [16])*pauVar74);
            auVar87 = vshufpd_avx(auVar86,auVar86,3);
            auVar86 = vmaxps_avx(auVar86,auVar87);
            auVar87 = vmovshdup_avx(auVar86);
            auVar86 = vmaxss_avx(auVar86,auVar87);
            auVar86 = vmaxss_avx(auVar86,ZEXT416(*(uint *)(*pauVar78 + lVar81 * 4)));
            *(int *)(*pauVar78 + lVar81 * 4) = auVar86._0_4_;
            pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x20);
            lVar81 = lVar81 + 1;
          } while (size1 - uVar75 != (int)lVar81);
        }
        uVar76 = uVar76 + 1;
      } while (uVar76 != (uint)elemcount);
      if (0 < elemcount) {
        auVar140 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar149 = vxorps_avx512dq(auVar140,(undefined1  [64])::_ps512_cephes_exp_C1);
        auVar146 = vxorps_avx512dq(auVar140,(undefined1  [64])::_ps512_cephes_exp_C2);
        uVar76 = 0;
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar189 = ZEXT3264(auVar102);
        auVar140 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar142 = ZEXT3264(auVar102);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar143 = ZEXT3264(auVar102);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar144 = ZEXT3264(auVar102);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar141 = ZEXT3264(auVar102);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar145 = ZEXT3264(auVar102);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar188 = ZEXT3264(auVar102);
        auVar102 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        auVar156 = ZEXT3264(auVar102);
        do {
          pauVar74 = (undefined1 (*) [64])(_ptr + uVar76 * (long)stride);
          pauVar78 = (undefined1 (*) [64])_sumptr;
          pfVar80 = _maxptr;
          if (size1 < 0x10) {
            uVar75 = 0;
          }
          else {
            iVar79 = 0xf;
            afVar270 = ::_ps512_1;
            afVar272 = ::_ps512_cephes_exp_p5;
            do {
              afVar269 = ::_ps512_cephes_exp_p5;
              afVar73 = ::_ps512_1;
              fVar192 = *pfVar80;
              fVar5 = pfVar80[1];
              auVar107._4_4_ = fVar5;
              auVar107._0_4_ = fVar5;
              auVar107._8_4_ = fVar5;
              auVar107._12_4_ = fVar5;
              auVar107._16_4_ = fVar5;
              auVar107._20_4_ = fVar5;
              auVar107._24_4_ = fVar5;
              auVar107._28_4_ = fVar5;
              fVar5 = pfVar80[2];
              fVar4 = pfVar80[3];
              auVar109._4_4_ = fVar4;
              auVar109._0_4_ = fVar4;
              auVar109._8_4_ = fVar4;
              auVar109._12_4_ = fVar4;
              auVar109._16_4_ = fVar4;
              auVar109._20_4_ = fVar4;
              auVar109._24_4_ = fVar4;
              auVar109._28_4_ = fVar4;
              auVar102 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar80[4]));
              auVar103 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar80[5]));
              auVar104 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar80[6]));
              auVar105 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar80[7]));
              auVar106 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar80[8]));
              auVar140 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(fVar192,CONCAT424(fVar192,CONCAT420(fVar192,
                                                  CONCAT416(fVar192,CONCAT412(fVar192,CONCAT48(
                                                  fVar192,CONCAT44(fVar192,fVar192)))))))),auVar107,
                                    1);
              fVar192 = pfVar80[9];
              auVar108._4_4_ = fVar192;
              auVar108._0_4_ = fVar192;
              auVar108._8_4_ = fVar192;
              auVar108._12_4_ = fVar192;
              auVar108._16_4_ = fVar192;
              auVar108._20_4_ = fVar192;
              auVar108._24_4_ = fVar192;
              auVar108._28_4_ = fVar192;
              auVar140 = vsubps_avx512f(*pauVar74,auVar140);
              auVar141 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,
                                                  CONCAT416(fVar5,CONCAT412(fVar5,CONCAT48(fVar5,
                                                  CONCAT44(fVar5,fVar5)))))))),auVar109,1);
              fVar192 = pfVar80[10];
              auVar141 = vsubps_avx512f(pauVar74[1],auVar141);
              auVar142 = vinsertf64x4_avx512f(ZEXT3264(auVar102),auVar103,1);
              fVar5 = pfVar80[0xb];
              auVar110._4_4_ = fVar5;
              auVar110._0_4_ = fVar5;
              auVar110._8_4_ = fVar5;
              auVar110._12_4_ = fVar5;
              auVar110._16_4_ = fVar5;
              auVar110._20_4_ = fVar5;
              auVar110._24_4_ = fVar5;
              auVar110._28_4_ = fVar5;
              auVar142 = vsubps_avx512f(pauVar74[2],auVar142);
              auVar143 = vinsertf64x4_avx512f(ZEXT3264(auVar104),auVar105,1);
              auVar102 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar80[0xc]));
              auVar143 = vsubps_avx512f(pauVar74[3],auVar143);
              auVar144 = vinsertf64x4_avx512f(ZEXT3264(auVar106),auVar108,1);
              fVar5 = pfVar80[0xd];
              auVar104._4_4_ = fVar5;
              auVar104._0_4_ = fVar5;
              auVar104._8_4_ = fVar5;
              auVar104._12_4_ = fVar5;
              auVar104._16_4_ = fVar5;
              auVar104._20_4_ = fVar5;
              auVar104._24_4_ = fVar5;
              auVar104._28_4_ = fVar5;
              auVar144 = vsubps_avx512f(pauVar74[4],auVar144);
              auVar145 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(fVar192,CONCAT424(fVar192,CONCAT420(fVar192,
                                                  CONCAT416(fVar192,CONCAT412(fVar192,CONCAT48(
                                                  fVar192,CONCAT44(fVar192,fVar192)))))))),auVar110,
                                    1);
              fVar192 = pfVar80[0xe];
              auVar145 = vsubps_avx512f(pauVar74[5],auVar145);
              auVar188 = vinsertf64x4_avx512f(ZEXT3264(auVar102),auVar104,1);
              fVar5 = pfVar80[0xf];
              auVar105._4_4_ = fVar5;
              auVar105._0_4_ = fVar5;
              auVar105._8_4_ = fVar5;
              auVar105._12_4_ = fVar5;
              auVar105._16_4_ = fVar5;
              auVar105._20_4_ = fVar5;
              auVar105._24_4_ = fVar5;
              auVar105._28_4_ = fVar5;
              auVar188 = vsubps_avx512f(pauVar74[6],auVar188);
              auVar189 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(fVar192,CONCAT424(fVar192,CONCAT420(fVar192,
                                                  CONCAT416(fVar192,CONCAT412(fVar192,CONCAT48(
                                                  fVar192,CONCAT44(fVar192,fVar192)))))))),auVar105,
                                    1);
              auVar189 = vsubps_avx512f(pauVar74[7],auVar189);
              auVar140 = vminps_avx512f(auVar140,(undefined1  [64])::_ps512_exp_hi);
              auVar140 = vmaxps_avx512f(auVar140,(undefined1  [64])::_ps512_exp_lo);
              auVar156 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar140,
                                             (undefined1  [64])afVar272);
              auVar147 = vrndscaleps_avx512f(auVar156,1);
              uVar77 = vcmpps_avx512f(auVar156,auVar147,1);
              auVar148 = vsubps_avx512f(auVar147,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar156._0_4_ = (uint)bVar6 * auVar148._0_4_ | (uint)!bVar6 * auVar147._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar156._4_4_ = (uint)bVar6 * auVar148._4_4_ | (uint)!bVar6 * auVar147._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar156._8_4_ = (uint)bVar6 * auVar148._8_4_ | (uint)!bVar6 * auVar147._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar156._12_4_ = (uint)bVar6 * auVar148._12_4_ | (uint)!bVar6 * auVar147._12_4_;
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar156._16_4_ = (uint)bVar6 * auVar148._16_4_ | (uint)!bVar6 * auVar147._16_4_;
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar156._20_4_ = (uint)bVar6 * auVar148._20_4_ | (uint)!bVar6 * auVar147._20_4_;
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar156._24_4_ = (uint)bVar6 * auVar148._24_4_ | (uint)!bVar6 * auVar147._24_4_;
              bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
              auVar156._28_4_ = (uint)bVar6 * auVar148._28_4_ | (uint)!bVar6 * auVar147._28_4_;
              bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
              auVar156._32_4_ = (uint)bVar6 * auVar148._32_4_ | (uint)!bVar6 * auVar147._32_4_;
              bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
              auVar156._36_4_ = (uint)bVar6 * auVar148._36_4_ | (uint)!bVar6 * auVar147._36_4_;
              bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
              auVar156._40_4_ = (uint)bVar6 * auVar148._40_4_ | (uint)!bVar6 * auVar147._40_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
              auVar156._44_4_ = (uint)bVar6 * auVar148._44_4_ | (uint)!bVar6 * auVar147._44_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
              auVar156._48_4_ = (uint)bVar6 * auVar148._48_4_ | (uint)!bVar6 * auVar147._48_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
              auVar156._52_4_ = (uint)bVar6 * auVar148._52_4_ | (uint)!bVar6 * auVar147._52_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
              auVar156._56_4_ = (uint)bVar6 * auVar148._56_4_ | (uint)!bVar6 * auVar147._56_4_;
              bVar6 = SUB81(uVar77 >> 0xf,0);
              auVar156._60_4_ = (uint)bVar6 * auVar148._60_4_ | (uint)!bVar6 * auVar147._60_4_;
              auVar140 = vfmadd231ps_avx512f(auVar140,auVar156,auVar149);
              auVar141 = vminps_avx512f(auVar141,(undefined1  [64])::_ps512_exp_hi);
              auVar140 = vfmadd231ps_avx512f(auVar140,auVar156,auVar146);
              auVar141 = vmaxps_avx512f(auVar141,(undefined1  [64])::_ps512_exp_lo);
              auVar147 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar141,
                                             (undefined1  [64])afVar272);
              auVar148 = vmulps_avx512f(auVar140,auVar140);
              auVar150 = vrndscaleps_avx512f(auVar147,1);
              uVar77 = vcmpps_avx512f(auVar147,auVar150,1);
              auVar151 = vsubps_avx512f(auVar150,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar147._0_4_ = (uint)bVar6 * auVar151._0_4_ | (uint)!bVar6 * auVar150._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar147._4_4_ = (uint)bVar6 * auVar151._4_4_ | (uint)!bVar6 * auVar150._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar147._8_4_ = (uint)bVar6 * auVar151._8_4_ | (uint)!bVar6 * auVar150._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar147._12_4_ = (uint)bVar6 * auVar151._12_4_ | (uint)!bVar6 * auVar150._12_4_;
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar147._16_4_ = (uint)bVar6 * auVar151._16_4_ | (uint)!bVar6 * auVar150._16_4_;
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar147._20_4_ = (uint)bVar6 * auVar151._20_4_ | (uint)!bVar6 * auVar150._20_4_;
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar147._24_4_ = (uint)bVar6 * auVar151._24_4_ | (uint)!bVar6 * auVar150._24_4_;
              bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
              auVar147._28_4_ = (uint)bVar6 * auVar151._28_4_ | (uint)!bVar6 * auVar150._28_4_;
              bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
              auVar147._32_4_ = (uint)bVar6 * auVar151._32_4_ | (uint)!bVar6 * auVar150._32_4_;
              bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
              auVar147._36_4_ = (uint)bVar6 * auVar151._36_4_ | (uint)!bVar6 * auVar150._36_4_;
              bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
              auVar147._40_4_ = (uint)bVar6 * auVar151._40_4_ | (uint)!bVar6 * auVar150._40_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
              auVar147._44_4_ = (uint)bVar6 * auVar151._44_4_ | (uint)!bVar6 * auVar150._44_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
              auVar147._48_4_ = (uint)bVar6 * auVar151._48_4_ | (uint)!bVar6 * auVar150._48_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
              auVar147._52_4_ = (uint)bVar6 * auVar151._52_4_ | (uint)!bVar6 * auVar150._52_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
              auVar147._56_4_ = (uint)bVar6 * auVar151._56_4_ | (uint)!bVar6 * auVar150._56_4_;
              bVar6 = SUB81(uVar77 >> 0xf,0);
              auVar147._60_4_ = (uint)bVar6 * auVar151._60_4_ | (uint)!bVar6 * auVar150._60_4_;
              auVar141 = vfmadd231ps_avx512f(auVar141,auVar147,auVar149);
              auVar141 = vfmadd231ps_avx512f(auVar141,auVar147,auVar146);
              auVar142 = vminps_avx512f(auVar142,(undefined1  [64])::_ps512_exp_hi);
              auVar150 = vmulps_avx512f(auVar141,auVar141);
              auVar142 = vmaxps_avx512f(auVar142,(undefined1  [64])::_ps512_exp_lo);
              auVar151 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar142,
                                             (undefined1  [64])afVar272);
              auVar157 = vrndscaleps_avx512f(auVar151,1);
              uVar77 = vcmpps_avx512f(auVar151,auVar157,1);
              auVar151 = vsubps_avx512f(auVar157,(undefined1  [64])::_ps512_1);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar158._0_4_ = (uint)bVar6 * auVar151._0_4_ | (uint)!bVar6 * auVar157._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar158._4_4_ = (uint)bVar6 * auVar151._4_4_ | (uint)!bVar6 * auVar157._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar158._8_4_ = (uint)bVar6 * auVar151._8_4_ | (uint)!bVar6 * auVar157._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar158._12_4_ = (uint)bVar6 * auVar151._12_4_ | (uint)!bVar6 * auVar157._12_4_;
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar158._16_4_ = (uint)bVar6 * auVar151._16_4_ | (uint)!bVar6 * auVar157._16_4_;
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar158._20_4_ = (uint)bVar6 * auVar151._20_4_ | (uint)!bVar6 * auVar157._20_4_;
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar158._24_4_ = (uint)bVar6 * auVar151._24_4_ | (uint)!bVar6 * auVar157._24_4_;
              bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
              auVar158._28_4_ = (uint)bVar6 * auVar151._28_4_ | (uint)!bVar6 * auVar157._28_4_;
              bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
              auVar158._32_4_ = (uint)bVar6 * auVar151._32_4_ | (uint)!bVar6 * auVar157._32_4_;
              bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
              auVar158._36_4_ = (uint)bVar6 * auVar151._36_4_ | (uint)!bVar6 * auVar157._36_4_;
              bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
              auVar158._40_4_ = (uint)bVar6 * auVar151._40_4_ | (uint)!bVar6 * auVar157._40_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
              auVar158._44_4_ = (uint)bVar6 * auVar151._44_4_ | (uint)!bVar6 * auVar157._44_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
              auVar158._48_4_ = (uint)bVar6 * auVar151._48_4_ | (uint)!bVar6 * auVar157._48_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
              auVar158._52_4_ = (uint)bVar6 * auVar151._52_4_ | (uint)!bVar6 * auVar157._52_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
              auVar158._56_4_ = (uint)bVar6 * auVar151._56_4_ | (uint)!bVar6 * auVar157._56_4_;
              bVar6 = SUB81(uVar77 >> 0xf,0);
              auVar158._60_4_ = (uint)bVar6 * auVar151._60_4_ | (uint)!bVar6 * auVar157._60_4_;
              auVar151 = vfmadd213ps_avx512f(auVar140,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar142 = vfmadd231ps_avx512f(auVar142,auVar158,auVar149);
              auVar142 = vfmadd231ps_avx512f(auVar142,auVar158,auVar146);
              auVar157 = vmulps_avx512f(auVar142,auVar142);
              auVar160 = vfmadd213ps_avx512f(auVar141,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar161 = vfmadd213ps_avx512f(auVar142,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar143 = vminps_avx512f(auVar143,(undefined1  [64])::_ps512_exp_hi);
              auVar151 = vfmadd213ps_avx512f(auVar151,auVar140,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar143 = vmaxps_avx512f(auVar143,(undefined1  [64])::_ps512_exp_lo);
              auVar162 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar143,
                                             (undefined1  [64])afVar272);
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar141,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar164 = vrndscaleps_avx512f(auVar162,1);
              uVar77 = vcmpps_avx512f(auVar162,auVar164,1);
              auVar175 = vsubps_avx512f(auVar164,(undefined1  [64])::_ps512_1);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar162._0_4_ = (uint)bVar6 * auVar175._0_4_ | (uint)!bVar6 * auVar164._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar162._4_4_ = (uint)bVar6 * auVar175._4_4_ | (uint)!bVar6 * auVar164._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar162._8_4_ = (uint)bVar6 * auVar175._8_4_ | (uint)!bVar6 * auVar164._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar162._12_4_ = (uint)bVar6 * auVar175._12_4_ | (uint)!bVar6 * auVar164._12_4_;
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar162._16_4_ = (uint)bVar6 * auVar175._16_4_ | (uint)!bVar6 * auVar164._16_4_;
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar162._20_4_ = (uint)bVar6 * auVar175._20_4_ | (uint)!bVar6 * auVar164._20_4_;
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar162._24_4_ = (uint)bVar6 * auVar175._24_4_ | (uint)!bVar6 * auVar164._24_4_;
              bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
              auVar162._28_4_ = (uint)bVar6 * auVar175._28_4_ | (uint)!bVar6 * auVar164._28_4_;
              bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
              auVar162._32_4_ = (uint)bVar6 * auVar175._32_4_ | (uint)!bVar6 * auVar164._32_4_;
              bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
              auVar162._36_4_ = (uint)bVar6 * auVar175._36_4_ | (uint)!bVar6 * auVar164._36_4_;
              bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
              auVar162._40_4_ = (uint)bVar6 * auVar175._40_4_ | (uint)!bVar6 * auVar164._40_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
              auVar162._44_4_ = (uint)bVar6 * auVar175._44_4_ | (uint)!bVar6 * auVar164._44_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
              auVar162._48_4_ = (uint)bVar6 * auVar175._48_4_ | (uint)!bVar6 * auVar164._48_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
              auVar162._52_4_ = (uint)bVar6 * auVar175._52_4_ | (uint)!bVar6 * auVar164._52_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
              auVar162._56_4_ = (uint)bVar6 * auVar175._56_4_ | (uint)!bVar6 * auVar164._56_4_;
              bVar6 = SUB81(uVar77 >> 0xf,0);
              auVar162._60_4_ = (uint)bVar6 * auVar175._60_4_ | (uint)!bVar6 * auVar164._60_4_;
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar142,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar143 = vfmadd231ps_avx512f(auVar143,auVar162,auVar149);
              auVar143 = vfmadd231ps_avx512f(auVar143,auVar162,auVar146);
              auVar164 = vmulps_avx512f(auVar143,auVar143);
              auVar151 = vfmadd213ps_avx512f(auVar151,auVar140,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar175 = vfmadd213ps_avx512f(auVar143,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar175 = vfmadd213ps_avx512f(auVar175,auVar143,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar141,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar144 = vminps_avx512f(auVar144,(undefined1  [64])::_ps512_exp_hi);
              auVar144 = vmaxps_avx512f(auVar144,(undefined1  [64])::_ps512_exp_lo);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar142,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar176 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar144,
                                             (undefined1  [64])afVar272);
              auVar177 = vrndscaleps_avx512f(auVar176,1);
              uVar77 = vcmpps_avx512f(auVar176,auVar177,1);
              auVar175 = vfmadd213ps_avx512f(auVar175,auVar143,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar176 = vsubps_avx512f(auVar177,(undefined1  [64])::_ps512_1);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar180._0_4_ = (uint)bVar6 * auVar176._0_4_ | (uint)!bVar6 * auVar177._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar180._4_4_ = (uint)bVar6 * auVar176._4_4_ | (uint)!bVar6 * auVar177._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar180._8_4_ = (uint)bVar6 * auVar176._8_4_ | (uint)!bVar6 * auVar177._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar180._12_4_ = (uint)bVar6 * auVar176._12_4_ | (uint)!bVar6 * auVar177._12_4_;
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar180._16_4_ = (uint)bVar6 * auVar176._16_4_ | (uint)!bVar6 * auVar177._16_4_;
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar180._20_4_ = (uint)bVar6 * auVar176._20_4_ | (uint)!bVar6 * auVar177._20_4_;
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar180._24_4_ = (uint)bVar6 * auVar176._24_4_ | (uint)!bVar6 * auVar177._24_4_;
              bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
              auVar180._28_4_ = (uint)bVar6 * auVar176._28_4_ | (uint)!bVar6 * auVar177._28_4_;
              bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
              auVar180._32_4_ = (uint)bVar6 * auVar176._32_4_ | (uint)!bVar6 * auVar177._32_4_;
              bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
              auVar180._36_4_ = (uint)bVar6 * auVar176._36_4_ | (uint)!bVar6 * auVar177._36_4_;
              bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
              auVar180._40_4_ = (uint)bVar6 * auVar176._40_4_ | (uint)!bVar6 * auVar177._40_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
              auVar180._44_4_ = (uint)bVar6 * auVar176._44_4_ | (uint)!bVar6 * auVar177._44_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
              auVar180._48_4_ = (uint)bVar6 * auVar176._48_4_ | (uint)!bVar6 * auVar177._48_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
              auVar180._52_4_ = (uint)bVar6 * auVar176._52_4_ | (uint)!bVar6 * auVar177._52_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
              auVar180._56_4_ = (uint)bVar6 * auVar176._56_4_ | (uint)!bVar6 * auVar177._56_4_;
              bVar6 = SUB81(uVar77 >> 0xf,0);
              auVar180._60_4_ = (uint)bVar6 * auVar176._60_4_ | (uint)!bVar6 * auVar177._60_4_;
              auVar144 = vfmadd231ps_avx512f(auVar144,auVar180,auVar149);
              auVar144 = vfmadd231ps_avx512f(auVar144,auVar180,auVar146);
              auVar151 = vfmadd213ps_avx512f(auVar151,auVar140,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar176 = vmulps_avx512f(auVar144,auVar144);
              auVar177 = vfmadd213ps_avx512f(auVar144,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar141,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar177 = vfmadd213ps_avx512f(auVar177,auVar144,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar177 = vfmadd213ps_avx512f(auVar177,auVar144,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar145 = vminps_avx512f(auVar145,(undefined1  [64])::_ps512_exp_hi);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar142,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar145 = vmaxps_avx512f(auVar145,(undefined1  [64])::_ps512_exp_lo);
              auVar181 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar145,
                                             (undefined1  [64])afVar272);
              auVar175 = vfmadd213ps_avx512f(auVar175,auVar143,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar182 = vrndscaleps_avx512f(auVar181,1);
              uVar77 = vcmpps_avx512f(auVar181,auVar182,1);
              auVar183 = vsubps_avx512f(auVar182,(undefined1  [64])::_ps512_1);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar181._0_4_ = (uint)bVar6 * auVar183._0_4_ | (uint)!bVar6 * auVar182._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar181._4_4_ = (uint)bVar6 * auVar183._4_4_ | (uint)!bVar6 * auVar182._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar181._8_4_ = (uint)bVar6 * auVar183._8_4_ | (uint)!bVar6 * auVar182._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar181._12_4_ = (uint)bVar6 * auVar183._12_4_ | (uint)!bVar6 * auVar182._12_4_;
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar181._16_4_ = (uint)bVar6 * auVar183._16_4_ | (uint)!bVar6 * auVar182._16_4_;
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar181._20_4_ = (uint)bVar6 * auVar183._20_4_ | (uint)!bVar6 * auVar182._20_4_;
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar181._24_4_ = (uint)bVar6 * auVar183._24_4_ | (uint)!bVar6 * auVar182._24_4_;
              bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
              auVar181._28_4_ = (uint)bVar6 * auVar183._28_4_ | (uint)!bVar6 * auVar182._28_4_;
              bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
              auVar181._32_4_ = (uint)bVar6 * auVar183._32_4_ | (uint)!bVar6 * auVar182._32_4_;
              bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
              auVar181._36_4_ = (uint)bVar6 * auVar183._36_4_ | (uint)!bVar6 * auVar182._36_4_;
              bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
              auVar181._40_4_ = (uint)bVar6 * auVar183._40_4_ | (uint)!bVar6 * auVar182._40_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
              auVar181._44_4_ = (uint)bVar6 * auVar183._44_4_ | (uint)!bVar6 * auVar182._44_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
              auVar181._48_4_ = (uint)bVar6 * auVar183._48_4_ | (uint)!bVar6 * auVar182._48_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
              auVar181._52_4_ = (uint)bVar6 * auVar183._52_4_ | (uint)!bVar6 * auVar182._52_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
              auVar181._56_4_ = (uint)bVar6 * auVar183._56_4_ | (uint)!bVar6 * auVar182._56_4_;
              bVar6 = SUB81(uVar77 >> 0xf,0);
              auVar181._60_4_ = (uint)bVar6 * auVar183._60_4_ | (uint)!bVar6 * auVar182._60_4_;
              auVar177 = vfmadd213ps_avx512f(auVar177,auVar144,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar145 = vfmadd231ps_avx512f(auVar145,auVar181,auVar149);
              auVar145 = vfmadd231ps_avx512f(auVar145,auVar181,auVar146);
              auVar182 = vmulps_avx512f(auVar145,auVar145);
              auVar151 = vfmadd213ps_avx512f(auVar151,auVar140,(undefined1  [64])afVar272);
              auVar183 = vfmadd213ps_avx512f(auVar145,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar183 = vfmadd213ps_avx512f(auVar183,auVar145,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar141,(undefined1  [64])afVar272);
              auVar183 = vfmadd213ps_avx512f(auVar183,auVar145,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar183 = vfmadd213ps_avx512f(auVar183,auVar145,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar188 = vminps_avx512f(auVar188,(undefined1  [64])::_ps512_exp_hi);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar142,
                                             (undefined1  [64])::_ps512_cephes_exp_p5);
              auVar188 = vmaxps_avx512f(auVar188,(undefined1  [64])::_ps512_exp_lo);
              auVar184 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar188,
                                             (undefined1  [64])::_ps512_cephes_exp_p5);
              auVar175 = vfmadd213ps_avx512f(auVar175,auVar143,
                                             (undefined1  [64])::_ps512_cephes_exp_p5);
              auVar185 = vrndscaleps_avx512f(auVar184,1);
              uVar77 = vcmpps_avx512f(auVar184,auVar185,1);
              auVar186 = vsubps_avx512f(auVar185,(undefined1  [64])::_ps512_1);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar184._0_4_ = (uint)bVar6 * auVar186._0_4_ | (uint)!bVar6 * auVar185._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar184._4_4_ = (uint)bVar6 * auVar186._4_4_ | (uint)!bVar6 * auVar185._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar184._8_4_ = (uint)bVar6 * auVar186._8_4_ | (uint)!bVar6 * auVar185._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar184._12_4_ = (uint)bVar6 * auVar186._12_4_ | (uint)!bVar6 * auVar185._12_4_;
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar184._16_4_ = (uint)bVar6 * auVar186._16_4_ | (uint)!bVar6 * auVar185._16_4_;
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar184._20_4_ = (uint)bVar6 * auVar186._20_4_ | (uint)!bVar6 * auVar185._20_4_;
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar184._24_4_ = (uint)bVar6 * auVar186._24_4_ | (uint)!bVar6 * auVar185._24_4_;
              bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
              auVar184._28_4_ = (uint)bVar6 * auVar186._28_4_ | (uint)!bVar6 * auVar185._28_4_;
              bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
              auVar184._32_4_ = (uint)bVar6 * auVar186._32_4_ | (uint)!bVar6 * auVar185._32_4_;
              bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
              auVar184._36_4_ = (uint)bVar6 * auVar186._36_4_ | (uint)!bVar6 * auVar185._36_4_;
              bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
              auVar184._40_4_ = (uint)bVar6 * auVar186._40_4_ | (uint)!bVar6 * auVar185._40_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
              auVar184._44_4_ = (uint)bVar6 * auVar186._44_4_ | (uint)!bVar6 * auVar185._44_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
              auVar184._48_4_ = (uint)bVar6 * auVar186._48_4_ | (uint)!bVar6 * auVar185._48_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
              auVar184._52_4_ = (uint)bVar6 * auVar186._52_4_ | (uint)!bVar6 * auVar185._52_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
              auVar184._56_4_ = (uint)bVar6 * auVar186._56_4_ | (uint)!bVar6 * auVar185._56_4_;
              bVar6 = SUB81(uVar77 >> 0xf,0);
              auVar184._60_4_ = (uint)bVar6 * auVar186._60_4_ | (uint)!bVar6 * auVar185._60_4_;
              auVar177 = vfmadd213ps_avx512f(auVar177,auVar144,
                                             (undefined1  [64])::_ps512_cephes_exp_p5);
              auVar188 = vfmadd231ps_avx512f(auVar188,auVar184,auVar149);
              auVar188 = vfmadd231ps_avx512f(auVar188,auVar184,auVar146);
              auVar189 = vminps_avx512f((undefined1  [64])::_ps512_exp_hi,auVar189);
              auVar183 = vfmadd213ps_avx512f(auVar183,auVar145,
                                             (undefined1  [64])::_ps512_cephes_exp_p5);
              auVar189 = vmaxps_avx512f(auVar189,(undefined1  [64])::_ps512_exp_lo);
              auVar185 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar189,
                                             (undefined1  [64])::_ps512_cephes_exp_p5);
              auVar140 = vfmadd132ps_avx512f(auVar151,auVar140,auVar148);
              auVar148 = vrndscaleps_avx512f(auVar185,1);
              uVar77 = vcmpps_avx512f(auVar185,auVar148,1);
              auVar151 = vmulps_avx512f(auVar188,auVar188);
              auVar141 = vfmadd132ps_avx512f(auVar160,auVar141,auVar150);
              auVar150 = vfmadd213ps_avx512f(auVar188,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar150 = vfmadd213ps_avx512f(auVar150,auVar188,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar142 = vfmadd132ps_avx512f(auVar161,auVar142,auVar157);
              auVar150 = vfmadd213ps_avx512f(auVar150,auVar188,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar150 = vfmadd213ps_avx512f(auVar150,auVar188,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar150 = vfmadd213ps_avx512f(auVar150,auVar188,
                                             (undefined1  [64])::_ps512_cephes_exp_p5);
              auVar143 = vfmadd132ps_avx512f(auVar175,auVar143,auVar164);
              auVar157 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
              auVar160 = vsubps_avx512f(auVar148,(undefined1  [64])::_ps512_1);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar161._0_4_ = (uint)bVar6 * auVar160._0_4_ | (uint)!bVar6 * auVar148._0_4_;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar161._4_4_ = (uint)bVar6 * auVar160._4_4_ | (uint)!bVar6 * auVar148._4_4_;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar161._8_4_ = (uint)bVar6 * auVar160._8_4_ | (uint)!bVar6 * auVar148._8_4_;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar161._12_4_ = (uint)bVar6 * auVar160._12_4_ | (uint)!bVar6 * auVar148._12_4_;
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar161._16_4_ = (uint)bVar6 * auVar160._16_4_ | (uint)!bVar6 * auVar148._16_4_;
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar161._20_4_ = (uint)bVar6 * auVar160._20_4_ | (uint)!bVar6 * auVar148._20_4_;
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar161._24_4_ = (uint)bVar6 * auVar160._24_4_ | (uint)!bVar6 * auVar148._24_4_;
              bVar6 = (bool)((byte)(uVar77 >> 7) & 1);
              auVar161._28_4_ = (uint)bVar6 * auVar160._28_4_ | (uint)!bVar6 * auVar148._28_4_;
              bVar6 = (bool)((byte)(uVar77 >> 8) & 1);
              auVar161._32_4_ = (uint)bVar6 * auVar160._32_4_ | (uint)!bVar6 * auVar148._32_4_;
              bVar6 = (bool)((byte)(uVar77 >> 9) & 1);
              auVar161._36_4_ = (uint)bVar6 * auVar160._36_4_ | (uint)!bVar6 * auVar148._36_4_;
              bVar6 = (bool)((byte)(uVar77 >> 10) & 1);
              auVar161._40_4_ = (uint)bVar6 * auVar160._40_4_ | (uint)!bVar6 * auVar148._40_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xb) & 1);
              auVar161._44_4_ = (uint)bVar6 * auVar160._44_4_ | (uint)!bVar6 * auVar148._44_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xc) & 1);
              auVar161._48_4_ = (uint)bVar6 * auVar160._48_4_ | (uint)!bVar6 * auVar148._48_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xd) & 1);
              auVar161._52_4_ = (uint)bVar6 * auVar160._52_4_ | (uint)!bVar6 * auVar148._52_4_;
              bVar6 = (bool)((byte)(uVar77 >> 0xe) & 1);
              auVar161._56_4_ = (uint)bVar6 * auVar160._56_4_ | (uint)!bVar6 * auVar148._56_4_;
              bVar6 = SUB81(uVar77 >> 0xf,0);
              auVar161._60_4_ = (uint)bVar6 * auVar160._60_4_ | (uint)!bVar6 * auVar148._60_4_;
              auVar189 = vfmadd231ps_avx512f(auVar189,auVar161,auVar149);
              auVar189 = vfmadd231ps_avx512f(auVar189,auVar161,auVar146);
              auVar144 = vfmadd132ps_avx512f(auVar177,auVar144,auVar176);
              auVar148 = vmulps_avx512f(auVar189,auVar189);
              auVar160 = vfmadd213ps_avx512f(auVar189,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar145 = vfmadd213ps_avx512f(auVar183,auVar182,auVar145);
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar189,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar189,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar189,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar188 = vfmadd213ps_avx512f(auVar150,auVar151,auVar188);
              auVar150 = vfmadd213ps_avx512f(auVar160,auVar189,
                                             (undefined1  [64])::_ps512_cephes_exp_p5);
              auVar189 = vfmadd213ps_avx512f(auVar150,auVar148,auVar189);
              auVar156 = vcvttps2dq_avx512f(auVar156);
              auVar140 = vaddps_avx512f(auVar140,(undefined1  [64])::_ps512_1);
              auVar156 = vpaddd_avx512f(auVar156,auVar157);
              auVar156 = vpslld_avx512f(auVar156,0x17);
              auVar147 = vcvttps2dq_avx512f(auVar147);
              auVar141 = vaddps_avx512f(auVar141,(undefined1  [64])::_ps512_1);
              auVar147 = vpaddd_avx512f(auVar147,auVar157);
              auVar147 = vpslld_avx512f(auVar147,0x17);
              auVar148 = vcvttps2dq_avx512f(auVar158);
              auVar142 = vaddps_avx512f(auVar142,(undefined1  [64])::_ps512_1);
              auVar148 = vpaddd_avx512f(auVar148,auVar157);
              auVar148 = vpslld_avx512f(auVar148,0x17);
              auVar143 = vaddps_avx512f(auVar143,(undefined1  [64])::_ps512_1);
              auVar140 = vmulps_avx512f(auVar140,auVar156);
              auVar156 = vcvttps2dq_avx512f(auVar162);
              auVar156 = vpaddd_avx512f(auVar156,auVar157);
              auVar156 = vpslld_avx512f(auVar156,0x17);
              auVar141 = vmulps_avx512f(auVar141,auVar147);
              auVar144 = vaddps_avx512f(auVar144,(undefined1  [64])::_ps512_1);
              auVar147 = vcvttps2dq_avx512f(auVar180);
              auVar147 = vpaddd_avx512f(auVar147,auVar157);
              auVar142 = vmulps_avx512f(auVar142,auVar148);
              auVar147 = vpslld_avx512f(auVar147,0x17);
              auVar145 = vaddps_avx512f(auVar145,(undefined1  [64])::_ps512_1);
              auVar148 = vcvttps2dq_avx512f(auVar181);
              auVar143 = vmulps_avx512f(auVar143,auVar156);
              auVar156 = vpaddd_avx512f(auVar148,auVar157);
              auVar156 = vpslld_avx512f(auVar156,0x17);
              auVar188 = vaddps_avx512f(auVar188,(undefined1  [64])::_ps512_1);
              auVar144 = vmulps_avx512f(auVar144,auVar147);
              auVar147 = vcvttps2dq_avx512f(auVar184);
              auVar147 = vpaddd_avx512f(auVar147,auVar157);
              auVar147 = vpslld_avx512f(auVar147,0x17);
              auVar145 = vmulps_avx512f(auVar145,auVar156);
              auVar189 = vaddps_avx512f(auVar189,(undefined1  [64])::_ps512_1);
              auVar156 = vcvttps2dq_avx512f(auVar161);
              in_ZMM12 = vpaddd_avx512f(auVar156,auVar157);
              auVar188 = vmulps_avx512f(auVar188,auVar147);
              auVar156 = vpslld_avx512f(in_ZMM12,0x17);
              auVar189 = vmulps_avx512f(auVar189,auVar156);
              *pauVar74 = auVar140;
              pauVar74[1] = auVar141;
              pauVar74[2] = auVar142;
              pauVar74[3] = auVar143;
              pauVar74[4] = auVar144;
              pauVar74[5] = auVar145;
              pauVar74[6] = auVar188;
              auVar156 = vunpcklps_avx512f(auVar140,auVar141);
              auVar140 = vunpckhps_avx512f(auVar140,auVar141);
              auVar140 = vaddps_avx512f(auVar156,auVar140);
              auVar141 = vunpcklps_avx512f(auVar142,auVar143);
              auVar142 = vunpckhps_avx512f(auVar142,auVar143);
              auVar143 = vunpcklps_avx512f(auVar144,auVar145);
              auVar141 = vaddps_avx512f(auVar141,auVar142);
              auVar142 = vunpckhps_avx512f(auVar144,auVar145);
              auVar144 = vunpcklps_avx512f(auVar188,auVar189);
              auVar145 = vunpckhps_avx512f(auVar188,auVar189);
              auVar142 = vaddps_avx512f(auVar143,auVar142);
              auVar143 = vaddps_avx512f(auVar144,auVar145);
              auVar144 = vunpcklps_avx512f(auVar140,auVar141);
              auVar140 = vunpckhps_avx512f(auVar140,auVar141);
              auVar140 = vaddps_avx512f(auVar144,auVar140);
              auVar141 = vunpcklps_avx512f(auVar142,auVar143);
              auVar142 = vunpckhps_avx512f(auVar142,auVar143);
              auVar141 = vaddps_avx512f(auVar141,auVar142);
              pauVar74[7] = auVar189;
              auVar142 = vpermt2ps_avx512f(auVar140,_DAT_005f9a00,auVar141);
              auVar140 = vpermt2ps_avx512f(auVar140,_DAT_005f9a40,auVar141);
              auVar140 = vaddps_avx512f(auVar140,auVar142);
              auVar140 = vaddps_avx512f(auVar140,*pauVar78);
              pauVar74 = pauVar74 + 8;
              *pauVar78 = auVar140;
              pfVar80 = pfVar80 + 0x10;
              pauVar78 = pauVar78 + 1;
              iVar79 = iVar79 + 0x10;
              afVar270 = afVar73;
              afVar272 = afVar269;
            } while (iVar79 < size1);
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
            auVar189 = ZEXT3264(auVar102);
            auVar140 = ZEXT3264(CONCAT428(0x3f000000,
                                          CONCAT424(0x3f000000,
                                                    CONCAT420(0x3f000000,
                                                              CONCAT416(0x3f000000,
                                                                        CONCAT412(0x3f000000,
                                                                                  CONCAT48(
                                                  0x3f000000,0x3f0000003f000000)))))));
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar142 = ZEXT3264(auVar102);
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
            auVar143 = ZEXT3264(auVar102);
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar144 = ZEXT3264(auVar102);
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
            auVar141 = ZEXT3264(auVar102);
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar145 = ZEXT3264(auVar102);
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
            auVar188 = ZEXT3264(auVar102);
            auVar102 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar156 = ZEXT3264(auVar102);
            uVar75 = size1 & 0xfffffff0;
          }
          uVar84 = uVar75 | 7;
          auVar106._8_4_ = 0x42b0c0a5;
          auVar106._0_8_ = 0x42b0c0a542b0c0a5;
          auVar106._12_4_ = 0x42b0c0a5;
          auVar106._16_4_ = 0x42b0c0a5;
          auVar106._20_4_ = 0x42b0c0a5;
          auVar106._24_4_ = 0x42b0c0a5;
          auVar106._28_4_ = 0x42b0c0a5;
          auVar112._8_4_ = 0x3fb8aa3b;
          auVar112._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar112._12_4_ = 0x3fb8aa3b;
          auVar112._16_4_ = 0x3fb8aa3b;
          auVar112._20_4_ = 0x3fb8aa3b;
          auVar112._24_4_ = 0x3fb8aa3b;
          auVar112._28_4_ = 0x3fb8aa3b;
          auVar111._8_4_ = 0x3d2aa9c1;
          auVar111._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar111._12_4_ = 0x3d2aa9c1;
          auVar111._16_4_ = 0x3d2aa9c1;
          auVar111._20_4_ = 0x3d2aa9c1;
          auVar111._24_4_ = 0x3d2aa9c1;
          auVar111._28_4_ = 0x3d2aa9c1;
          auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          while( true ) {
            auVar103 = auVar140._0_32_;
            auVar107 = auVar145._0_32_;
            auVar105 = auVar143._0_32_;
            auVar104 = auVar141._0_32_;
            auVar108 = auVar188._0_32_;
            if (size1 <= (int)uVar84) break;
            fVar192 = *pfVar80;
            auVar122._4_4_ = fVar192;
            auVar122._0_4_ = fVar192;
            auVar122._8_4_ = fVar192;
            auVar122._12_4_ = fVar192;
            auVar122._16_4_ = fVar192;
            auVar122._20_4_ = fVar192;
            auVar122._24_4_ = fVar192;
            auVar122._28_4_ = fVar192;
            auVar109 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar74,auVar122);
            auVar109 = vminps_avx(auVar109,auVar106);
            auVar127._8_4_ = 0xc2b0c0a5;
            auVar127._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar127._12_4_ = 0xc2b0c0a5;
            auVar127._16_4_ = 0xc2b0c0a5;
            auVar127._20_4_ = 0xc2b0c0a5;
            auVar127._24_4_ = 0xc2b0c0a5;
            auVar127._28_4_ = 0xc2b0c0a5;
            auVar110 = vmaxps_avx512vl(auVar109,auVar127);
            auVar114 = vfmadd213ps_avx512vl(auVar112,auVar110,auVar103);
            auVar109 = vroundps_avx(auVar114,1);
            uVar77 = vcmpps_avx512vl(auVar114,auVar109,1);
            auVar122 = auVar142._0_32_;
            auVar114 = vsubps_avx512vl(auVar109,auVar122);
            bVar6 = (bool)((byte)uVar77 & 1);
            auVar124._0_4_ = (uint)bVar6 * auVar114._0_4_ | (uint)!bVar6 * auVar109._0_4_;
            bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar124._4_4_ = (uint)bVar6 * auVar114._4_4_ | (uint)!bVar6 * auVar109._4_4_;
            bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar124._8_4_ = (uint)bVar6 * auVar114._8_4_ | (uint)!bVar6 * auVar109._8_4_;
            bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar124._12_4_ = (uint)bVar6 * auVar114._12_4_ | (uint)!bVar6 * auVar109._12_4_;
            bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar124._16_4_ = (uint)bVar6 * auVar114._16_4_ | (uint)!bVar6 * auVar109._16_4_;
            bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar124._20_4_ = (uint)bVar6 * auVar114._20_4_ | (uint)!bVar6 * auVar109._20_4_;
            bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar124._24_4_ = (uint)bVar6 * auVar114._24_4_ | (uint)!bVar6 * auVar109._24_4_;
            bVar6 = SUB81(uVar77 >> 7,0);
            auVar124._28_4_ = (uint)bVar6 * auVar114._28_4_ | (uint)!bVar6 * auVar109._28_4_;
            fVar192 = pfVar80[1];
            auVar128._4_4_ = fVar192;
            auVar128._0_4_ = fVar192;
            auVar128._8_4_ = fVar192;
            auVar128._12_4_ = fVar192;
            auVar128._16_4_ = fVar192;
            auVar128._20_4_ = fVar192;
            auVar128._24_4_ = fVar192;
            auVar128._28_4_ = fVar192;
            auVar109 = vsubps_avx512vl(*(undefined1 (*) [32])(*pauVar74 + 0x20),auVar128);
            auVar110 = vfmsub231ps_avx512vl(auVar110,auVar124,auVar105);
            auVar109 = vminps_avx(auVar109,auVar106);
            auVar129._8_4_ = 0xc2b0c0a5;
            auVar129._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar129._12_4_ = 0xc2b0c0a5;
            auVar129._16_4_ = 0xc2b0c0a5;
            auVar129._20_4_ = 0xc2b0c0a5;
            auVar129._24_4_ = 0xc2b0c0a5;
            auVar129._28_4_ = 0xc2b0c0a5;
            auVar114 = vmaxps_avx512vl(auVar109,auVar129);
            auVar116 = vcvttps2dq_avx512vl(auVar124);
            auVar86 = vfmadd213ps_fma(auVar112,auVar114,auVar103);
            auVar109 = vroundps_avx(ZEXT1632(auVar86),1);
            uVar77 = vcmpps_avx512vl(ZEXT1632(auVar86),auVar109,1);
            auVar271 = auVar144._0_32_;
            auVar110 = vfnmsub231ps_avx512vl(auVar110,auVar124,auVar271);
            auVar118 = vsubps_avx512vl(auVar109,auVar122);
            bVar6 = (bool)((byte)uVar77 & 1);
            auVar125._0_4_ = (float)((uint)bVar6 * auVar118._0_4_ | (uint)!bVar6 * auVar109._0_4_);
            bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * auVar109._4_4_);
            bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * auVar109._8_4_);
            bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar6 * auVar118._12_4_ | (uint)!bVar6 * auVar109._12_4_);
            bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar125._16_4_ =
                 (float)((uint)bVar6 * auVar118._16_4_ | (uint)!bVar6 * auVar109._16_4_);
            bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar125._20_4_ =
                 (float)((uint)bVar6 * auVar118._20_4_ | (uint)!bVar6 * auVar109._20_4_);
            bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar125._24_4_ =
                 (float)((uint)bVar6 * auVar118._24_4_ | (uint)!bVar6 * auVar109._24_4_);
            bVar6 = SUB81(uVar77 >> 7,0);
            auVar125._28_4_ =
                 (float)((uint)bVar6 * auVar118._28_4_ | (uint)!bVar6 * auVar109._28_4_);
            auVar109 = vfmsub231ps_avx512vl(auVar114,auVar125,auVar105);
            auVar114 = vfnmsub231ps_avx512vl(auVar109,auVar125,auVar271);
            auVar118 = vmulps_avx512vl(auVar110,auVar110);
            fVar192 = pfVar80[2];
            auVar131._4_4_ = fVar192;
            auVar131._0_4_ = fVar192;
            auVar131._8_4_ = fVar192;
            auVar131._12_4_ = fVar192;
            auVar131._16_4_ = fVar192;
            auVar131._20_4_ = fVar192;
            auVar131._24_4_ = fVar192;
            auVar131._28_4_ = fVar192;
            auVar109 = vsubps_avx512vl(*(undefined1 (*) [32])pauVar74[1],auVar131);
            auVar120 = vfmadd213ps_avx512vl(auVar107,auVar110,auVar104);
            auVar109 = vminps_avx(auVar109,auVar106);
            auVar133._8_4_ = 0xc2b0c0a5;
            auVar133._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar133._12_4_ = 0xc2b0c0a5;
            auVar133._16_4_ = 0xc2b0c0a5;
            auVar133._20_4_ = 0xc2b0c0a5;
            auVar133._24_4_ = 0xc2b0c0a5;
            auVar133._28_4_ = 0xc2b0c0a5;
            auVar109 = vmaxps_avx512vl(auVar109,auVar133);
            auVar140._0_4_ = auVar114._0_4_ * auVar114._0_4_;
            auVar140._4_4_ = auVar114._4_4_ * auVar114._4_4_;
            auVar140._8_4_ = auVar114._8_4_ * auVar114._8_4_;
            auVar140._12_4_ = auVar114._12_4_ * auVar114._12_4_;
            auVar140._16_4_ = auVar114._16_4_ * auVar114._16_4_;
            auVar140._20_4_ = auVar114._20_4_ * auVar114._20_4_;
            auVar140._28_36_ = in_ZMM12._28_36_;
            auVar140._24_4_ = auVar114._24_4_ * auVar114._24_4_;
            auVar86 = vfmadd213ps_fma(auVar112,auVar109,auVar103);
            auVar103 = vroundps_avx(ZEXT1632(auVar86),1);
            uVar77 = vcmpps_avx512vl(ZEXT1632(auVar86),auVar103,1);
            auVar121 = vfmadd213ps_avx512vl(auVar107,auVar114,auVar104);
            auVar122 = vsubps_avx512vl(auVar103,auVar122);
            bVar6 = (bool)((byte)uVar77 & 1);
            auVar126._0_4_ = (float)((uint)bVar6 * auVar122._0_4_ | (uint)!bVar6 * auVar103._0_4_);
            bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar126._4_4_ = (float)((uint)bVar6 * auVar122._4_4_ | (uint)!bVar6 * auVar103._4_4_);
            bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar126._8_4_ = (float)((uint)bVar6 * auVar122._8_4_ | (uint)!bVar6 * auVar103._8_4_);
            bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar126._12_4_ =
                 (float)((uint)bVar6 * auVar122._12_4_ | (uint)!bVar6 * auVar103._12_4_);
            bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar126._16_4_ =
                 (float)((uint)bVar6 * auVar122._16_4_ | (uint)!bVar6 * auVar103._16_4_);
            bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar126._20_4_ =
                 (float)((uint)bVar6 * auVar122._20_4_ | (uint)!bVar6 * auVar103._20_4_);
            bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar126._24_4_ =
                 (float)((uint)bVar6 * auVar122._24_4_ | (uint)!bVar6 * auVar103._24_4_);
            bVar6 = SUB81(uVar77 >> 7,0);
            auVar126._28_4_ =
                 (float)((uint)bVar6 * auVar122._28_4_ | (uint)!bVar6 * auVar103._28_4_);
            auVar103 = vfmsub231ps_avx512vl(auVar109,auVar126,auVar105);
            auVar109 = vfnmsub231ps_avx512vl(auVar103,auVar126,auVar271);
            auVar122 = vmulps_avx512vl(auVar109,auVar109);
            fVar192 = pfVar80[3];
            auVar135._4_4_ = fVar192;
            auVar135._0_4_ = fVar192;
            auVar135._8_4_ = fVar192;
            auVar135._12_4_ = fVar192;
            auVar135._16_4_ = fVar192;
            auVar135._20_4_ = fVar192;
            auVar135._24_4_ = fVar192;
            auVar135._28_4_ = fVar192;
            auVar103 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar74[1] + 0x20),auVar135);
            auVar127 = vfmadd213ps_avx512vl(auVar107,auVar109,auVar104);
            auVar103 = vminps_avx(auVar103,auVar106);
            auVar136._8_4_ = 0xc2b0c0a5;
            auVar136._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar136._12_4_ = 0xc2b0c0a5;
            auVar136._16_4_ = 0xc2b0c0a5;
            auVar136._20_4_ = 0xc2b0c0a5;
            auVar136._24_4_ = 0xc2b0c0a5;
            auVar136._28_4_ = 0xc2b0c0a5;
            auVar128 = vmaxps_avx512vl(auVar103,auVar136);
            auVar120 = vfmadd213ps_avx512vl(auVar120,auVar110,auVar108);
            auVar137._8_4_ = 0x3f000000;
            auVar137._0_8_ = 0x3f0000003f000000;
            auVar137._12_4_ = 0x3f000000;
            auVar137._16_4_ = 0x3f000000;
            auVar137._20_4_ = 0x3f000000;
            auVar137._24_4_ = 0x3f000000;
            auVar137._28_4_ = 0x3f000000;
            auVar129 = vfmadd213ps_avx512vl(auVar112,auVar128,auVar137);
            auVar103 = vroundps_avx(auVar129,1);
            uVar77 = vcmpps_avx512vl(auVar129,auVar103,1);
            auVar121 = vfmadd213ps_avx512vl(auVar121,auVar114,auVar108);
            auVar28._8_4_ = 0x3f800000;
            auVar28._0_8_ = 0x3f8000003f800000;
            auVar28._12_4_ = 0x3f800000;
            auVar28._16_4_ = 0x3f800000;
            auVar28._20_4_ = 0x3f800000;
            auVar28._24_4_ = 0x3f800000;
            auVar28._28_4_ = 0x3f800000;
            auVar129 = vsubps_avx512vl(auVar103,auVar28);
            bVar6 = (bool)((byte)uVar77 & 1);
            auVar130._0_4_ = (float)((uint)bVar6 * auVar129._0_4_ | (uint)!bVar6 * auVar103._0_4_);
            bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar6 * auVar129._4_4_ | (uint)!bVar6 * auVar103._4_4_);
            bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar6 * auVar129._8_4_ | (uint)!bVar6 * auVar103._8_4_);
            bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar6 * auVar129._12_4_ | (uint)!bVar6 * auVar103._12_4_);
            bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar6 * auVar129._16_4_ | (uint)!bVar6 * auVar103._16_4_);
            bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar6 * auVar129._20_4_ | (uint)!bVar6 * auVar103._20_4_);
            bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar6 * auVar129._24_4_ | (uint)!bVar6 * auVar103._24_4_);
            bVar6 = SUB81(uVar77 >> 7,0);
            auVar130._28_4_ =
                 (float)((uint)bVar6 * auVar129._28_4_ | (uint)!bVar6 * auVar103._28_4_);
            auVar103 = vfmsub231ps_avx512vl(auVar128,auVar130,auVar105);
            auVar105 = vfnmsub231ps_avx512vl(auVar103,auVar130,auVar271);
            auVar127 = vfmadd213ps_avx512vl(auVar127,auVar109,auVar108);
            auVar128 = vmulps_avx512vl(auVar105,auVar105);
            auVar103 = vfmadd213ps_avx512vl(auVar107,auVar105,auVar104);
            auVar107 = vfmadd213ps_avx512vl(auVar103,auVar105,auVar108);
            fVar192 = pfVar80[4];
            auVar271._4_4_ = fVar192;
            auVar271._0_4_ = fVar192;
            auVar271._8_4_ = fVar192;
            auVar271._12_4_ = fVar192;
            auVar271._16_4_ = fVar192;
            auVar271._20_4_ = fVar192;
            auVar271._24_4_ = fVar192;
            auVar271._28_4_ = fVar192;
            auVar103 = vsubps_avx512vl(*(undefined1 (*) [32])pauVar74[2],auVar271);
            auVar103 = vminps_avx(auVar103,auVar106);
            auVar120 = vfmadd213ps_avx512vl(auVar120,auVar110,auVar111);
            auVar29._8_4_ = 0xc2b0c0a5;
            auVar29._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar29._12_4_ = 0xc2b0c0a5;
            auVar29._16_4_ = 0xc2b0c0a5;
            auVar29._20_4_ = 0xc2b0c0a5;
            auVar29._24_4_ = 0xc2b0c0a5;
            auVar29._28_4_ = 0xc2b0c0a5;
            auVar103 = vmaxps_avx512vl(auVar103,auVar29);
            auVar30._8_4_ = 0x3f000000;
            auVar30._0_8_ = 0x3f0000003f000000;
            auVar30._12_4_ = 0x3f000000;
            auVar30._16_4_ = 0x3f000000;
            auVar30._20_4_ = 0x3f000000;
            auVar30._24_4_ = 0x3f000000;
            auVar30._28_4_ = 0x3f000000;
            auVar129 = vfmadd213ps_avx512vl(auVar112,auVar103,auVar30);
            auVar121 = vfmadd213ps_avx512vl(auVar121,auVar114,auVar111);
            auVar131 = vrndscaleps_avx512vl(auVar129,1);
            uVar77 = vcmpps_avx512vl(auVar129,auVar131,1);
            auVar31._8_4_ = 0x3f800000;
            auVar31._0_8_ = 0x3f8000003f800000;
            auVar31._12_4_ = 0x3f800000;
            auVar31._16_4_ = 0x3f800000;
            auVar31._20_4_ = 0x3f800000;
            auVar31._24_4_ = 0x3f800000;
            auVar31._28_4_ = 0x3f800000;
            auVar129 = vsubps_avx512vl(auVar131,auVar31);
            bVar6 = (bool)((byte)uVar77 & 1);
            auVar132._0_4_ = (uint)bVar6 * auVar129._0_4_ | (uint)!bVar6 * auVar131._0_4_;
            bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar6 * auVar129._4_4_ | (uint)!bVar6 * auVar131._4_4_;
            bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar6 * auVar129._8_4_ | (uint)!bVar6 * auVar131._8_4_;
            bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar6 * auVar129._12_4_ | (uint)!bVar6 * auVar131._12_4_;
            bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar132._16_4_ = (uint)bVar6 * auVar129._16_4_ | (uint)!bVar6 * auVar131._16_4_;
            bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar132._20_4_ = (uint)bVar6 * auVar129._20_4_ | (uint)!bVar6 * auVar131._20_4_;
            bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar132._24_4_ = (uint)bVar6 * auVar129._24_4_ | (uint)!bVar6 * auVar131._24_4_;
            bVar6 = SUB81(uVar77 >> 7,0);
            auVar132._28_4_ = (uint)bVar6 * auVar129._28_4_ | (uint)!bVar6 * auVar131._28_4_;
            auVar127 = vfmadd213ps_avx512vl(auVar127,auVar109,auVar111);
            auVar32._8_4_ = 0x3f318000;
            auVar32._0_8_ = 0x3f3180003f318000;
            auVar32._12_4_ = 0x3f318000;
            auVar32._16_4_ = 0x3f318000;
            auVar32._20_4_ = 0x3f318000;
            auVar32._24_4_ = 0x3f318000;
            auVar32._28_4_ = 0x3f318000;
            auVar103 = vfmsub231ps_avx512vl(auVar103,auVar132,auVar32);
            auVar33._8_4_ = 0xb95e8083;
            auVar33._0_8_ = 0xb95e8083b95e8083;
            auVar33._12_4_ = 0xb95e8083;
            auVar33._16_4_ = 0xb95e8083;
            auVar33._20_4_ = 0xb95e8083;
            auVar33._24_4_ = 0xb95e8083;
            auVar33._28_4_ = 0xb95e8083;
            auVar129 = vfnmsub231ps_avx512vl(auVar103,auVar132,auVar33);
            auVar131 = vmulps_avx512vl(auVar129,auVar129);
            auVar86 = vfmadd213ps_fma(auVar107,auVar105,auVar111);
            auVar241._8_4_ = 0x39506967;
            auVar241._0_8_ = 0x3950696739506967;
            auVar241._12_4_ = 0x39506967;
            auVar241._16_4_ = 0x39506967;
            auVar241._20_4_ = 0x39506967;
            auVar241._24_4_ = 0x39506967;
            auVar241._28_4_ = 0x39506967;
            auVar103 = vfmadd213ps_avx512vl(auVar241,auVar129,auVar104);
            auVar103 = vfmadd213ps_avx512vl(auVar103,auVar129,auVar108);
            auVar104 = vfmadd213ps_avx512vl(auVar120,auVar110,auVar102);
            auVar107 = vfmadd213ps_avx512vl(auVar103,auVar129,auVar111);
            fVar192 = pfVar80[5];
            auVar34._4_4_ = fVar192;
            auVar34._0_4_ = fVar192;
            auVar34._8_4_ = fVar192;
            auVar34._12_4_ = fVar192;
            auVar34._16_4_ = fVar192;
            auVar34._20_4_ = fVar192;
            auVar34._24_4_ = fVar192;
            auVar34._28_4_ = fVar192;
            auVar103 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar74[2] + 0x20),auVar34);
            auVar108 = vfmadd213ps_avx512vl(auVar121,auVar114,auVar102);
            auVar103 = vminps_avx(auVar103,auVar106);
            auVar35._8_4_ = 0xc2b0c0a5;
            auVar35._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar35._12_4_ = 0xc2b0c0a5;
            auVar35._16_4_ = 0xc2b0c0a5;
            auVar35._20_4_ = 0xc2b0c0a5;
            auVar35._24_4_ = 0xc2b0c0a5;
            auVar35._28_4_ = 0xc2b0c0a5;
            auVar103 = vmaxps_avx512vl(auVar103,auVar35);
            auVar120 = vfmadd213ps_avx512vl(auVar127,auVar109,auVar102);
            auVar36._8_4_ = 0x3f000000;
            auVar36._0_8_ = 0x3f0000003f000000;
            auVar36._12_4_ = 0x3f000000;
            auVar36._16_4_ = 0x3f000000;
            auVar36._20_4_ = 0x3f000000;
            auVar36._24_4_ = 0x3f000000;
            auVar36._28_4_ = 0x3f000000;
            auVar121 = vfmadd213ps_avx512vl(auVar112,auVar103,auVar36);
            auVar127 = vrndscaleps_avx512vl(auVar121,1);
            uVar77 = vcmpps_avx512vl(auVar121,auVar127,1);
            auVar121 = vfmadd213ps_avx512vl(ZEXT1632(auVar86),auVar105,auVar102);
            auVar37._8_4_ = 0x3f800000;
            auVar37._0_8_ = 0x3f8000003f800000;
            auVar37._12_4_ = 0x3f800000;
            auVar37._16_4_ = 0x3f800000;
            auVar37._20_4_ = 0x3f800000;
            auVar37._24_4_ = 0x3f800000;
            auVar37._28_4_ = 0x3f800000;
            auVar133 = vsubps_avx512vl(auVar127,auVar37);
            bVar6 = (bool)((byte)uVar77 & 1);
            auVar134._0_4_ = (uint)bVar6 * auVar133._0_4_ | (uint)!bVar6 * auVar127._0_4_;
            bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar6 * auVar133._4_4_ | (uint)!bVar6 * auVar127._4_4_;
            bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar6 * auVar133._8_4_ | (uint)!bVar6 * auVar127._8_4_;
            bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar6 * auVar133._12_4_ | (uint)!bVar6 * auVar127._12_4_;
            bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar134._16_4_ = (uint)bVar6 * auVar133._16_4_ | (uint)!bVar6 * auVar127._16_4_;
            bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar134._20_4_ = (uint)bVar6 * auVar133._20_4_ | (uint)!bVar6 * auVar127._20_4_;
            bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar134._24_4_ = (uint)bVar6 * auVar133._24_4_ | (uint)!bVar6 * auVar127._24_4_;
            bVar6 = SUB81(uVar77 >> 7,0);
            auVar134._28_4_ = (uint)bVar6 * auVar133._28_4_ | (uint)!bVar6 * auVar127._28_4_;
            auVar38._8_4_ = 0x3f318000;
            auVar38._0_8_ = 0x3f3180003f318000;
            auVar38._12_4_ = 0x3f318000;
            auVar38._16_4_ = 0x3f318000;
            auVar38._20_4_ = 0x3f318000;
            auVar38._24_4_ = 0x3f318000;
            auVar38._28_4_ = 0x3f318000;
            auVar103 = vfmsub231ps_avx512vl(auVar103,auVar134,auVar38);
            auVar39._8_4_ = 0xb95e8083;
            auVar39._0_8_ = 0xb95e8083b95e8083;
            auVar39._12_4_ = 0xb95e8083;
            auVar39._16_4_ = 0xb95e8083;
            auVar39._20_4_ = 0xb95e8083;
            auVar39._24_4_ = 0xb95e8083;
            auVar39._28_4_ = 0xb95e8083;
            auVar127 = vfnmsub231ps_avx512vl(auVar103,auVar134,auVar39);
            auVar107 = vfmadd213ps_avx512vl(auVar107,auVar129,auVar102);
            auVar133 = vmulps_avx512vl(auVar127,auVar127);
            auVar103 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar40._8_4_ = 0x3ab743ce;
            auVar40._0_8_ = 0x3ab743ce3ab743ce;
            auVar40._12_4_ = 0x3ab743ce;
            auVar40._16_4_ = 0x3ab743ce;
            auVar40._20_4_ = 0x3ab743ce;
            auVar40._24_4_ = 0x3ab743ce;
            auVar40._28_4_ = 0x3ab743ce;
            auVar103 = vfmadd213ps_avx512vl(auVar103,auVar127,auVar40);
            auVar41._8_4_ = 0x3f000000;
            auVar41._0_8_ = 0x3f0000003f000000;
            auVar41._12_4_ = 0x3f000000;
            auVar41._16_4_ = 0x3f000000;
            auVar41._20_4_ = 0x3f000000;
            auVar41._24_4_ = 0x3f000000;
            auVar41._28_4_ = 0x3f000000;
            auVar104 = vfmadd213ps_avx512vl(auVar104,auVar110,auVar41);
            auVar42._8_4_ = 0x3c088908;
            auVar42._0_8_ = 0x3c0889083c088908;
            auVar42._12_4_ = 0x3c088908;
            auVar42._16_4_ = 0x3c088908;
            auVar42._20_4_ = 0x3c088908;
            auVar42._24_4_ = 0x3c088908;
            auVar42._28_4_ = 0x3c088908;
            auVar103 = vfmadd213ps_avx512vl(auVar103,auVar127,auVar42);
            auVar103 = vfmadd213ps_avx512vl(auVar103,auVar127,auVar111);
            auVar135 = vfmadd213ps_avx512vl(auVar103,auVar127,auVar102);
            auVar43._8_4_ = 0x3f000000;
            auVar43._0_8_ = 0x3f0000003f000000;
            auVar43._12_4_ = 0x3f000000;
            auVar43._16_4_ = 0x3f000000;
            auVar43._20_4_ = 0x3f000000;
            auVar43._24_4_ = 0x3f000000;
            auVar43._28_4_ = 0x3f000000;
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar114,auVar43);
            fVar192 = pfVar80[6];
            auVar44._4_4_ = fVar192;
            auVar44._0_4_ = fVar192;
            auVar44._8_4_ = fVar192;
            auVar44._12_4_ = fVar192;
            auVar44._16_4_ = fVar192;
            auVar44._20_4_ = fVar192;
            auVar44._24_4_ = fVar192;
            auVar44._28_4_ = fVar192;
            auVar103 = vsubps_avx512vl(*(undefined1 (*) [32])pauVar74[3],auVar44);
            auVar103 = vminps_avx(auVar103,auVar106);
            auVar45._8_4_ = 0x3f000000;
            auVar45._0_8_ = 0x3f0000003f000000;
            auVar45._12_4_ = 0x3f000000;
            auVar45._16_4_ = 0x3f000000;
            auVar45._20_4_ = 0x3f000000;
            auVar45._24_4_ = 0x3f000000;
            auVar45._28_4_ = 0x3f000000;
            auVar120 = vfmadd213ps_avx512vl(auVar120,auVar109,auVar45);
            auVar46._8_4_ = 0xc2b0c0a5;
            auVar46._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar46._12_4_ = 0xc2b0c0a5;
            auVar46._16_4_ = 0xc2b0c0a5;
            auVar46._20_4_ = 0xc2b0c0a5;
            auVar46._24_4_ = 0xc2b0c0a5;
            auVar46._28_4_ = 0xc2b0c0a5;
            auVar103 = vmaxps_avx512vl(auVar103,auVar46);
            auVar47._8_4_ = 0x3f000000;
            auVar47._0_8_ = 0x3f0000003f000000;
            auVar47._12_4_ = 0x3f000000;
            auVar47._16_4_ = 0x3f000000;
            auVar47._20_4_ = 0x3f000000;
            auVar47._24_4_ = 0x3f000000;
            auVar47._28_4_ = 0x3f000000;
            auVar136 = vfmadd213ps_avx512vl(auVar112,auVar103,auVar47);
            auVar48._8_4_ = 0x3f000000;
            auVar48._0_8_ = 0x3f0000003f000000;
            auVar48._12_4_ = 0x3f000000;
            auVar48._16_4_ = 0x3f000000;
            auVar48._20_4_ = 0x3f000000;
            auVar48._24_4_ = 0x3f000000;
            auVar48._28_4_ = 0x3f000000;
            auVar121 = vfmadd213ps_avx512vl(auVar121,auVar105,auVar48);
            auVar137 = vrndscaleps_avx512vl(auVar136,1);
            uVar77 = vcmpps_avx512vl(auVar136,auVar137,1);
            auVar49._8_4_ = 0x3f800000;
            auVar49._0_8_ = 0x3f8000003f800000;
            auVar49._12_4_ = 0x3f800000;
            auVar49._16_4_ = 0x3f800000;
            auVar49._20_4_ = 0x3f800000;
            auVar49._24_4_ = 0x3f800000;
            auVar49._28_4_ = 0x3f800000;
            auVar136 = vsubps_avx512vl(auVar137,auVar49);
            bVar6 = (bool)((byte)uVar77 & 1);
            auVar138._0_4_ = (float)((uint)bVar6 * auVar136._0_4_ | (uint)!bVar6 * auVar137._0_4_);
            bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar138._4_4_ = (float)((uint)bVar6 * auVar136._4_4_ | (uint)!bVar6 * auVar137._4_4_);
            bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar138._8_4_ = (float)((uint)bVar6 * auVar136._8_4_ | (uint)!bVar6 * auVar137._8_4_);
            bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar138._12_4_ =
                 (float)((uint)bVar6 * auVar136._12_4_ | (uint)!bVar6 * auVar137._12_4_);
            bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar138._16_4_ =
                 (float)((uint)bVar6 * auVar136._16_4_ | (uint)!bVar6 * auVar137._16_4_);
            bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar138._20_4_ =
                 (float)((uint)bVar6 * auVar136._20_4_ | (uint)!bVar6 * auVar137._20_4_);
            bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar138._24_4_ =
                 (float)((uint)bVar6 * auVar136._24_4_ | (uint)!bVar6 * auVar137._24_4_);
            bVar6 = SUB81(uVar77 >> 7,0);
            auVar138._28_4_ =
                 (float)((uint)bVar6 * auVar136._28_4_ | (uint)!bVar6 * auVar137._28_4_);
            auVar50._8_4_ = 0x3f000000;
            auVar50._0_8_ = 0x3f0000003f000000;
            auVar50._12_4_ = 0x3f000000;
            auVar50._16_4_ = 0x3f000000;
            auVar50._20_4_ = 0x3f000000;
            auVar50._24_4_ = 0x3f000000;
            auVar50._28_4_ = 0x3f000000;
            auVar107 = vfmadd213ps_avx512vl(auVar107,auVar129,auVar50);
            auVar51._8_4_ = 0x3f318000;
            auVar51._0_8_ = 0x3f3180003f318000;
            auVar51._12_4_ = 0x3f318000;
            auVar51._16_4_ = 0x3f318000;
            auVar51._20_4_ = 0x3f318000;
            auVar51._24_4_ = 0x3f318000;
            auVar51._28_4_ = 0x3f318000;
            auVar103 = vfmsub231ps_avx512vl(auVar103,auVar138,auVar51);
            auVar52._8_4_ = 0xb95e8083;
            auVar52._0_8_ = 0xb95e8083b95e8083;
            auVar52._12_4_ = 0xb95e8083;
            auVar52._16_4_ = 0xb95e8083;
            auVar52._20_4_ = 0xb95e8083;
            auVar52._24_4_ = 0xb95e8083;
            auVar52._28_4_ = 0xb95e8083;
            auVar136 = vfnmsub231ps_avx512vl(auVar103,auVar138,auVar52);
            auVar137 = vmulps_avx512vl(auVar136,auVar136);
            auVar53._8_4_ = 0x3f000000;
            auVar53._0_8_ = 0x3f0000003f000000;
            auVar53._12_4_ = 0x3f000000;
            auVar53._16_4_ = 0x3f000000;
            auVar53._20_4_ = 0x3f000000;
            auVar53._24_4_ = 0x3f000000;
            auVar53._28_4_ = 0x3f000000;
            auVar135 = vfmadd213ps_avx512vl(auVar135,auVar127,auVar53);
            fVar192 = pfVar80[7];
            auVar54._4_4_ = fVar192;
            auVar54._0_4_ = fVar192;
            auVar54._8_4_ = fVar192;
            auVar54._12_4_ = fVar192;
            auVar54._16_4_ = fVar192;
            auVar54._20_4_ = fVar192;
            auVar54._24_4_ = fVar192;
            auVar54._28_4_ = fVar192;
            auVar103 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar74[3] + 0x20),auVar54);
            auVar103 = vminps_avx(auVar103,auVar106);
            auVar104 = vfmadd213ps_avx512vl(auVar104,auVar118,auVar110);
            auVar110 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
            auVar189 = ZEXT3264(auVar110);
            auVar110 = vmaxps_avx512vl(auVar103,auVar110);
            auVar55._8_4_ = 0x3f000000;
            auVar55._0_8_ = 0x3f0000003f000000;
            auVar55._12_4_ = 0x3f000000;
            auVar55._16_4_ = 0x3f000000;
            auVar55._20_4_ = 0x3f000000;
            auVar55._24_4_ = 0x3f000000;
            auVar55._28_4_ = 0x3f000000;
            auVar118 = vfmadd213ps_avx512vl(auVar112,auVar110,auVar55);
            auVar108 = vfmadd213ps_avx512vl(auVar108,auVar140._0_32_,auVar114);
            auVar103 = vroundps_avx(auVar118,1);
            uVar77 = vcmpps_avx512vl(auVar118,auVar103,1);
            auVar258._8_4_ = 0x39506967;
            auVar258._0_8_ = 0x3950696739506967;
            auVar258._12_4_ = 0x39506967;
            auVar258._16_4_ = 0x39506967;
            auVar258._20_4_ = 0x39506967;
            auVar258._24_4_ = 0x39506967;
            auVar258._28_4_ = 0x39506967;
            auVar114 = vfmadd213ps_avx512vl(auVar120,auVar122,auVar109);
            auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar142 = ZEXT3264(auVar118);
            auVar56._8_4_ = 0x3ab743ce;
            auVar56._0_8_ = 0x3ab743ce3ab743ce;
            auVar56._12_4_ = 0x3ab743ce;
            auVar56._16_4_ = 0x3ab743ce;
            auVar56._20_4_ = 0x3ab743ce;
            auVar56._24_4_ = 0x3ab743ce;
            auVar56._28_4_ = 0x3ab743ce;
            auVar120 = vfmadd213ps_avx512vl(auVar258,auVar136,auVar56);
            auVar57._8_4_ = 0x3c088908;
            auVar57._0_8_ = 0x3c0889083c088908;
            auVar57._12_4_ = 0x3c088908;
            auVar57._16_4_ = 0x3c088908;
            auVar57._20_4_ = 0x3c088908;
            auVar57._24_4_ = 0x3c088908;
            auVar57._28_4_ = 0x3c088908;
            auVar120 = vfmadd213ps_avx512vl(auVar120,auVar136,auVar57);
            auVar86 = vfmadd213ps_fma(auVar120,auVar136,auVar111);
            auVar105 = vfmadd213ps_avx512vl(auVar121,auVar128,auVar105);
            auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
            auVar143 = ZEXT3264(auVar120);
            auVar267._8_4_ = 0x3f000000;
            auVar267._0_8_ = 0x3f0000003f000000;
            auVar267._12_4_ = 0x3f000000;
            auVar267._16_4_ = 0x3f000000;
            auVar267._20_4_ = 0x3f000000;
            auVar267._24_4_ = 0x3f000000;
            auVar267._28_4_ = 0x3f000000;
            auVar140 = ZEXT3264(auVar267);
            auVar121 = vfmadd213ps_avx512vl(ZEXT1632(auVar86),auVar136,auVar102);
            auVar86 = vfmadd213ps_fma(auVar121,auVar136,auVar267);
            auVar118 = vsubps_avx512vl(auVar103,auVar118);
            bVar6 = (bool)((byte)uVar77 & 1);
            auVar139._0_4_ = (float)((uint)bVar6 * auVar118._0_4_ | (uint)!bVar6 * auVar103._0_4_);
            bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * auVar103._4_4_);
            bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * auVar103._8_4_);
            bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar6 * auVar118._12_4_ | (uint)!bVar6 * auVar103._12_4_);
            bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar139._16_4_ =
                 (float)((uint)bVar6 * auVar118._16_4_ | (uint)!bVar6 * auVar103._16_4_);
            bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar139._20_4_ =
                 (float)((uint)bVar6 * auVar118._20_4_ | (uint)!bVar6 * auVar103._20_4_);
            bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar139._24_4_ =
                 (float)((uint)bVar6 * auVar118._24_4_ | (uint)!bVar6 * auVar103._24_4_);
            bVar6 = SUB81(uVar77 >> 7,0);
            auVar139._28_4_ =
                 (float)((uint)bVar6 * auVar118._28_4_ | (uint)!bVar6 * auVar103._28_4_);
            auVar103 = vfmadd213ps_avx512vl(auVar107,auVar131,auVar129);
            auVar107 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar145 = ZEXT3264(auVar107);
            auVar118 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar144 = ZEXT3264(auVar118);
            auVar110 = vfmsub231ps_avx512vl(auVar110,auVar139,auVar120);
            auVar110 = vfnmsub231ps_avx512vl(auVar110,auVar139,auVar118);
            auVar61._4_4_ = auVar110._4_4_ * auVar110._4_4_;
            auVar61._0_4_ = auVar110._0_4_ * auVar110._0_4_;
            auVar61._8_4_ = auVar110._8_4_ * auVar110._8_4_;
            auVar61._12_4_ = auVar110._12_4_ * auVar110._12_4_;
            auVar61._16_4_ = auVar110._16_4_ * auVar110._16_4_;
            auVar61._20_4_ = auVar110._20_4_ * auVar110._20_4_;
            auVar61._24_4_ = auVar110._24_4_ * auVar110._24_4_;
            auVar61._28_4_ = auVar109._28_4_;
            auVar109 = vfmadd213ps_avx512vl(auVar135,auVar133,auVar127);
            auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
            auVar188 = ZEXT3264(auVar118);
            auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
            auVar141 = ZEXT3264(auVar120);
            auVar107 = vfmadd213ps_avx512vl(auVar107,auVar110,auVar120);
            auVar107 = vfmadd213ps_avx512vl(auVar107,auVar110,auVar118);
            auVar118 = vfmadd213ps_avx512vl(ZEXT1632(auVar86),auVar137,auVar136);
            in_ZMM12 = ZEXT3264(auVar118);
            auVar86 = vfmadd213ps_fma(auVar107,auVar110,auVar111);
            auVar107 = vfmadd213ps_avx512vl(ZEXT1632(auVar86),auVar110,auVar102);
            auVar86 = vfmadd213ps_fma(auVar107,auVar110,auVar267);
            auVar86 = vfmadd213ps_fma(ZEXT1632(auVar86),auVar61,auVar110);
            auVar107 = vpslld_avx512vl(auVar116,0x17);
            auVar110 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar156 = ZEXT3264(auVar110);
            auVar107 = vpaddd_avx512vl(auVar107,auVar110);
            auVar245._0_4_ = (int)auVar125._0_4_;
            auVar245._4_4_ = (int)auVar125._4_4_;
            auVar245._8_4_ = (int)auVar125._8_4_;
            auVar245._12_4_ = (int)auVar125._12_4_;
            auVar245._16_4_ = (int)auVar125._16_4_;
            auVar245._20_4_ = (int)auVar125._20_4_;
            auVar245._24_4_ = (int)auVar125._24_4_;
            auVar245._28_4_ = (int)auVar125._28_4_;
            auVar104 = vfmadd213ps_avx512vl(auVar107,auVar104,auVar107);
            auVar107 = vpslld_avx2(auVar245,0x17);
            auVar107 = vpaddd_avx512vl(auVar107,auVar110);
            auVar217._0_4_ = (int)auVar126._0_4_;
            auVar217._4_4_ = (int)auVar126._4_4_;
            auVar217._8_4_ = (int)auVar126._8_4_;
            auVar217._12_4_ = (int)auVar126._12_4_;
            auVar217._16_4_ = (int)auVar126._16_4_;
            auVar217._20_4_ = (int)auVar126._20_4_;
            auVar217._24_4_ = (int)auVar126._24_4_;
            auVar217._28_4_ = (int)auVar126._28_4_;
            auVar108 = vfmadd213ps_avx512vl(auVar107,auVar108,auVar107);
            auVar107 = vpslld_avx2(auVar217,0x17);
            auVar107 = vpaddd_avx512vl(auVar107,auVar110);
            auVar249._0_4_ = (int)auVar130._0_4_;
            auVar249._4_4_ = (int)auVar130._4_4_;
            auVar249._8_4_ = (int)auVar130._8_4_;
            auVar249._12_4_ = (int)auVar130._12_4_;
            auVar249._16_4_ = (int)auVar130._16_4_;
            auVar249._20_4_ = (int)auVar130._20_4_;
            auVar249._24_4_ = (int)auVar130._24_4_;
            auVar249._28_4_ = (int)auVar130._28_4_;
            auVar114 = vfmadd213ps_avx512vl(auVar107,auVar114,auVar107);
            auVar107 = vpslld_avx2(auVar249,0x17);
            auVar107 = vpaddd_avx512vl(auVar107,auVar110);
            auVar116 = vcvttps2dq_avx512vl(auVar132);
            auVar87 = vfmadd213ps_fma(auVar107,auVar105,auVar107);
            auVar105 = vpslld_avx2(auVar116,0x17);
            auVar105 = vpaddd_avx512vl(auVar105,auVar110);
            auVar107 = vcvttps2dq_avx512vl(auVar134);
            auVar88 = vfmadd213ps_fma(auVar105,auVar103,auVar105);
            auVar103 = vpslld_avx2(auVar107,0x17);
            auVar103 = vpaddd_avx512vl(auVar103,auVar110);
            auVar233._0_4_ = (int)auVar138._0_4_;
            auVar233._4_4_ = (int)auVar138._4_4_;
            auVar233._8_4_ = (int)auVar138._8_4_;
            auVar233._12_4_ = (int)auVar138._12_4_;
            auVar233._16_4_ = (int)auVar138._16_4_;
            auVar233._20_4_ = (int)auVar138._20_4_;
            auVar233._24_4_ = (int)auVar138._24_4_;
            auVar233._28_4_ = (int)auVar138._28_4_;
            auVar109 = vfmadd213ps_avx512vl(auVar103,auVar109,auVar103);
            auVar103 = vpslld_avx2(auVar233,0x17);
            auVar103 = vpaddd_avx512vl(auVar103,auVar110);
            auVar210._0_4_ = (int)auVar139._0_4_;
            auVar210._4_4_ = (int)auVar139._4_4_;
            auVar210._8_4_ = (int)auVar139._8_4_;
            auVar210._12_4_ = (int)auVar139._12_4_;
            auVar210._16_4_ = (int)auVar139._16_4_;
            auVar210._20_4_ = (int)auVar139._20_4_;
            auVar210._24_4_ = (int)auVar139._24_4_;
            auVar210._28_4_ = (int)auVar139._28_4_;
            auVar89 = vfmadd213ps_fma(auVar103,auVar118,auVar103);
            auVar103 = vpslld_avx2(auVar210,0x17);
            auVar103 = vpaddd_avx512vl(auVar103,auVar110);
            auVar86 = vfmadd213ps_fma(auVar103,ZEXT1632(auVar86),auVar103);
            *(undefined1 (*) [32])*pauVar74 = auVar104;
            *(undefined1 (*) [32])(*pauVar74 + 0x20) = auVar108;
            *(undefined1 (*) [32])pauVar74[1] = auVar114;
            *(undefined1 (*) [32])(pauVar74[1] + 0x20) = ZEXT1632(auVar87);
            *(undefined1 (*) [32])pauVar74[2] = ZEXT1632(auVar88);
            *(undefined1 (*) [32])(pauVar74[2] + 0x20) = auVar109;
            *(undefined1 (*) [32])pauVar74[3] = ZEXT1632(auVar89);
            *(undefined1 (*) [32])(pauVar74[3] + 0x20) = ZEXT1632(auVar86);
            auVar105 = vunpcklps_avx(auVar104,ZEXT1632(auVar88));
            auVar103 = vunpckhps_avx(auVar104,ZEXT1632(auVar88));
            auVar107 = vunpcklps_avx(auVar114,ZEXT1632(auVar89));
            auVar104 = vunpckhps_avx(auVar114,ZEXT1632(auVar89));
            auVar201._0_4_ = auVar105._0_4_ + auVar103._0_4_;
            auVar201._4_4_ = auVar105._4_4_ + auVar103._4_4_;
            auVar201._8_4_ = auVar105._8_4_ + auVar103._8_4_;
            auVar201._12_4_ = auVar105._12_4_ + auVar103._12_4_;
            auVar201._16_4_ = auVar105._16_4_ + auVar103._16_4_;
            auVar201._20_4_ = auVar105._20_4_ + auVar103._20_4_;
            auVar201._24_4_ = auVar105._24_4_ + auVar103._24_4_;
            auVar201._28_4_ = auVar105._28_4_ + auVar103._28_4_;
            auVar218._0_4_ = auVar107._0_4_ + auVar104._0_4_;
            auVar218._4_4_ = auVar107._4_4_ + auVar104._4_4_;
            auVar218._8_4_ = auVar107._8_4_ + auVar104._8_4_;
            auVar218._12_4_ = auVar107._12_4_ + auVar104._12_4_;
            auVar218._16_4_ = auVar107._16_4_ + auVar104._16_4_;
            auVar218._20_4_ = auVar107._20_4_ + auVar104._20_4_;
            auVar218._24_4_ = auVar107._24_4_ + auVar104._24_4_;
            auVar218._28_4_ = auVar107._28_4_ + auVar104._28_4_;
            auVar104 = vunpcklps_avx(auVar108,auVar109);
            auVar103 = vunpckhps_avx(auVar108,auVar109);
            auVar221._0_4_ = auVar104._0_4_ + auVar103._0_4_;
            auVar221._4_4_ = auVar104._4_4_ + auVar103._4_4_;
            auVar221._8_4_ = auVar104._8_4_ + auVar103._8_4_;
            auVar221._12_4_ = auVar104._12_4_ + auVar103._12_4_;
            auVar221._16_4_ = auVar104._16_4_ + auVar103._16_4_;
            auVar221._20_4_ = auVar104._20_4_ + auVar103._20_4_;
            auVar221._24_4_ = auVar104._24_4_ + auVar103._24_4_;
            auVar221._28_4_ = auVar104._28_4_ + auVar103._28_4_;
            auVar104 = vunpcklps_avx(ZEXT1632(auVar87),ZEXT1632(auVar86));
            auVar103 = vunpckhps_avx(ZEXT1632(auVar87),ZEXT1632(auVar86));
            auVar211._0_4_ = auVar104._0_4_ + auVar103._0_4_;
            auVar211._4_4_ = auVar104._4_4_ + auVar103._4_4_;
            auVar211._8_4_ = auVar104._8_4_ + auVar103._8_4_;
            auVar211._12_4_ = auVar104._12_4_ + auVar103._12_4_;
            auVar211._16_4_ = auVar104._16_4_ + auVar103._16_4_;
            auVar211._20_4_ = auVar104._20_4_ + auVar103._20_4_;
            auVar211._24_4_ = auVar104._24_4_ + auVar103._24_4_;
            auVar211._28_4_ = auVar104._28_4_ + auVar103._28_4_;
            auVar105 = vunpcklps_avx(auVar201,auVar218);
            auVar103 = vunpckhps_avx(auVar201,auVar218);
            auVar107 = vunpcklps_avx(auVar221,auVar211);
            auVar104 = vunpckhps_avx(auVar221,auVar211);
            auVar202._0_4_ = auVar105._0_4_ + auVar103._0_4_;
            auVar202._4_4_ = auVar105._4_4_ + auVar103._4_4_;
            auVar202._8_4_ = auVar105._8_4_ + auVar103._8_4_;
            auVar202._12_4_ = auVar105._12_4_ + auVar103._12_4_;
            auVar202._16_4_ = auVar105._16_4_ + auVar103._16_4_;
            auVar202._20_4_ = auVar105._20_4_ + auVar103._20_4_;
            auVar202._24_4_ = auVar105._24_4_ + auVar103._24_4_;
            auVar202._28_4_ = auVar105._28_4_ + auVar103._28_4_;
            auVar212._0_4_ = auVar107._0_4_ + auVar104._0_4_;
            auVar212._4_4_ = auVar107._4_4_ + auVar104._4_4_;
            auVar212._8_4_ = auVar107._8_4_ + auVar104._8_4_;
            auVar212._12_4_ = auVar107._12_4_ + auVar104._12_4_;
            auVar212._16_4_ = auVar107._16_4_ + auVar104._16_4_;
            auVar212._20_4_ = auVar107._20_4_ + auVar104._20_4_;
            auVar212._24_4_ = auVar107._24_4_ + auVar104._24_4_;
            auVar212._28_4_ = auVar107._28_4_ + auVar104._28_4_;
            auVar104 = vunpcklps_avx(auVar202,auVar212);
            auVar103 = vunpckhps_avx(auVar202,auVar212);
            auVar105 = vperm2f128_avx(auVar104,auVar103,0x31);
            auVar203._0_4_ = auVar105._0_4_ + *(float *)*pauVar78 + auVar104._0_4_;
            auVar203._4_4_ = auVar105._4_4_ + *(float *)(*pauVar78 + 4) + auVar104._4_4_;
            auVar203._8_4_ = auVar105._8_4_ + *(float *)(*pauVar78 + 8) + auVar104._8_4_;
            auVar203._12_4_ = auVar105._12_4_ + *(float *)(*pauVar78 + 0xc) + auVar104._12_4_;
            auVar203._16_4_ = auVar105._16_4_ + *(float *)(*pauVar78 + 0x10) + auVar103._0_4_;
            auVar203._20_4_ = auVar105._20_4_ + *(float *)(*pauVar78 + 0x14) + auVar103._4_4_;
            auVar203._24_4_ = auVar105._24_4_ + *(float *)(*pauVar78 + 0x18) + auVar103._8_4_;
            auVar203._28_4_ = auVar105._28_4_ + *(float *)(*pauVar78 + 0x1c) + auVar103._12_4_;
            pauVar74 = pauVar74 + 4;
            pfVar80 = pfVar80 + 8;
            *(undefined1 (*) [32])*pauVar78 = auVar203;
            pauVar78 = (undefined1 (*) [64])(*pauVar78 + 0x20);
            uVar84 = uVar75 + 0xf;
            uVar75 = uVar75 + 8;
          }
          auVar114._8_4_ = 0xbf800000;
          auVar114._0_8_ = 0xbf800000bf800000;
          auVar114._12_4_ = 0xbf800000;
          auVar114._16_4_ = 0xbf800000;
          auVar114._20_4_ = 0xbf800000;
          auVar114._24_4_ = 0xbf800000;
          auVar114._28_4_ = 0xbf800000;
          auVar116._8_4_ = 0x395e8083;
          auVar116._0_8_ = 0x395e8083395e8083;
          auVar116._12_4_ = 0x395e8083;
          auVar116._16_4_ = 0x395e8083;
          auVar116._20_4_ = 0x395e8083;
          auVar116._24_4_ = 0x395e8083;
          auVar116._28_4_ = 0x395e8083;
          if ((int)uVar75 < size1) {
            lVar81 = 0;
            do {
              fVar192 = pfVar80[lVar81];
              auVar118._4_4_ = fVar192;
              auVar118._0_4_ = fVar192;
              auVar118._8_4_ = fVar192;
              auVar118._12_4_ = fVar192;
              auVar118._16_4_ = fVar192;
              auVar118._20_4_ = fVar192;
              auVar118._24_4_ = fVar192;
              auVar118._28_4_ = fVar192;
              auVar109 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar74,auVar118);
              auVar109 = vminps_avx(auVar109,auVar106);
              auVar110 = vmaxps_avx512vl(auVar109,auVar189._0_32_);
              auVar86 = vfmadd231ps_fma(auVar103,auVar110,auVar112);
              auVar109 = vroundps_avx(ZEXT1632(auVar86),1);
              uVar77 = vcmpps_avx512vl(ZEXT1632(auVar86),auVar109,1);
              auVar118 = vaddps_avx512vl(auVar109,auVar114);
              bVar6 = (bool)((byte)uVar77 & 1);
              auVar120._0_4_ = (float)((uint)bVar6 * auVar118._0_4_ | (uint)!bVar6 * auVar109._0_4_)
              ;
              bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
              auVar120._4_4_ = (float)((uint)bVar6 * auVar118._4_4_ | (uint)!bVar6 * auVar109._4_4_)
              ;
              bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
              auVar120._8_4_ = (float)((uint)bVar6 * auVar118._8_4_ | (uint)!bVar6 * auVar109._8_4_)
              ;
              bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
              auVar120._12_4_ =
                   (float)((uint)bVar6 * auVar118._12_4_ | (uint)!bVar6 * auVar109._12_4_);
              bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
              auVar120._16_4_ =
                   (float)((uint)bVar6 * auVar118._16_4_ | (uint)!bVar6 * auVar109._16_4_);
              bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
              auVar120._20_4_ =
                   (float)((uint)bVar6 * auVar118._20_4_ | (uint)!bVar6 * auVar109._20_4_);
              bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
              auVar120._24_4_ =
                   (float)((uint)bVar6 * auVar118._24_4_ | (uint)!bVar6 * auVar109._24_4_);
              bVar6 = SUB81(uVar77 >> 7,0);
              auVar120._28_4_ =
                   (float)((uint)bVar6 * auVar118._28_4_ | (uint)!bVar6 * auVar109._28_4_);
              auVar109 = vfmsub231ps_avx512vl(auVar110,auVar120,auVar105);
              auVar87 = vfmsub231ps_fma(auVar109,auVar120,auVar116);
              auVar110 = ZEXT1632(auVar87);
              auVar109 = vfmadd213ps_avx512vl(auVar107,auVar110,auVar104);
              auVar109 = vfmadd213ps_avx512vl(auVar109,auVar110,auVar108);
              auVar86 = vfmadd213ps_fma(auVar109,auVar110,auVar111);
              auVar110 = ZEXT1632(auVar87);
              auVar109 = vfmadd213ps_avx512vl(ZEXT1632(auVar86),auVar110,auVar102);
              auVar86 = vfmadd213ps_fma(auVar109,auVar110,auVar103);
              auVar86 = vfmadd213ps_fma(ZEXT1632(auVar86),
                                        ZEXT1632(CONCAT412(auVar87._12_4_ * auVar87._12_4_,
                                                           CONCAT48(auVar87._8_4_ * auVar87._8_4_,
                                                                    CONCAT44(auVar87._4_4_ *
                                                                             auVar87._4_4_,
                                                                             auVar87._0_4_ *
                                                                             auVar87._0_4_)))),
                                        auVar110);
              auVar121._0_4_ = (int)auVar120._0_4_;
              auVar121._4_4_ = (int)auVar120._4_4_;
              auVar121._8_4_ = (int)auVar120._8_4_;
              auVar121._12_4_ = (int)auVar120._12_4_;
              auVar121._16_4_ = (int)auVar120._16_4_;
              auVar121._20_4_ = (int)auVar120._20_4_;
              auVar121._24_4_ = (int)auVar120._24_4_;
              auVar121._28_4_ = (int)auVar120._28_4_;
              auVar109 = vpslld_avx2(auVar121,0x17);
              auVar109 = vpaddd_avx512vl(auVar109,auVar156._0_32_);
              auVar86 = vfmadd213ps_fma(auVar109,ZEXT1632(auVar86),auVar109);
              *(undefined1 (*) [32])*pauVar74 = ZEXT1632(auVar86);
              auVar87._0_4_ = auVar86._0_4_ + 0.0;
              auVar87._4_4_ = auVar86._4_4_ + 0.0;
              auVar87._8_4_ = auVar86._8_4_ + 0.0;
              auVar87._12_4_ = auVar86._12_4_ + 0.0;
              auVar86 = vshufpd_avx(auVar87,auVar87,1);
              auVar88._0_4_ = auVar86._0_4_ + auVar87._0_4_;
              auVar88._4_4_ = auVar86._4_4_ + auVar87._4_4_;
              auVar88._8_4_ = auVar86._8_4_ + auVar87._8_4_;
              auVar88._12_4_ = auVar86._12_4_ + auVar87._12_4_;
              auVar86 = vmovshdup_avx(auVar88);
              *(float *)(*pauVar78 + lVar81 * 4) =
                   auVar86._0_4_ + *(float *)(*pauVar78 + lVar81 * 4) + auVar88._0_4_;
              pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x20);
              lVar81 = lVar81 + 1;
            } while (size1 - uVar75 != (int)lVar81);
          }
          uVar76 = uVar76 + 1;
        } while (uVar76 != (uint)elemcount);
      }
    }
    uVar75 = 0;
    pauVar74 = (undefined1 (*) [64])_sumptr;
    if (0xf < size1) {
      iVar79 = 0xf;
      auVar140 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        auVar141 = vdivps_avx512f(auVar140,*pauVar74);
        *pauVar74 = auVar141;
        pauVar74 = pauVar74 + 1;
        iVar79 = iVar79 + 0x10;
      } while (iVar79 < size1);
      uVar75 = size1 & 0x7ffffff0;
    }
    if ((int)(uVar75 | 7) < size1) {
      auVar204._8_4_ = 0x3f800000;
      auVar204._0_8_ = 0x3f8000003f800000;
      auVar204._12_4_ = 0x3f800000;
      auVar204._16_4_ = 0x3f800000;
      auVar204._20_4_ = 0x3f800000;
      auVar204._24_4_ = 0x3f800000;
      auVar204._28_4_ = 0x3f800000;
      uVar84 = uVar75;
      do {
        auVar102 = vdivps_avx(auVar204,*(undefined1 (*) [32])*pauVar74);
        *(undefined1 (*) [32])*pauVar74 = auVar102;
        pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x20);
        uVar75 = uVar84 + 8;
        iVar79 = uVar84 + 0xf;
        uVar84 = uVar75;
      } while (iVar79 < size1);
    }
    if ((int)(uVar75 | 3) < size1) {
      auVar89._8_4_ = 0x3f800000;
      auVar89._0_8_ = 0x3f8000003f800000;
      auVar89._12_4_ = 0x3f800000;
      uVar84 = uVar75;
      do {
        auVar86 = vdivps_avx(auVar89,*(undefined1 (*) [16])*pauVar74);
        *(undefined1 (*) [16])*pauVar74 = auVar86;
        pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x10);
        uVar75 = uVar84 + 4;
        iVar79 = uVar84 + 7;
        uVar84 = uVar75;
      } while (iVar79 < size1);
    }
    if ((int)uVar75 < size1) {
      auVar140 = vpbroadcastq_avx512f();
      uVar76 = 0;
      auVar141 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar142 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar143 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        auVar144 = vpbroadcastq_avx512f();
        auVar145 = vporq_avx512f(auVar144,auVar141);
        auVar144 = vporq_avx512f(auVar144,auVar142);
        uVar21 = vpcmpuq_avx512f(auVar144,auVar140,2);
        bVar59 = (byte)uVar21;
        uVar21 = vpcmpuq_avx512f(auVar145,auVar140,2);
        bVar62 = (byte)uVar21;
        uVar85 = CONCAT11(bVar62,bVar59);
        piVar2 = (int *)(*pauVar74 + uVar76 * 4);
        auVar144._4_4_ = (uint)((byte)(uVar85 >> 1) & 1) * piVar2[1];
        auVar144._0_4_ = (uint)(bVar59 & 1) * *piVar2;
        auVar144._8_4_ = (uint)((byte)(uVar85 >> 2) & 1) * piVar2[2];
        auVar144._12_4_ = (uint)((byte)(uVar85 >> 3) & 1) * piVar2[3];
        auVar144._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * piVar2[4];
        auVar144._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * piVar2[5];
        auVar144._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * piVar2[6];
        auVar144._28_4_ = (uint)((byte)(uVar85 >> 7) & 1) * piVar2[7];
        auVar144._32_4_ = (uint)(bVar62 & 1) * piVar2[8];
        auVar144._36_4_ = (uint)(bVar62 >> 1 & 1) * piVar2[9];
        auVar144._40_4_ = (uint)(bVar62 >> 2 & 1) * piVar2[10];
        auVar144._44_4_ = (uint)(bVar62 >> 3 & 1) * piVar2[0xb];
        auVar144._48_4_ = (uint)(bVar62 >> 4 & 1) * piVar2[0xc];
        auVar144._52_4_ = (uint)(bVar62 >> 5 & 1) * piVar2[0xd];
        auVar144._56_4_ = (uint)(bVar62 >> 6 & 1) * piVar2[0xe];
        auVar144._60_4_ = (uint)(bVar62 >> 7) * piVar2[0xf];
        auVar144 = vdivps_avx512f(auVar143,auVar144);
        puVar1 = (uint *)(*pauVar74 + uVar76 * 4);
        bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
        bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
        bVar13 = (bool)(bVar62 >> 1 & 1);
        bVar14 = (bool)(bVar62 >> 2 & 1);
        bVar15 = (bool)(bVar62 >> 3 & 1);
        bVar16 = (bool)(bVar62 >> 4 & 1);
        bVar17 = (bool)(bVar62 >> 5 & 1);
        bVar18 = (bool)(bVar62 >> 6 & 1);
        *puVar1 = (uint)(bVar59 & 1) * auVar144._0_4_ | (uint)!(bool)(bVar59 & 1) * *puVar1;
        puVar1[1] = (uint)bVar6 * auVar144._4_4_ | (uint)!bVar6 * puVar1[1];
        puVar1[2] = (uint)bVar7 * auVar144._8_4_ | (uint)!bVar7 * puVar1[2];
        puVar1[3] = (uint)bVar8 * auVar144._12_4_ | (uint)!bVar8 * puVar1[3];
        puVar1[4] = (uint)bVar9 * auVar144._16_4_ | (uint)!bVar9 * puVar1[4];
        puVar1[5] = (uint)bVar10 * auVar144._20_4_ | (uint)!bVar10 * puVar1[5];
        puVar1[6] = (uint)bVar11 * auVar144._24_4_ | (uint)!bVar11 * puVar1[6];
        puVar1[7] = (uint)bVar12 * auVar144._28_4_ | (uint)!bVar12 * puVar1[7];
        puVar1[8] = (uint)(bVar62 & 1) * auVar144._32_4_ | (uint)!(bool)(bVar62 & 1) * puVar1[8];
        puVar1[9] = (uint)bVar13 * auVar144._36_4_ | (uint)!bVar13 * puVar1[9];
        puVar1[10] = (uint)bVar14 * auVar144._40_4_ | (uint)!bVar14 * puVar1[10];
        puVar1[0xb] = (uint)bVar15 * auVar144._44_4_ | (uint)!bVar15 * puVar1[0xb];
        puVar1[0xc] = (uint)bVar16 * auVar144._48_4_ | (uint)!bVar16 * puVar1[0xc];
        puVar1[0xd] = (uint)bVar17 * auVar144._52_4_ | (uint)!bVar17 * puVar1[0xd];
        puVar1[0xe] = (uint)bVar18 * auVar144._56_4_ | (uint)!bVar18 * puVar1[0xe];
        puVar1[0xf] = (uint)(bVar62 >> 7) * auVar144._60_4_ |
                      (uint)!(bool)(bVar62 >> 7) * puVar1[0xf];
        uVar76 = uVar76 + 0x10;
      } while (((ulong)(~uVar75 + size1) + 0x10 & 0xfffffffffffffff0) != uVar76);
    }
    if (0 < elemcount) {
      uVar76 = 0;
      do {
        pauVar74 = (undefined1 (*) [64])(_ptr + uVar76 * (long)stride);
        pfVar80 = _sumptr;
        if (size1 < 0x10) {
          uVar75 = 0;
        }
        else {
          iVar79 = 0xf;
          do {
            fVar192 = *pfVar80;
            fVar5 = pfVar80[1];
            auVar213._4_4_ = fVar5;
            auVar213._0_4_ = fVar5;
            auVar213._8_4_ = fVar5;
            auVar213._12_4_ = fVar5;
            auVar213._16_4_ = fVar5;
            auVar213._20_4_ = fVar5;
            auVar213._24_4_ = fVar5;
            auVar213._28_4_ = fVar5;
            fVar5 = pfVar80[2];
            fVar4 = pfVar80[3];
            auVar222._4_4_ = fVar4;
            auVar222._0_4_ = fVar4;
            auVar222._8_4_ = fVar4;
            auVar222._12_4_ = fVar4;
            auVar222._16_4_ = fVar4;
            auVar222._20_4_ = fVar4;
            auVar222._24_4_ = fVar4;
            auVar222._28_4_ = fVar4;
            auVar140 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar192,CONCAT424(fVar192,CONCAT420(fVar192,
                                                  CONCAT416(fVar192,CONCAT412(fVar192,CONCAT48(
                                                  fVar192,CONCAT44(fVar192,fVar192)))))))),auVar213,
                                  1);
            auVar141 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416
                                                  (fVar5,CONCAT412(fVar5,CONCAT48(fVar5,CONCAT44(
                                                  fVar5,fVar5)))))))),auVar222,1);
            fVar192 = pfVar80[4];
            fVar5 = pfVar80[5];
            auVar223._4_4_ = fVar5;
            auVar223._0_4_ = fVar5;
            auVar223._8_4_ = fVar5;
            auVar223._12_4_ = fVar5;
            auVar223._16_4_ = fVar5;
            auVar223._20_4_ = fVar5;
            auVar223._24_4_ = fVar5;
            auVar223._28_4_ = fVar5;
            fVar5 = pfVar80[6];
            auVar142 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar192,CONCAT424(fVar192,CONCAT420(fVar192,
                                                  CONCAT416(fVar192,CONCAT412(fVar192,CONCAT48(
                                                  fVar192,CONCAT44(fVar192,fVar192)))))))),auVar223,
                                  1);
            fVar192 = pfVar80[7];
            auVar224._4_4_ = fVar192;
            auVar224._0_4_ = fVar192;
            auVar224._8_4_ = fVar192;
            auVar224._12_4_ = fVar192;
            auVar224._16_4_ = fVar192;
            auVar224._20_4_ = fVar192;
            auVar224._24_4_ = fVar192;
            auVar224._28_4_ = fVar192;
            auVar143 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416
                                                  (fVar5,CONCAT412(fVar5,CONCAT48(fVar5,CONCAT44(
                                                  fVar5,fVar5)))))))),auVar224,1);
            fVar192 = pfVar80[8];
            fVar5 = pfVar80[9];
            auVar228._4_4_ = fVar5;
            auVar228._0_4_ = fVar5;
            auVar228._8_4_ = fVar5;
            auVar228._12_4_ = fVar5;
            auVar228._16_4_ = fVar5;
            auVar228._20_4_ = fVar5;
            auVar228._24_4_ = fVar5;
            auVar228._28_4_ = fVar5;
            fVar5 = pfVar80[10];
            fVar4 = pfVar80[0xb];
            auVar234._4_4_ = fVar4;
            auVar234._0_4_ = fVar4;
            auVar234._8_4_ = fVar4;
            auVar234._12_4_ = fVar4;
            auVar234._16_4_ = fVar4;
            auVar234._20_4_ = fVar4;
            auVar234._24_4_ = fVar4;
            auVar234._28_4_ = fVar4;
            auVar144 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar192,CONCAT424(fVar192,CONCAT420(fVar192,
                                                  CONCAT416(fVar192,CONCAT412(fVar192,CONCAT48(
                                                  fVar192,CONCAT44(fVar192,fVar192)))))))),auVar228,
                                  1);
            auVar145 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416
                                                  (fVar5,CONCAT412(fVar5,CONCAT48(fVar5,CONCAT44(
                                                  fVar5,fVar5)))))))),auVar234,1);
            fVar192 = pfVar80[0xc];
            fVar5 = pfVar80[0xd];
            auVar235._4_4_ = fVar5;
            auVar235._0_4_ = fVar5;
            auVar235._8_4_ = fVar5;
            auVar235._12_4_ = fVar5;
            auVar235._16_4_ = fVar5;
            auVar235._20_4_ = fVar5;
            auVar235._24_4_ = fVar5;
            auVar235._28_4_ = fVar5;
            fVar5 = pfVar80[0xe];
            auVar188 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar192,CONCAT424(fVar192,CONCAT420(fVar192,
                                                  CONCAT416(fVar192,CONCAT412(fVar192,CONCAT48(
                                                  fVar192,CONCAT44(fVar192,fVar192)))))))),auVar235,
                                  1);
            fVar192 = pfVar80[0xf];
            auVar236._4_4_ = fVar192;
            auVar236._0_4_ = fVar192;
            auVar236._8_4_ = fVar192;
            auVar236._12_4_ = fVar192;
            auVar236._16_4_ = fVar192;
            auVar236._20_4_ = fVar192;
            auVar236._24_4_ = fVar192;
            auVar236._28_4_ = fVar192;
            auVar189 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416
                                                  (fVar5,CONCAT412(fVar5,CONCAT48(fVar5,CONCAT44(
                                                  fVar5,fVar5)))))))),auVar236,1);
            auVar140 = vmulps_avx512f(auVar140,*pauVar74);
            auVar141 = vmulps_avx512f(auVar141,pauVar74[1]);
            auVar142 = vmulps_avx512f(auVar142,pauVar74[2]);
            auVar143 = vmulps_avx512f(auVar143,pauVar74[3]);
            auVar144 = vmulps_avx512f(auVar144,pauVar74[4]);
            auVar145 = vmulps_avx512f(auVar145,pauVar74[5]);
            auVar188 = vmulps_avx512f(auVar188,pauVar74[6]);
            auVar189 = vmulps_avx512f(auVar189,pauVar74[7]);
            *pauVar74 = auVar140;
            pauVar74[1] = auVar141;
            pauVar74[2] = auVar142;
            pauVar74[3] = auVar143;
            pauVar74[4] = auVar144;
            pauVar74[5] = auVar145;
            pauVar74[6] = auVar188;
            pauVar74[7] = auVar189;
            pauVar74 = pauVar74 + 8;
            pfVar80 = pfVar80 + 0x10;
            iVar79 = iVar79 + 0x10;
            uVar75 = size1 & 0xfffffff0;
          } while (iVar79 < size1);
        }
        uVar84 = uVar75 | 3;
        while ((int)uVar84 < size1) {
          fVar192 = *pfVar80;
          auVar68._4_4_ = fVar192 * *(float *)(*pauVar74 + 4);
          auVar68._0_4_ = fVar192 * *(float *)*pauVar74;
          auVar68._8_4_ = fVar192 * *(float *)(*pauVar74 + 8);
          auVar68._12_4_ = fVar192 * *(float *)(*pauVar74 + 0xc);
          auVar68._16_4_ = fVar192 * *(float *)(*pauVar74 + 0x10);
          auVar68._20_4_ = fVar192 * *(float *)(*pauVar74 + 0x14);
          auVar68._24_4_ = fVar192 * *(float *)(*pauVar74 + 0x18);
          auVar68._28_4_ = fVar192;
          fVar192 = pfVar80[1];
          auVar69._4_4_ = fVar192 * *(float *)(*pauVar74 + 0x24);
          auVar69._0_4_ = fVar192 * *(float *)(*pauVar74 + 0x20);
          auVar69._8_4_ = fVar192 * *(float *)(*pauVar74 + 0x28);
          auVar69._12_4_ = fVar192 * *(float *)(*pauVar74 + 0x2c);
          auVar69._16_4_ = fVar192 * *(float *)(*pauVar74 + 0x30);
          auVar69._20_4_ = fVar192 * *(float *)(*pauVar74 + 0x34);
          auVar69._24_4_ = fVar192 * *(float *)(*pauVar74 + 0x38);
          auVar69._28_4_ = fVar192;
          fVar192 = pfVar80[2];
          auVar70._4_4_ = fVar192 * *(float *)(pauVar74[1] + 4);
          auVar70._0_4_ = fVar192 * *(float *)pauVar74[1];
          auVar70._8_4_ = fVar192 * *(float *)(pauVar74[1] + 8);
          auVar70._12_4_ = fVar192 * *(float *)(pauVar74[1] + 0xc);
          auVar70._16_4_ = fVar192 * *(float *)(pauVar74[1] + 0x10);
          auVar70._20_4_ = fVar192 * *(float *)(pauVar74[1] + 0x14);
          auVar70._24_4_ = fVar192 * *(float *)(pauVar74[1] + 0x18);
          auVar70._28_4_ = fVar192;
          fVar192 = pfVar80[3];
          auVar71._4_4_ = fVar192 * *(float *)(pauVar74[1] + 0x24);
          auVar71._0_4_ = fVar192 * *(float *)(pauVar74[1] + 0x20);
          auVar71._8_4_ = fVar192 * *(float *)(pauVar74[1] + 0x28);
          auVar71._12_4_ = fVar192 * *(float *)(pauVar74[1] + 0x2c);
          auVar71._16_4_ = fVar192 * *(float *)(pauVar74[1] + 0x30);
          auVar71._20_4_ = fVar192 * *(float *)(pauVar74[1] + 0x34);
          auVar71._24_4_ = fVar192 * *(float *)(pauVar74[1] + 0x38);
          auVar71._28_4_ = fVar192;
          *(undefined1 (*) [32])*pauVar74 = auVar68;
          *(undefined1 (*) [32])(*pauVar74 + 0x20) = auVar69;
          *(undefined1 (*) [32])pauVar74[1] = auVar70;
          *(undefined1 (*) [32])(pauVar74[1] + 0x20) = auVar71;
          pauVar74 = pauVar74 + 2;
          pfVar80 = pfVar80 + 4;
          uVar84 = uVar75 + 7;
          uVar75 = uVar75 + 4;
        }
        if ((int)uVar75 < size1) {
          lVar81 = 0;
          do {
            fVar192 = pfVar80[lVar81];
            auVar72._4_4_ = fVar192 * *(float *)(*pauVar74 + 4);
            auVar72._0_4_ = fVar192 * *(float *)*pauVar74;
            auVar72._8_4_ = fVar192 * *(float *)(*pauVar74 + 8);
            auVar72._12_4_ = fVar192 * *(float *)(*pauVar74 + 0xc);
            auVar72._16_4_ = fVar192 * *(float *)(*pauVar74 + 0x10);
            auVar72._20_4_ = fVar192 * *(float *)(*pauVar74 + 0x14);
            auVar72._24_4_ = fVar192 * *(float *)(*pauVar74 + 0x18);
            auVar72._28_4_ = fVar192;
            *(undefined1 (*) [32])*pauVar74 = auVar72;
            pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x20);
            lVar81 = lVar81 + 1;
          } while (size1 - uVar75 != (int)lVar81);
        }
        uVar76 = uVar76 + 1;
      } while (uVar76 != (uint)elemcount);
    }
  }
  else if (elempack == 0x10) {
    lVar81 = (long)stride;
    uVar76 = (ulong)(uint)elemcount;
    if (0 < elemcount) {
      uVar77 = 0;
      do {
        pauVar74 = (undefined1 (*) [64])(_ptr + uVar77 * lVar81);
        pauVar78 = (undefined1 (*) [64])_maxptr;
        if (size1 < 0x10) {
          uVar75 = 0;
        }
        else {
          iVar79 = 0xf;
          do {
            auVar140 = vunpcklps_avx512f(*pauVar74,pauVar74[1]);
            auVar141 = vunpckhps_avx512f(*pauVar74,pauVar74[1]);
            auVar140 = vmaxps_avx512f(auVar140,auVar141);
            auVar141 = vunpcklps_avx512f(pauVar74[2],pauVar74[3]);
            auVar142 = vunpckhps_avx512f(pauVar74[2],pauVar74[3]);
            auVar141 = vmaxps_avx512f(auVar141,auVar142);
            auVar142 = vunpcklps_avx512f(pauVar74[4],pauVar74[5]);
            auVar143 = vunpckhps_avx512f(pauVar74[4],pauVar74[5]);
            auVar142 = vmaxps_avx512f(auVar142,auVar143);
            auVar143 = vunpcklps_avx512f(pauVar74[6],pauVar74[7]);
            auVar144 = vunpckhps_avx512f(pauVar74[6],pauVar74[7]);
            auVar143 = vmaxps_avx512f(auVar143,auVar144);
            auVar144 = vunpcklps_avx512f(pauVar74[8],pauVar74[9]);
            auVar145 = vunpckhps_avx512f(pauVar74[8],pauVar74[9]);
            auVar144 = vmaxps_avx512f(auVar144,auVar145);
            auVar145 = vunpcklps_avx512f(pauVar74[10],pauVar74[0xb]);
            auVar188 = vunpckhps_avx512f(pauVar74[10],pauVar74[0xb]);
            auVar145 = vmaxps_avx512f(auVar145,auVar188);
            auVar188 = vunpcklps_avx512f(pauVar74[0xc],pauVar74[0xd]);
            auVar189 = vunpckhps_avx512f(pauVar74[0xc],pauVar74[0xd]);
            auVar188 = vmaxps_avx512f(auVar188,auVar189);
            auVar189 = vunpcklps_avx512f(pauVar74[0xe],pauVar74[0xf]);
            auVar156 = vunpckhps_avx512f(pauVar74[0xe],pauVar74[0xf]);
            auVar189 = vmaxps_avx512f(auVar189,auVar156);
            auVar156 = vunpcklpd_avx512f(auVar140,auVar141);
            auVar140 = vunpckhpd_avx512f(auVar140,auVar141);
            auVar140 = vmaxps_avx512f(auVar156,auVar140);
            auVar141 = vunpcklpd_avx512f(auVar142,auVar143);
            auVar142 = vunpckhpd_avx512f(auVar142,auVar143);
            auVar141 = vmaxps_avx512f(auVar141,auVar142);
            auVar142 = vunpcklpd_avx512f(auVar144,auVar145);
            auVar143 = vunpckhpd_avx512f(auVar144,auVar145);
            auVar142 = vmaxps_avx512f(auVar142,auVar143);
            auVar143 = vunpcklpd_avx512f(auVar188,auVar189);
            auVar144 = vunpckhpd_avx512f(auVar188,auVar189);
            auVar143 = vmaxps_avx512f(auVar143,auVar144);
            auVar144 = vinsertf64x4_avx512f(auVar140,auVar141._0_32_,1);
            auVar140 = vshuff64x2_avx512f(auVar140,auVar141,0xee);
            auVar140 = vmaxps_avx512f(auVar144,auVar140);
            auVar141 = vinsertf64x4_avx512f(auVar142,auVar143._0_32_,1);
            auVar142 = vshuff64x2_avx512f(auVar142,auVar143,0xee);
            auVar141 = vmaxps_avx512f(auVar141,auVar142);
            auVar142 = vshuff64x2_avx512f(auVar140,auVar141,0x88);
            auVar140 = vshuff64x2_avx512f(auVar140,auVar141,0xdd);
            auVar140 = vmaxps_avx512f(auVar142,auVar140);
            auVar140 = vmaxps_avx512f(auVar140,*pauVar78);
            *pauVar78 = auVar140;
            pauVar74 = pauVar74 + 0x10;
            pauVar78 = pauVar78 + 1;
            iVar79 = iVar79 + 0x10;
            uVar75 = size1 & 0xfffffff0;
          } while (iVar79 < size1);
        }
        if ((int)uVar75 < size1) {
          lVar83 = 0;
          do {
            auVar102 = vmaxps_avx(*(undefined1 (*) [32])*pauVar74,
                                  *(undefined1 (*) [32])(*pauVar74 + 0x20));
            auVar86 = vmaxps_avx(auVar102._0_16_,auVar102._16_16_);
            auVar87 = vshufpd_avx(auVar86,auVar86,3);
            auVar86 = vmaxps_avx(auVar86,auVar87);
            auVar87 = vmovshdup_avx(auVar86);
            auVar86 = vmaxss_avx(auVar86,auVar87);
            auVar86 = vmaxss_avx(auVar86,ZEXT416(*(uint *)(*pauVar78 + lVar83 * 4)));
            *(int *)(*pauVar78 + lVar83 * 4) = auVar86._0_4_;
            pauVar74 = pauVar74 + 1;
            lVar83 = lVar83 + 1;
          } while (size1 - uVar75 != (int)lVar83);
        }
        afVar73 = ::_ps512_cephes_exp_p5;
        afVar272 = ::_ps512_cephes_LOG2EF;
        afVar270 = ::_ps512_1;
        uVar77 = uVar77 + 1;
      } while (uVar77 != uVar76);
      if (0 < elemcount) {
        auVar140 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar141 = vxorps_avx512dq(auVar140,(undefined1  [64])::_ps512_cephes_exp_C1);
        auVar140 = vxorps_avx512dq(auVar140,(undefined1  [64])::_ps512_cephes_exp_C2);
        auVar142 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        uVar77 = 0;
        afVar237 = ::_ps512_cephes_exp_p0;
        afVar242 = ::_ps512_cephes_exp_p1;
        afVar246 = ::_ps512_cephes_exp_p2;
        afVar250 = ::_ps512_cephes_exp_p3;
        afVar255 = ::_ps512_cephes_exp_p4;
        afVar268 = ::_ps512_exp_lo;
        afVar269 = ::_ps512_exp_hi;
        do {
          pauVar74 = (undefined1 (*) [64])(_ptr + uVar77 * lVar81);
          pauVar78 = (undefined1 (*) [64])_sumptr;
          pfVar80 = _maxptr;
          if (size1 < 0x10) {
            uVar75 = 0;
          }
          else {
            iVar79 = 0xf;
            afVar237 = afVar269;
            do {
              afVar269 = ::_ps512_exp_hi;
              fVar192 = *pfVar80;
              auVar142._4_4_ = fVar192;
              auVar142._0_4_ = fVar192;
              auVar142._8_4_ = fVar192;
              auVar142._12_4_ = fVar192;
              auVar142._16_4_ = fVar192;
              auVar142._20_4_ = fVar192;
              auVar142._24_4_ = fVar192;
              auVar142._28_4_ = fVar192;
              auVar142._32_4_ = fVar192;
              auVar142._36_4_ = fVar192;
              auVar142._40_4_ = fVar192;
              auVar142._44_4_ = fVar192;
              auVar142._48_4_ = fVar192;
              auVar142._52_4_ = fVar192;
              auVar142._56_4_ = fVar192;
              auVar142._60_4_ = fVar192;
              auVar142 = vsubps_avx512f(*pauVar74,auVar142);
              auVar142 = vminps_avx512f(auVar142,(undefined1  [64])afVar237);
              auVar142 = vmaxps_avx512f(auVar142,(undefined1  [64])afVar268);
              auVar144 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar142,
                                             (undefined1  [64])afVar73);
              auVar145 = vrndscaleps_avx512f(auVar144,1);
              fVar192 = pfVar80[1];
              auVar143._4_4_ = fVar192;
              auVar143._0_4_ = fVar192;
              auVar143._8_4_ = fVar192;
              auVar143._12_4_ = fVar192;
              auVar143._16_4_ = fVar192;
              auVar143._20_4_ = fVar192;
              auVar143._24_4_ = fVar192;
              auVar143._28_4_ = fVar192;
              auVar143._32_4_ = fVar192;
              auVar143._36_4_ = fVar192;
              auVar143._40_4_ = fVar192;
              auVar143._44_4_ = fVar192;
              auVar143._48_4_ = fVar192;
              auVar143._52_4_ = fVar192;
              auVar143._56_4_ = fVar192;
              auVar143._60_4_ = fVar192;
              auVar143 = vsubps_avx512f(pauVar74[1],auVar143);
              uVar20 = vcmpps_avx512f(auVar144,auVar145,1);
              auVar144 = vsubps_avx512f(auVar145,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar182._0_4_ = (uint)bVar6 * auVar144._0_4_ | (uint)!bVar6 * auVar145._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar182._4_4_ = (uint)bVar6 * auVar144._4_4_ | (uint)!bVar6 * auVar145._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar182._8_4_ = (uint)bVar6 * auVar144._8_4_ | (uint)!bVar6 * auVar145._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar182._12_4_ = (uint)bVar6 * auVar144._12_4_ | (uint)!bVar6 * auVar145._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar182._16_4_ = (uint)bVar6 * auVar144._16_4_ | (uint)!bVar6 * auVar145._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar182._20_4_ = (uint)bVar6 * auVar144._20_4_ | (uint)!bVar6 * auVar145._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar182._24_4_ = (uint)bVar6 * auVar144._24_4_ | (uint)!bVar6 * auVar145._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar182._28_4_ = (uint)bVar6 * auVar144._28_4_ | (uint)!bVar6 * auVar145._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar182._32_4_ = (uint)bVar6 * auVar144._32_4_ | (uint)!bVar6 * auVar145._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar182._36_4_ = (uint)bVar6 * auVar144._36_4_ | (uint)!bVar6 * auVar145._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar182._40_4_ = (uint)bVar6 * auVar144._40_4_ | (uint)!bVar6 * auVar145._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar182._44_4_ = (uint)bVar6 * auVar144._44_4_ | (uint)!bVar6 * auVar145._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar182._48_4_ = (uint)bVar6 * auVar144._48_4_ | (uint)!bVar6 * auVar145._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar182._52_4_ = (uint)bVar6 * auVar144._52_4_ | (uint)!bVar6 * auVar145._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar182._56_4_ = (uint)bVar6 * auVar144._56_4_ | (uint)!bVar6 * auVar145._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar182._60_4_ = (uint)bVar6 * auVar144._60_4_ | (uint)!bVar6 * auVar145._60_4_;
              auVar143 = vminps_avx512f(auVar143,(undefined1  [64])afVar237);
              auVar143 = vmaxps_avx512f(auVar143,(undefined1  [64])afVar268);
              auVar142 = vfmadd231ps_avx512f(auVar142,auVar182,auVar141);
              auVar144 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar143,
                                             (undefined1  [64])afVar73);
              auVar145 = vrndscaleps_avx512f(auVar144,1);
              auVar142 = vfmadd231ps_avx512f(auVar142,auVar182,auVar140);
              uVar20 = vcmpps_avx512f(auVar144,auVar145,1);
              auVar144 = vsubps_avx512f(auVar145,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar183._0_4_ = (uint)bVar6 * auVar144._0_4_ | (uint)!bVar6 * auVar145._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar183._4_4_ = (uint)bVar6 * auVar144._4_4_ | (uint)!bVar6 * auVar145._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar183._8_4_ = (uint)bVar6 * auVar144._8_4_ | (uint)!bVar6 * auVar145._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar183._12_4_ = (uint)bVar6 * auVar144._12_4_ | (uint)!bVar6 * auVar145._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar183._16_4_ = (uint)bVar6 * auVar144._16_4_ | (uint)!bVar6 * auVar145._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar183._20_4_ = (uint)bVar6 * auVar144._20_4_ | (uint)!bVar6 * auVar145._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar183._24_4_ = (uint)bVar6 * auVar144._24_4_ | (uint)!bVar6 * auVar145._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar183._28_4_ = (uint)bVar6 * auVar144._28_4_ | (uint)!bVar6 * auVar145._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar183._32_4_ = (uint)bVar6 * auVar144._32_4_ | (uint)!bVar6 * auVar145._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar183._36_4_ = (uint)bVar6 * auVar144._36_4_ | (uint)!bVar6 * auVar145._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar183._40_4_ = (uint)bVar6 * auVar144._40_4_ | (uint)!bVar6 * auVar145._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar183._44_4_ = (uint)bVar6 * auVar144._44_4_ | (uint)!bVar6 * auVar145._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar183._48_4_ = (uint)bVar6 * auVar144._48_4_ | (uint)!bVar6 * auVar145._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar183._52_4_ = (uint)bVar6 * auVar144._52_4_ | (uint)!bVar6 * auVar145._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar183._56_4_ = (uint)bVar6 * auVar144._56_4_ | (uint)!bVar6 * auVar145._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar183._60_4_ = (uint)bVar6 * auVar144._60_4_ | (uint)!bVar6 * auVar145._60_4_;
              auVar143 = vfmadd231ps_avx512f(auVar143,auVar183,auVar141);
              auVar144 = vmulps_avx512f(auVar142,auVar142);
              auVar143 = vfmadd231ps_avx512f(auVar143,auVar183,auVar140);
              fVar192 = pfVar80[2];
              auVar145._4_4_ = fVar192;
              auVar145._0_4_ = fVar192;
              auVar145._8_4_ = fVar192;
              auVar145._12_4_ = fVar192;
              auVar145._16_4_ = fVar192;
              auVar145._20_4_ = fVar192;
              auVar145._24_4_ = fVar192;
              auVar145._28_4_ = fVar192;
              auVar145._32_4_ = fVar192;
              auVar145._36_4_ = fVar192;
              auVar145._40_4_ = fVar192;
              auVar145._44_4_ = fVar192;
              auVar145._48_4_ = fVar192;
              auVar145._52_4_ = fVar192;
              auVar145._56_4_ = fVar192;
              auVar145._60_4_ = fVar192;
              auVar145 = vsubps_avx512f(pauVar74[2],auVar145);
              auVar145 = vminps_avx512f(auVar145,(undefined1  [64])afVar237);
              auVar145 = vmaxps_avx512f(auVar145,(undefined1  [64])afVar268);
              auVar156 = vmulps_avx512f(auVar143,auVar143);
              auVar188 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar145,
                                             (undefined1  [64])afVar73);
              auVar189 = vrndscaleps_avx512f(auVar188,1);
              uVar20 = vcmpps_avx512f(auVar188,auVar189,1);
              auVar188 = vsubps_avx512f(auVar189,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar185._0_4_ = (uint)bVar6 * auVar188._0_4_ | (uint)!bVar6 * auVar189._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar185._4_4_ = (uint)bVar6 * auVar188._4_4_ | (uint)!bVar6 * auVar189._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar185._8_4_ = (uint)bVar6 * auVar188._8_4_ | (uint)!bVar6 * auVar189._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar185._12_4_ = (uint)bVar6 * auVar188._12_4_ | (uint)!bVar6 * auVar189._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar185._16_4_ = (uint)bVar6 * auVar188._16_4_ | (uint)!bVar6 * auVar189._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar185._20_4_ = (uint)bVar6 * auVar188._20_4_ | (uint)!bVar6 * auVar189._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar185._24_4_ = (uint)bVar6 * auVar188._24_4_ | (uint)!bVar6 * auVar189._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar185._28_4_ = (uint)bVar6 * auVar188._28_4_ | (uint)!bVar6 * auVar189._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar185._32_4_ = (uint)bVar6 * auVar188._32_4_ | (uint)!bVar6 * auVar189._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar185._36_4_ = (uint)bVar6 * auVar188._36_4_ | (uint)!bVar6 * auVar189._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar185._40_4_ = (uint)bVar6 * auVar188._40_4_ | (uint)!bVar6 * auVar189._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar185._44_4_ = (uint)bVar6 * auVar188._44_4_ | (uint)!bVar6 * auVar189._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar185._48_4_ = (uint)bVar6 * auVar188._48_4_ | (uint)!bVar6 * auVar189._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar185._52_4_ = (uint)bVar6 * auVar188._52_4_ | (uint)!bVar6 * auVar189._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar185._56_4_ = (uint)bVar6 * auVar188._56_4_ | (uint)!bVar6 * auVar189._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar185._60_4_ = (uint)bVar6 * auVar188._60_4_ | (uint)!bVar6 * auVar189._60_4_;
              auVar145 = vfmadd231ps_avx512f(auVar145,auVar185,auVar141);
              auVar145 = vfmadd231ps_avx512f(auVar145,auVar185,auVar140);
              auVar147 = vmulps_avx512f(auVar145,auVar145);
              fVar192 = pfVar80[3];
              auVar188._4_4_ = fVar192;
              auVar188._0_4_ = fVar192;
              auVar188._8_4_ = fVar192;
              auVar188._12_4_ = fVar192;
              auVar188._16_4_ = fVar192;
              auVar188._20_4_ = fVar192;
              auVar188._24_4_ = fVar192;
              auVar188._28_4_ = fVar192;
              auVar188._32_4_ = fVar192;
              auVar188._36_4_ = fVar192;
              auVar188._40_4_ = fVar192;
              auVar188._44_4_ = fVar192;
              auVar188._48_4_ = fVar192;
              auVar188._52_4_ = fVar192;
              auVar188._56_4_ = fVar192;
              auVar188._60_4_ = fVar192;
              auVar188 = vsubps_avx512f(pauVar74[3],auVar188);
              auVar189 = vfmadd213ps_avx512f(auVar142,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar188 = vminps_avx512f(auVar188,(undefined1  [64])afVar237);
              auVar188 = vmaxps_avx512f(auVar188,(undefined1  [64])afVar268);
              auVar149 = vfmadd213ps_avx512f(auVar143,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar146 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar188,
                                             (undefined1  [64])afVar73);
              auVar148 = vrndscaleps_avx512f(auVar146,1);
              uVar20 = vcmpps_avx512f(auVar146,auVar148,1);
              auVar146 = vfmadd213ps_avx512f(auVar145,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar150 = vsubps_avx512f(auVar148,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar186._0_4_ = (uint)bVar6 * auVar150._0_4_ | (uint)!bVar6 * auVar148._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar186._4_4_ = (uint)bVar6 * auVar150._4_4_ | (uint)!bVar6 * auVar148._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar186._8_4_ = (uint)bVar6 * auVar150._8_4_ | (uint)!bVar6 * auVar148._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar186._12_4_ = (uint)bVar6 * auVar150._12_4_ | (uint)!bVar6 * auVar148._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar186._16_4_ = (uint)bVar6 * auVar150._16_4_ | (uint)!bVar6 * auVar148._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar186._20_4_ = (uint)bVar6 * auVar150._20_4_ | (uint)!bVar6 * auVar148._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar186._24_4_ = (uint)bVar6 * auVar150._24_4_ | (uint)!bVar6 * auVar148._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar186._28_4_ = (uint)bVar6 * auVar150._28_4_ | (uint)!bVar6 * auVar148._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar186._32_4_ = (uint)bVar6 * auVar150._32_4_ | (uint)!bVar6 * auVar148._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar186._36_4_ = (uint)bVar6 * auVar150._36_4_ | (uint)!bVar6 * auVar148._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar186._40_4_ = (uint)bVar6 * auVar150._40_4_ | (uint)!bVar6 * auVar148._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar186._44_4_ = (uint)bVar6 * auVar150._44_4_ | (uint)!bVar6 * auVar148._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar186._48_4_ = (uint)bVar6 * auVar150._48_4_ | (uint)!bVar6 * auVar148._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar186._52_4_ = (uint)bVar6 * auVar150._52_4_ | (uint)!bVar6 * auVar148._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar186._56_4_ = (uint)bVar6 * auVar150._56_4_ | (uint)!bVar6 * auVar148._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar186._60_4_ = (uint)bVar6 * auVar150._60_4_ | (uint)!bVar6 * auVar148._60_4_;
              auVar188 = vfmadd231ps_avx512f(auVar188,auVar186,auVar141);
              auVar188 = vfmadd231ps_avx512f(auVar188,auVar186,auVar140);
              auVar148 = vfmadd213ps_avx512f(auVar189,auVar142,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar151 = vmulps_avx512f(auVar188,auVar188);
              auVar150 = vfmadd213ps_avx512f(auVar188,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar149 = vfmadd213ps_avx512f(auVar149,auVar143,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              fVar192 = pfVar80[4];
              auVar189._4_4_ = fVar192;
              auVar189._0_4_ = fVar192;
              auVar189._8_4_ = fVar192;
              auVar189._12_4_ = fVar192;
              auVar189._16_4_ = fVar192;
              auVar189._20_4_ = fVar192;
              auVar189._24_4_ = fVar192;
              auVar189._28_4_ = fVar192;
              auVar189._32_4_ = fVar192;
              auVar189._36_4_ = fVar192;
              auVar189._40_4_ = fVar192;
              auVar189._44_4_ = fVar192;
              auVar189._48_4_ = fVar192;
              auVar189._52_4_ = fVar192;
              auVar189._56_4_ = fVar192;
              auVar189._60_4_ = fVar192;
              auVar189 = vsubps_avx512f(pauVar74[4],auVar189);
              auVar189 = vminps_avx512f(auVar189,(undefined1  [64])afVar237);
              auVar146 = vfmadd213ps_avx512f(auVar146,auVar145,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar189 = vmaxps_avx512f(auVar189,(undefined1  [64])afVar268);
              auVar157 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar189,
                                             (undefined1  [64])afVar73);
              auVar150 = vfmadd213ps_avx512f(auVar150,auVar188,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar158 = vrndscaleps_avx512f(auVar157,1);
              uVar20 = vcmpps_avx512f(auVar157,auVar158,1);
              auVar157 = vsubps_avx512f(auVar158,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar159._0_4_ = (uint)bVar6 * auVar157._0_4_ | (uint)!bVar6 * auVar158._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar159._4_4_ = (uint)bVar6 * auVar157._4_4_ | (uint)!bVar6 * auVar158._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar159._8_4_ = (uint)bVar6 * auVar157._8_4_ | (uint)!bVar6 * auVar158._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar159._12_4_ = (uint)bVar6 * auVar157._12_4_ | (uint)!bVar6 * auVar158._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar159._16_4_ = (uint)bVar6 * auVar157._16_4_ | (uint)!bVar6 * auVar158._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar159._20_4_ = (uint)bVar6 * auVar157._20_4_ | (uint)!bVar6 * auVar158._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar159._24_4_ = (uint)bVar6 * auVar157._24_4_ | (uint)!bVar6 * auVar158._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar159._28_4_ = (uint)bVar6 * auVar157._28_4_ | (uint)!bVar6 * auVar158._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar159._32_4_ = (uint)bVar6 * auVar157._32_4_ | (uint)!bVar6 * auVar158._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar159._36_4_ = (uint)bVar6 * auVar157._36_4_ | (uint)!bVar6 * auVar158._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar159._40_4_ = (uint)bVar6 * auVar157._40_4_ | (uint)!bVar6 * auVar158._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar159._44_4_ = (uint)bVar6 * auVar157._44_4_ | (uint)!bVar6 * auVar158._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar159._48_4_ = (uint)bVar6 * auVar157._48_4_ | (uint)!bVar6 * auVar158._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar159._52_4_ = (uint)bVar6 * auVar157._52_4_ | (uint)!bVar6 * auVar158._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar159._56_4_ = (uint)bVar6 * auVar157._56_4_ | (uint)!bVar6 * auVar158._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar159._60_4_ = (uint)bVar6 * auVar157._60_4_ | (uint)!bVar6 * auVar158._60_4_;
              auVar148 = vfmadd213ps_avx512f(auVar148,auVar142,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar189 = vfmadd231ps_avx512f(auVar189,auVar159,auVar141);
              auVar189 = vfmadd231ps_avx512f(auVar189,auVar159,auVar140);
              auVar157 = vmulps_avx512f(auVar189,auVar189);
              auVar158 = vfmadd213ps_avx512f(auVar149,auVar143,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar149 = vfmadd213ps_avx512f(auVar189,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar160 = vfmadd213ps_avx512f(auVar149,auVar189,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar161 = vfmadd213ps_avx512f(auVar146,auVar145,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              fVar192 = pfVar80[5];
              auVar149._4_4_ = fVar192;
              auVar149._0_4_ = fVar192;
              auVar149._8_4_ = fVar192;
              auVar149._12_4_ = fVar192;
              auVar149._16_4_ = fVar192;
              auVar149._20_4_ = fVar192;
              auVar149._24_4_ = fVar192;
              auVar149._28_4_ = fVar192;
              auVar149._32_4_ = fVar192;
              auVar149._36_4_ = fVar192;
              auVar149._40_4_ = fVar192;
              auVar149._44_4_ = fVar192;
              auVar149._48_4_ = fVar192;
              auVar149._52_4_ = fVar192;
              auVar149._56_4_ = fVar192;
              auVar149._60_4_ = fVar192;
              auVar149 = vsubps_avx512f(pauVar74[5],auVar149);
              auVar149 = vminps_avx512f(auVar149,(undefined1  [64])afVar237);
              auVar150 = vfmadd213ps_avx512f(auVar150,auVar188,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar149 = vmaxps_avx512f(auVar149,(undefined1  [64])afVar268);
              auVar146 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar149,
                                             (undefined1  [64])afVar73);
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar189,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar162 = vrndscaleps_avx512f(auVar146,1);
              uVar20 = vcmpps_avx512f(auVar146,auVar162,1);
              auVar146 = vsubps_avx512f(auVar162,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar163._0_4_ = (uint)bVar6 * auVar146._0_4_ | (uint)!bVar6 * auVar162._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar163._4_4_ = (uint)bVar6 * auVar146._4_4_ | (uint)!bVar6 * auVar162._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar163._8_4_ = (uint)bVar6 * auVar146._8_4_ | (uint)!bVar6 * auVar162._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar163._12_4_ = (uint)bVar6 * auVar146._12_4_ | (uint)!bVar6 * auVar162._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar163._16_4_ = (uint)bVar6 * auVar146._16_4_ | (uint)!bVar6 * auVar162._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar163._20_4_ = (uint)bVar6 * auVar146._20_4_ | (uint)!bVar6 * auVar162._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar163._24_4_ = (uint)bVar6 * auVar146._24_4_ | (uint)!bVar6 * auVar162._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar163._28_4_ = (uint)bVar6 * auVar146._28_4_ | (uint)!bVar6 * auVar162._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar163._32_4_ = (uint)bVar6 * auVar146._32_4_ | (uint)!bVar6 * auVar162._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar163._36_4_ = (uint)bVar6 * auVar146._36_4_ | (uint)!bVar6 * auVar162._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar163._40_4_ = (uint)bVar6 * auVar146._40_4_ | (uint)!bVar6 * auVar162._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar163._44_4_ = (uint)bVar6 * auVar146._44_4_ | (uint)!bVar6 * auVar162._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar163._48_4_ = (uint)bVar6 * auVar146._48_4_ | (uint)!bVar6 * auVar162._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar163._52_4_ = (uint)bVar6 * auVar146._52_4_ | (uint)!bVar6 * auVar162._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar163._56_4_ = (uint)bVar6 * auVar146._56_4_ | (uint)!bVar6 * auVar162._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar163._60_4_ = (uint)bVar6 * auVar146._60_4_ | (uint)!bVar6 * auVar162._60_4_;
              auVar146 = vfmadd213ps_avx512f(auVar148,auVar142,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar149 = vfmadd231ps_avx512f(auVar149,auVar163,auVar141);
              auVar149 = vfmadd231ps_avx512f(auVar149,auVar163,auVar140);
              auVar162 = vmulps_avx512f(auVar149,auVar149);
              auVar148 = vfmadd213ps_avx512f(auVar146,auVar142,(undefined1  [64])afVar73);
              fVar192 = pfVar80[6];
              auVar146._4_4_ = fVar192;
              auVar146._0_4_ = fVar192;
              auVar146._8_4_ = fVar192;
              auVar146._12_4_ = fVar192;
              auVar146._16_4_ = fVar192;
              auVar146._20_4_ = fVar192;
              auVar146._24_4_ = fVar192;
              auVar146._28_4_ = fVar192;
              auVar146._32_4_ = fVar192;
              auVar146._36_4_ = fVar192;
              auVar146._40_4_ = fVar192;
              auVar146._44_4_ = fVar192;
              auVar146._48_4_ = fVar192;
              auVar146._52_4_ = fVar192;
              auVar146._56_4_ = fVar192;
              auVar146._60_4_ = fVar192;
              auVar146 = vsubps_avx512f(pauVar74[6],auVar146);
              auVar146 = vminps_avx512f(auVar146,(undefined1  [64])afVar237);
              auVar142 = vfmadd213ps_avx512f(auVar148,auVar144,auVar142);
              auVar144 = vmaxps_avx512f(auVar146,(undefined1  [64])afVar268);
              auVar146 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar144,
                                             (undefined1  [64])afVar73);
              auVar148 = vfmadd213ps_avx512f(auVar158,auVar143,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar158 = vrndscaleps_avx512f(auVar146,1);
              uVar20 = vcmpps_avx512f(auVar146,auVar158,1);
              auVar146 = vfmadd213ps_avx512f(auVar161,auVar145,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar161 = vfmadd213ps_avx512f(auVar149,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar149,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar149,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar148 = vfmadd213ps_avx512f(auVar148,auVar143,(undefined1  [64])afVar73);
              auVar164 = vsubps_avx512f(auVar158,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar165._0_4_ = (uint)bVar6 * auVar164._0_4_ | (uint)!bVar6 * auVar158._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar165._4_4_ = (uint)bVar6 * auVar164._4_4_ | (uint)!bVar6 * auVar158._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar165._8_4_ = (uint)bVar6 * auVar164._8_4_ | (uint)!bVar6 * auVar158._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar165._12_4_ = (uint)bVar6 * auVar164._12_4_ | (uint)!bVar6 * auVar158._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar165._16_4_ = (uint)bVar6 * auVar164._16_4_ | (uint)!bVar6 * auVar158._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar165._20_4_ = (uint)bVar6 * auVar164._20_4_ | (uint)!bVar6 * auVar158._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar165._24_4_ = (uint)bVar6 * auVar164._24_4_ | (uint)!bVar6 * auVar158._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar165._28_4_ = (uint)bVar6 * auVar164._28_4_ | (uint)!bVar6 * auVar158._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar165._32_4_ = (uint)bVar6 * auVar164._32_4_ | (uint)!bVar6 * auVar158._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar165._36_4_ = (uint)bVar6 * auVar164._36_4_ | (uint)!bVar6 * auVar158._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar165._40_4_ = (uint)bVar6 * auVar164._40_4_ | (uint)!bVar6 * auVar158._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar165._44_4_ = (uint)bVar6 * auVar164._44_4_ | (uint)!bVar6 * auVar158._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar165._48_4_ = (uint)bVar6 * auVar164._48_4_ | (uint)!bVar6 * auVar158._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar165._52_4_ = (uint)bVar6 * auVar164._52_4_ | (uint)!bVar6 * auVar158._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar165._56_4_ = (uint)bVar6 * auVar164._56_4_ | (uint)!bVar6 * auVar158._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar165._60_4_ = (uint)bVar6 * auVar164._60_4_ | (uint)!bVar6 * auVar158._60_4_;
              auVar144 = vfmadd231ps_avx512f(auVar144,auVar165,auVar141);
              auVar144 = vfmadd231ps_avx512f(auVar144,auVar165,auVar140);
              auVar143 = vfmadd213ps_avx512f(auVar148,auVar156,auVar143);
              auVar156 = vmulps_avx512f(auVar144,auVar144);
              auVar148 = vfmadd213ps_avx512f(auVar144,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar146 = vfmadd213ps_avx512f(auVar146,auVar145,(undefined1  [64])afVar73);
              auVar158 = vfmadd213ps_avx512f(auVar148,auVar144,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              fVar192 = pfVar80[7];
              auVar148._4_4_ = fVar192;
              auVar148._0_4_ = fVar192;
              auVar148._8_4_ = fVar192;
              auVar148._12_4_ = fVar192;
              auVar148._16_4_ = fVar192;
              auVar148._20_4_ = fVar192;
              auVar148._24_4_ = fVar192;
              auVar148._28_4_ = fVar192;
              auVar148._32_4_ = fVar192;
              auVar148._36_4_ = fVar192;
              auVar148._40_4_ = fVar192;
              auVar148._44_4_ = fVar192;
              auVar148._48_4_ = fVar192;
              auVar148._52_4_ = fVar192;
              auVar148._56_4_ = fVar192;
              auVar148._60_4_ = fVar192;
              auVar148 = vsubps_avx512f(pauVar74[7],auVar148);
              auVar145 = vfmadd213ps_avx512f(auVar146,auVar147,auVar145);
              auVar146 = vminps_avx512f(auVar148,(undefined1  [64])afVar237);
              auVar146 = vmaxps_avx512f(auVar146,(undefined1  [64])afVar268);
              auVar147 = vfmadd213ps_avx512f(auVar158,auVar144,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar148 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar146,
                                             (undefined1  [64])afVar73);
              auVar158 = vrndscaleps_avx512f(auVar148,1);
              uVar20 = vcmpps_avx512f(auVar148,auVar158,1);
              auVar148 = vfmadd213ps_avx512f(auVar150,auVar188,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar150 = vsubps_avx512f(auVar158,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar166._0_4_ = (uint)bVar6 * auVar150._0_4_ | (uint)!bVar6 * auVar158._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar166._4_4_ = (uint)bVar6 * auVar150._4_4_ | (uint)!bVar6 * auVar158._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar166._8_4_ = (uint)bVar6 * auVar150._8_4_ | (uint)!bVar6 * auVar158._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar166._12_4_ = (uint)bVar6 * auVar150._12_4_ | (uint)!bVar6 * auVar158._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar166._16_4_ = (uint)bVar6 * auVar150._16_4_ | (uint)!bVar6 * auVar158._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar166._20_4_ = (uint)bVar6 * auVar150._20_4_ | (uint)!bVar6 * auVar158._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar166._24_4_ = (uint)bVar6 * auVar150._24_4_ | (uint)!bVar6 * auVar158._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar166._28_4_ = (uint)bVar6 * auVar150._28_4_ | (uint)!bVar6 * auVar158._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar166._32_4_ = (uint)bVar6 * auVar150._32_4_ | (uint)!bVar6 * auVar158._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar166._36_4_ = (uint)bVar6 * auVar150._36_4_ | (uint)!bVar6 * auVar158._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar166._40_4_ = (uint)bVar6 * auVar150._40_4_ | (uint)!bVar6 * auVar158._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar166._44_4_ = (uint)bVar6 * auVar150._44_4_ | (uint)!bVar6 * auVar158._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar166._48_4_ = (uint)bVar6 * auVar150._48_4_ | (uint)!bVar6 * auVar158._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar166._52_4_ = (uint)bVar6 * auVar150._52_4_ | (uint)!bVar6 * auVar158._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar166._56_4_ = (uint)bVar6 * auVar150._56_4_ | (uint)!bVar6 * auVar158._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar166._60_4_ = (uint)bVar6 * auVar150._60_4_ | (uint)!bVar6 * auVar158._60_4_;
              auVar146 = vfmadd231ps_avx512f(auVar146,auVar166,auVar141);
              auVar146 = vfmadd231ps_avx512f(auVar146,auVar166,auVar140);
              auVar148 = vfmadd213ps_avx512f(auVar148,auVar188,(undefined1  [64])afVar73);
              auVar158 = vmulps_avx512f(auVar146,auVar146);
              fVar192 = pfVar80[8];
              auVar150._4_4_ = fVar192;
              auVar150._0_4_ = fVar192;
              auVar150._8_4_ = fVar192;
              auVar150._12_4_ = fVar192;
              auVar150._16_4_ = fVar192;
              auVar150._20_4_ = fVar192;
              auVar150._24_4_ = fVar192;
              auVar150._28_4_ = fVar192;
              auVar150._32_4_ = fVar192;
              auVar150._36_4_ = fVar192;
              auVar150._40_4_ = fVar192;
              auVar150._44_4_ = fVar192;
              auVar150._48_4_ = fVar192;
              auVar150._52_4_ = fVar192;
              auVar150._56_4_ = fVar192;
              auVar150._60_4_ = fVar192;
              auVar150 = vsubps_avx512f(pauVar74[8],auVar150);
              auVar188 = vfmadd213ps_avx512f(auVar148,auVar151,auVar188);
              auVar148 = vminps_avx512f(auVar150,(undefined1  [64])afVar237);
              auVar148 = vmaxps_avx512f(auVar148,(undefined1  [64])afVar268);
              auVar150 = vfmadd213ps_avx512f(auVar160,auVar189,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar151 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar148,
                                             (undefined1  [64])afVar73);
              auVar160 = vrndscaleps_avx512f(auVar151,1);
              uVar20 = vcmpps_avx512f(auVar151,auVar160,1);
              auVar151 = vfmadd213ps_avx512f(auVar161,auVar149,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar161 = vfmadd213ps_avx512f(auVar146,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar146,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar150 = vfmadd213ps_avx512f(auVar150,auVar189,(undefined1  [64])afVar73);
              auVar164 = vsubps_avx512f(auVar160,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar167._0_4_ = (uint)bVar6 * auVar164._0_4_ | (uint)!bVar6 * auVar160._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar167._4_4_ = (uint)bVar6 * auVar164._4_4_ | (uint)!bVar6 * auVar160._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar167._8_4_ = (uint)bVar6 * auVar164._8_4_ | (uint)!bVar6 * auVar160._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar167._12_4_ = (uint)bVar6 * auVar164._12_4_ | (uint)!bVar6 * auVar160._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar167._16_4_ = (uint)bVar6 * auVar164._16_4_ | (uint)!bVar6 * auVar160._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar167._20_4_ = (uint)bVar6 * auVar164._20_4_ | (uint)!bVar6 * auVar160._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar167._24_4_ = (uint)bVar6 * auVar164._24_4_ | (uint)!bVar6 * auVar160._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar167._28_4_ = (uint)bVar6 * auVar164._28_4_ | (uint)!bVar6 * auVar160._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar167._32_4_ = (uint)bVar6 * auVar164._32_4_ | (uint)!bVar6 * auVar160._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar167._36_4_ = (uint)bVar6 * auVar164._36_4_ | (uint)!bVar6 * auVar160._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar167._40_4_ = (uint)bVar6 * auVar164._40_4_ | (uint)!bVar6 * auVar160._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar167._44_4_ = (uint)bVar6 * auVar164._44_4_ | (uint)!bVar6 * auVar160._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar167._48_4_ = (uint)bVar6 * auVar164._48_4_ | (uint)!bVar6 * auVar160._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar167._52_4_ = (uint)bVar6 * auVar164._52_4_ | (uint)!bVar6 * auVar160._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar167._56_4_ = (uint)bVar6 * auVar164._56_4_ | (uint)!bVar6 * auVar160._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar167._60_4_ = (uint)bVar6 * auVar164._60_4_ | (uint)!bVar6 * auVar160._60_4_;
              auVar148 = vfmadd231ps_avx512f(auVar148,auVar167,auVar141);
              auVar148 = vfmadd231ps_avx512f(auVar148,auVar167,auVar140);
              auVar189 = vfmadd213ps_avx512f(auVar150,auVar157,auVar189);
              auVar150 = vmulps_avx512f(auVar148,auVar148);
              auVar157 = vfmadd213ps_avx512f(auVar148,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar160 = vfmadd213ps_avx512f(auVar151,auVar149,(undefined1  [64])afVar73);
              auVar164 = vfmadd213ps_avx512f(auVar157,auVar148,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              fVar192 = pfVar80[9];
              auVar151._4_4_ = fVar192;
              auVar151._0_4_ = fVar192;
              auVar151._8_4_ = fVar192;
              auVar151._12_4_ = fVar192;
              auVar151._16_4_ = fVar192;
              auVar151._20_4_ = fVar192;
              auVar151._24_4_ = fVar192;
              auVar151._28_4_ = fVar192;
              auVar151._32_4_ = fVar192;
              auVar151._36_4_ = fVar192;
              auVar151._40_4_ = fVar192;
              auVar151._44_4_ = fVar192;
              auVar151._48_4_ = fVar192;
              auVar151._52_4_ = fVar192;
              auVar151._56_4_ = fVar192;
              auVar151._60_4_ = fVar192;
              auVar151 = vsubps_avx512f(pauVar74[9],auVar151);
              auVar149 = vfmadd213ps_avx512f(auVar160,auVar162,auVar149);
              auVar151 = vminps_avx512f(auVar151,(undefined1  [64])afVar237);
              auVar151 = vmaxps_avx512f(auVar151,(undefined1  [64])afVar268);
              auVar160 = vfmadd213ps_avx512f(auVar161,auVar146,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar157 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar151,
                                             (undefined1  [64])afVar73);
              auVar161 = vrndscaleps_avx512f(auVar157,1);
              uVar20 = vcmpps_avx512f(auVar157,auVar161,1);
              auVar147 = vfmadd213ps_avx512f(auVar147,auVar144,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar157 = vsubps_avx512f(auVar161,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar168._0_4_ = (uint)bVar6 * auVar157._0_4_ | (uint)!bVar6 * auVar161._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar168._4_4_ = (uint)bVar6 * auVar157._4_4_ | (uint)!bVar6 * auVar161._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar168._8_4_ = (uint)bVar6 * auVar157._8_4_ | (uint)!bVar6 * auVar161._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar168._12_4_ = (uint)bVar6 * auVar157._12_4_ | (uint)!bVar6 * auVar161._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar168._16_4_ = (uint)bVar6 * auVar157._16_4_ | (uint)!bVar6 * auVar161._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar168._20_4_ = (uint)bVar6 * auVar157._20_4_ | (uint)!bVar6 * auVar161._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar168._24_4_ = (uint)bVar6 * auVar157._24_4_ | (uint)!bVar6 * auVar161._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar168._28_4_ = (uint)bVar6 * auVar157._28_4_ | (uint)!bVar6 * auVar161._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar168._32_4_ = (uint)bVar6 * auVar157._32_4_ | (uint)!bVar6 * auVar161._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar168._36_4_ = (uint)bVar6 * auVar157._36_4_ | (uint)!bVar6 * auVar161._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar168._40_4_ = (uint)bVar6 * auVar157._40_4_ | (uint)!bVar6 * auVar161._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar168._44_4_ = (uint)bVar6 * auVar157._44_4_ | (uint)!bVar6 * auVar161._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar168._48_4_ = (uint)bVar6 * auVar157._48_4_ | (uint)!bVar6 * auVar161._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar168._52_4_ = (uint)bVar6 * auVar157._52_4_ | (uint)!bVar6 * auVar161._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar168._56_4_ = (uint)bVar6 * auVar157._56_4_ | (uint)!bVar6 * auVar161._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar168._60_4_ = (uint)bVar6 * auVar157._60_4_ | (uint)!bVar6 * auVar161._60_4_;
              auVar151 = vfmadd231ps_avx512f(auVar151,auVar168,auVar141);
              auVar151 = vfmadd231ps_avx512f(auVar151,auVar168,auVar140);
              auVar147 = vfmadd213ps_avx512f(auVar147,auVar144,(undefined1  [64])afVar73);
              auVar161 = vmulps_avx512f(auVar151,auVar151);
              fVar192 = pfVar80[10];
              auVar157._4_4_ = fVar192;
              auVar157._0_4_ = fVar192;
              auVar157._8_4_ = fVar192;
              auVar157._12_4_ = fVar192;
              auVar157._16_4_ = fVar192;
              auVar157._20_4_ = fVar192;
              auVar157._24_4_ = fVar192;
              auVar157._28_4_ = fVar192;
              auVar157._32_4_ = fVar192;
              auVar157._36_4_ = fVar192;
              auVar157._40_4_ = fVar192;
              auVar157._44_4_ = fVar192;
              auVar157._48_4_ = fVar192;
              auVar157._52_4_ = fVar192;
              auVar157._56_4_ = fVar192;
              auVar157._60_4_ = fVar192;
              auVar157 = vsubps_avx512f(pauVar74[10],auVar157);
              auVar144 = vfmadd213ps_avx512f(auVar147,auVar156,auVar144);
              auVar156 = vminps_avx512f(auVar157,(undefined1  [64])afVar237);
              auVar156 = vmaxps_avx512f(auVar156,(undefined1  [64])afVar268);
              auVar147 = vfmadd213ps_avx512f(auVar164,auVar148,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar157 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar156,
                                             (undefined1  [64])afVar73);
              auVar162 = vrndscaleps_avx512f(auVar157,1);
              uVar20 = vcmpps_avx512f(auVar157,auVar162,1);
              auVar157 = vfmadd213ps_avx512f(auVar160,auVar146,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar160 = vfmadd213ps_avx512f(auVar151,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar151,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar157 = vfmadd213ps_avx512f(auVar157,auVar146,(undefined1  [64])afVar73);
              auVar164 = vfmadd213ps_avx512f(auVar160,auVar151,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar160 = vsubps_avx512f(auVar162,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar169._0_4_ = (uint)bVar6 * auVar160._0_4_ | (uint)!bVar6 * auVar162._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar169._4_4_ = (uint)bVar6 * auVar160._4_4_ | (uint)!bVar6 * auVar162._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar169._8_4_ = (uint)bVar6 * auVar160._8_4_ | (uint)!bVar6 * auVar162._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar169._12_4_ = (uint)bVar6 * auVar160._12_4_ | (uint)!bVar6 * auVar162._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar169._16_4_ = (uint)bVar6 * auVar160._16_4_ | (uint)!bVar6 * auVar162._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar169._20_4_ = (uint)bVar6 * auVar160._20_4_ | (uint)!bVar6 * auVar162._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar169._24_4_ = (uint)bVar6 * auVar160._24_4_ | (uint)!bVar6 * auVar162._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar169._28_4_ = (uint)bVar6 * auVar160._28_4_ | (uint)!bVar6 * auVar162._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar169._32_4_ = (uint)bVar6 * auVar160._32_4_ | (uint)!bVar6 * auVar162._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar169._36_4_ = (uint)bVar6 * auVar160._36_4_ | (uint)!bVar6 * auVar162._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar169._40_4_ = (uint)bVar6 * auVar160._40_4_ | (uint)!bVar6 * auVar162._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar169._44_4_ = (uint)bVar6 * auVar160._44_4_ | (uint)!bVar6 * auVar162._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar169._48_4_ = (uint)bVar6 * auVar160._48_4_ | (uint)!bVar6 * auVar162._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar169._52_4_ = (uint)bVar6 * auVar160._52_4_ | (uint)!bVar6 * auVar162._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar169._56_4_ = (uint)bVar6 * auVar160._56_4_ | (uint)!bVar6 * auVar162._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar169._60_4_ = (uint)bVar6 * auVar160._60_4_ | (uint)!bVar6 * auVar162._60_4_;
              auVar156 = vfmadd231ps_avx512f(auVar156,auVar169,auVar141);
              auVar146 = vfmadd213ps_avx512f(auVar157,auVar158,auVar146);
              auVar156 = vfmadd231ps_avx512f(auVar156,auVar169,auVar140);
              auVar157 = vmulps_avx512f(auVar156,auVar156);
              auVar147 = vfmadd213ps_avx512f(auVar147,auVar148,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar158 = vfmadd213ps_avx512f(auVar156,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              fVar192 = pfVar80[0xb];
              auVar160._4_4_ = fVar192;
              auVar160._0_4_ = fVar192;
              auVar160._8_4_ = fVar192;
              auVar160._12_4_ = fVar192;
              auVar160._16_4_ = fVar192;
              auVar160._20_4_ = fVar192;
              auVar160._24_4_ = fVar192;
              auVar160._28_4_ = fVar192;
              auVar160._32_4_ = fVar192;
              auVar160._36_4_ = fVar192;
              auVar160._40_4_ = fVar192;
              auVar160._44_4_ = fVar192;
              auVar160._48_4_ = fVar192;
              auVar160._52_4_ = fVar192;
              auVar160._56_4_ = fVar192;
              auVar160._60_4_ = fVar192;
              auVar160 = vsubps_avx512f(pauVar74[0xb],auVar160);
              auVar147 = vfmadd213ps_avx512f(auVar147,auVar148,(undefined1  [64])afVar73);
              auVar158 = vfmadd213ps_avx512f(auVar158,auVar156,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar160 = vminps_avx512f(auVar160,(undefined1  [64])afVar237);
              auVar160 = vmaxps_avx512f(auVar160,(undefined1  [64])afVar268);
              auVar147 = vfmadd213ps_avx512f(auVar147,auVar150,auVar148);
              auVar148 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar160,
                                             (undefined1  [64])afVar73);
              auVar150 = vrndscaleps_avx512f(auVar148,1);
              auVar158 = vfmadd213ps_avx512f(auVar158,auVar156,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              uVar20 = vcmpps_avx512f(auVar148,auVar150,1);
              auVar148 = vsubps_avx512f(auVar150,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar170._0_4_ = (uint)bVar6 * auVar148._0_4_ | (uint)!bVar6 * auVar150._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar170._4_4_ = (uint)bVar6 * auVar148._4_4_ | (uint)!bVar6 * auVar150._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar170._8_4_ = (uint)bVar6 * auVar148._8_4_ | (uint)!bVar6 * auVar150._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar170._12_4_ = (uint)bVar6 * auVar148._12_4_ | (uint)!bVar6 * auVar150._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar170._16_4_ = (uint)bVar6 * auVar148._16_4_ | (uint)!bVar6 * auVar150._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar170._20_4_ = (uint)bVar6 * auVar148._20_4_ | (uint)!bVar6 * auVar150._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar170._24_4_ = (uint)bVar6 * auVar148._24_4_ | (uint)!bVar6 * auVar150._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar170._28_4_ = (uint)bVar6 * auVar148._28_4_ | (uint)!bVar6 * auVar150._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar170._32_4_ = (uint)bVar6 * auVar148._32_4_ | (uint)!bVar6 * auVar150._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar170._36_4_ = (uint)bVar6 * auVar148._36_4_ | (uint)!bVar6 * auVar150._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar170._40_4_ = (uint)bVar6 * auVar148._40_4_ | (uint)!bVar6 * auVar150._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar170._44_4_ = (uint)bVar6 * auVar148._44_4_ | (uint)!bVar6 * auVar150._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar170._48_4_ = (uint)bVar6 * auVar148._48_4_ | (uint)!bVar6 * auVar150._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar170._52_4_ = (uint)bVar6 * auVar148._52_4_ | (uint)!bVar6 * auVar150._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar170._56_4_ = (uint)bVar6 * auVar148._56_4_ | (uint)!bVar6 * auVar150._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar170._60_4_ = (uint)bVar6 * auVar148._60_4_ | (uint)!bVar6 * auVar150._60_4_;
              auVar148 = vfmadd231ps_avx512f(auVar160,auVar170,auVar141);
              auVar150 = vfmadd213ps_avx512f(auVar164,auVar151,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar148 = vfmadd231ps_avx512f(auVar148,auVar170,auVar140);
              fVar192 = pfVar80[0xc];
              auVar164._4_4_ = fVar192;
              auVar164._0_4_ = fVar192;
              auVar164._8_4_ = fVar192;
              auVar164._12_4_ = fVar192;
              auVar164._16_4_ = fVar192;
              auVar164._20_4_ = fVar192;
              auVar164._24_4_ = fVar192;
              auVar164._28_4_ = fVar192;
              auVar164._32_4_ = fVar192;
              auVar164._36_4_ = fVar192;
              auVar164._40_4_ = fVar192;
              auVar164._44_4_ = fVar192;
              auVar164._48_4_ = fVar192;
              auVar164._52_4_ = fVar192;
              auVar164._56_4_ = fVar192;
              auVar164._60_4_ = fVar192;
              auVar160 = vsubps_avx512f(pauVar74[0xc],auVar164);
              auVar150 = vfmadd213ps_avx512f(auVar150,auVar151,(undefined1  [64])afVar73);
              auVar162 = vmulps_avx512f(auVar148,auVar148);
              auVar160 = vminps_avx512f(auVar160,(undefined1  [64])afVar237);
              auVar160 = vmaxps_avx512f(auVar160,(undefined1  [64])afVar268);
              auVar150 = vfmadd213ps_avx512f(auVar150,auVar161,auVar151);
              auVar151 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar160,
                                             (undefined1  [64])afVar73);
              auVar161 = vrndscaleps_avx512f(auVar151,1);
              auVar158 = vfmadd213ps_avx512f(auVar158,auVar156,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              uVar20 = vcmpps_avx512f(auVar151,auVar161,1);
              auVar151 = vfmadd213ps_avx512f(auVar148,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar158 = vfmadd213ps_avx512f(auVar158,auVar156,(undefined1  [64])afVar73);
              auVar151 = vfmadd213ps_avx512f(auVar151,auVar148,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar151 = vfmadd213ps_avx512f(auVar151,auVar148,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar164 = vsubps_avx512f(auVar161,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar171._0_4_ = (uint)bVar6 * auVar164._0_4_ | (uint)!bVar6 * auVar161._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar171._4_4_ = (uint)bVar6 * auVar164._4_4_ | (uint)!bVar6 * auVar161._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar171._8_4_ = (uint)bVar6 * auVar164._8_4_ | (uint)!bVar6 * auVar161._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar171._12_4_ = (uint)bVar6 * auVar164._12_4_ | (uint)!bVar6 * auVar161._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar171._16_4_ = (uint)bVar6 * auVar164._16_4_ | (uint)!bVar6 * auVar161._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar171._20_4_ = (uint)bVar6 * auVar164._20_4_ | (uint)!bVar6 * auVar161._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar171._24_4_ = (uint)bVar6 * auVar164._24_4_ | (uint)!bVar6 * auVar161._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar171._28_4_ = (uint)bVar6 * auVar164._28_4_ | (uint)!bVar6 * auVar161._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar171._32_4_ = (uint)bVar6 * auVar164._32_4_ | (uint)!bVar6 * auVar161._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar171._36_4_ = (uint)bVar6 * auVar164._36_4_ | (uint)!bVar6 * auVar161._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar171._40_4_ = (uint)bVar6 * auVar164._40_4_ | (uint)!bVar6 * auVar161._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar171._44_4_ = (uint)bVar6 * auVar164._44_4_ | (uint)!bVar6 * auVar161._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar171._48_4_ = (uint)bVar6 * auVar164._48_4_ | (uint)!bVar6 * auVar161._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar171._52_4_ = (uint)bVar6 * auVar164._52_4_ | (uint)!bVar6 * auVar161._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar171._56_4_ = (uint)bVar6 * auVar164._56_4_ | (uint)!bVar6 * auVar161._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar171._60_4_ = (uint)bVar6 * auVar164._60_4_ | (uint)!bVar6 * auVar161._60_4_;
              auVar156 = vfmadd213ps_avx512f(auVar158,auVar157,auVar156);
              auVar157 = vfmadd231ps_avx512f(auVar160,auVar171,auVar141);
              auVar157 = vfmadd231ps_avx512f(auVar157,auVar171,auVar140);
              auVar158 = vmulps_avx512f(auVar157,auVar157);
              auVar151 = vfmadd213ps_avx512f(auVar151,auVar148,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar160 = vfmadd213ps_avx512f(auVar157,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar157,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar151 = vfmadd213ps_avx512f(auVar151,auVar148,(undefined1  [64])afVar73);
              fVar192 = pfVar80[0xd];
              auVar175._4_4_ = fVar192;
              auVar175._0_4_ = fVar192;
              auVar175._8_4_ = fVar192;
              auVar175._12_4_ = fVar192;
              auVar175._16_4_ = fVar192;
              auVar175._20_4_ = fVar192;
              auVar175._24_4_ = fVar192;
              auVar175._28_4_ = fVar192;
              auVar175._32_4_ = fVar192;
              auVar175._36_4_ = fVar192;
              auVar175._40_4_ = fVar192;
              auVar175._44_4_ = fVar192;
              auVar175._48_4_ = fVar192;
              auVar175._52_4_ = fVar192;
              auVar175._56_4_ = fVar192;
              auVar175._60_4_ = fVar192;
              auVar161 = vsubps_avx512f(pauVar74[0xd],auVar175);
              auVar161 = vminps_avx512f(auVar161,(undefined1  [64])afVar237);
              auVar148 = vfmadd213ps_avx512f(auVar151,auVar162,auVar148);
              auVar151 = vmaxps_avx512f(auVar161,(undefined1  [64])afVar268);
              auVar161 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar151,
                                             (undefined1  [64])afVar73);
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar157,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar162 = vrndscaleps_avx512f(auVar161,1);
              uVar20 = vcmpps_avx512f(auVar161,auVar162,1);
              auVar161 = vsubps_avx512f(auVar162,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar172._0_4_ = (uint)bVar6 * auVar161._0_4_ | (uint)!bVar6 * auVar162._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar172._4_4_ = (uint)bVar6 * auVar161._4_4_ | (uint)!bVar6 * auVar162._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar172._8_4_ = (uint)bVar6 * auVar161._8_4_ | (uint)!bVar6 * auVar162._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar172._12_4_ = (uint)bVar6 * auVar161._12_4_ | (uint)!bVar6 * auVar162._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar172._16_4_ = (uint)bVar6 * auVar161._16_4_ | (uint)!bVar6 * auVar162._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar172._20_4_ = (uint)bVar6 * auVar161._20_4_ | (uint)!bVar6 * auVar162._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar172._24_4_ = (uint)bVar6 * auVar161._24_4_ | (uint)!bVar6 * auVar162._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar172._28_4_ = (uint)bVar6 * auVar161._28_4_ | (uint)!bVar6 * auVar162._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar172._32_4_ = (uint)bVar6 * auVar161._32_4_ | (uint)!bVar6 * auVar162._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar172._36_4_ = (uint)bVar6 * auVar161._36_4_ | (uint)!bVar6 * auVar162._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar172._40_4_ = (uint)bVar6 * auVar161._40_4_ | (uint)!bVar6 * auVar162._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar172._44_4_ = (uint)bVar6 * auVar161._44_4_ | (uint)!bVar6 * auVar162._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar172._48_4_ = (uint)bVar6 * auVar161._48_4_ | (uint)!bVar6 * auVar162._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar172._52_4_ = (uint)bVar6 * auVar161._52_4_ | (uint)!bVar6 * auVar162._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar172._56_4_ = (uint)bVar6 * auVar161._56_4_ | (uint)!bVar6 * auVar162._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar172._60_4_ = (uint)bVar6 * auVar161._60_4_ | (uint)!bVar6 * auVar162._60_4_;
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar157,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar151 = vfmadd231ps_avx512f(auVar151,auVar172,auVar141);
              fVar192 = pfVar80[0xe];
              auVar176._4_4_ = fVar192;
              auVar176._0_4_ = fVar192;
              auVar176._8_4_ = fVar192;
              auVar176._12_4_ = fVar192;
              auVar176._16_4_ = fVar192;
              auVar176._20_4_ = fVar192;
              auVar176._24_4_ = fVar192;
              auVar176._28_4_ = fVar192;
              auVar176._32_4_ = fVar192;
              auVar176._36_4_ = fVar192;
              auVar176._40_4_ = fVar192;
              auVar176._44_4_ = fVar192;
              auVar176._48_4_ = fVar192;
              auVar176._52_4_ = fVar192;
              auVar176._56_4_ = fVar192;
              auVar176._60_4_ = fVar192;
              auVar161 = vsubps_avx512f(pauVar74[0xe],auVar176);
              auVar160 = vfmadd213ps_avx512f(auVar160,auVar157,(undefined1  [64])afVar73);
              auVar151 = vfmadd231ps_avx512f(auVar151,auVar172,auVar140);
              auVar161 = vminps_avx512f(auVar161,(undefined1  [64])afVar237);
              auVar161 = vmaxps_avx512f(auVar161,(undefined1  [64])afVar268);
              auVar157 = vfmadd213ps_avx512f(auVar160,auVar158,auVar157);
              auVar158 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar161,
                                             (undefined1  [64])afVar73);
              auVar160 = vrndscaleps_avx512f(auVar158,1);
              auVar162 = vmulps_avx512f(auVar151,auVar151);
              uVar20 = vcmpps_avx512f(auVar158,auVar160,1);
              auVar158 = vfmadd213ps_avx512f(auVar151,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar158 = vfmadd213ps_avx512f(auVar158,auVar151,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar158 = vfmadd213ps_avx512f(auVar158,auVar151,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar158 = vfmadd213ps_avx512f(auVar158,auVar151,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar158 = vfmadd213ps_avx512f(auVar158,auVar151,(undefined1  [64])afVar73);
              auVar151 = vfmadd213ps_avx512f(auVar158,auVar162,auVar151);
              auVar158 = vsubps_avx512f(auVar160,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar173._0_4_ = (uint)bVar6 * auVar158._0_4_ | (uint)!bVar6 * auVar160._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar173._4_4_ = (uint)bVar6 * auVar158._4_4_ | (uint)!bVar6 * auVar160._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar173._8_4_ = (uint)bVar6 * auVar158._8_4_ | (uint)!bVar6 * auVar160._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar173._12_4_ = (uint)bVar6 * auVar158._12_4_ | (uint)!bVar6 * auVar160._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar173._16_4_ = (uint)bVar6 * auVar158._16_4_ | (uint)!bVar6 * auVar160._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar173._20_4_ = (uint)bVar6 * auVar158._20_4_ | (uint)!bVar6 * auVar160._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar173._24_4_ = (uint)bVar6 * auVar158._24_4_ | (uint)!bVar6 * auVar160._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar173._28_4_ = (uint)bVar6 * auVar158._28_4_ | (uint)!bVar6 * auVar160._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar173._32_4_ = (uint)bVar6 * auVar158._32_4_ | (uint)!bVar6 * auVar160._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar173._36_4_ = (uint)bVar6 * auVar158._36_4_ | (uint)!bVar6 * auVar160._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar173._40_4_ = (uint)bVar6 * auVar158._40_4_ | (uint)!bVar6 * auVar160._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar173._44_4_ = (uint)bVar6 * auVar158._44_4_ | (uint)!bVar6 * auVar160._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar173._48_4_ = (uint)bVar6 * auVar158._48_4_ | (uint)!bVar6 * auVar160._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar173._52_4_ = (uint)bVar6 * auVar158._52_4_ | (uint)!bVar6 * auVar160._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar173._56_4_ = (uint)bVar6 * auVar158._56_4_ | (uint)!bVar6 * auVar160._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar173._60_4_ = (uint)bVar6 * auVar158._60_4_ | (uint)!bVar6 * auVar160._60_4_;
              auVar158 = vfmadd231ps_avx512f(auVar161,auVar173,auVar141);
              auVar158 = vfmadd231ps_avx512f(auVar158,auVar173,auVar140);
              auVar160 = vmulps_avx512f(auVar158,auVar158);
              auVar161 = vfmadd213ps_avx512f(auVar158,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar158,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar158,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar158,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar158,(undefined1  [64])afVar73);
              auVar158 = vfmadd213ps_avx512f(auVar161,auVar160,auVar158);
              fVar192 = pfVar80[0xf];
              auVar177._4_4_ = fVar192;
              auVar177._0_4_ = fVar192;
              auVar177._8_4_ = fVar192;
              auVar177._12_4_ = fVar192;
              auVar177._16_4_ = fVar192;
              auVar177._20_4_ = fVar192;
              auVar177._24_4_ = fVar192;
              auVar177._28_4_ = fVar192;
              auVar177._32_4_ = fVar192;
              auVar177._36_4_ = fVar192;
              auVar177._40_4_ = fVar192;
              auVar177._44_4_ = fVar192;
              auVar177._48_4_ = fVar192;
              auVar177._52_4_ = fVar192;
              auVar177._56_4_ = fVar192;
              auVar177._60_4_ = fVar192;
              auVar160 = vsubps_avx512f(pauVar74[0xf],auVar177);
              auVar160 = vminps_avx512f(auVar160,(undefined1  [64])afVar237);
              auVar160 = vmaxps_avx512f(auVar160,(undefined1  [64])afVar268);
              auVar161 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar160,
                                             (undefined1  [64])afVar73);
              auVar162 = vrndscaleps_avx512f(auVar161,1);
              uVar20 = vcmpps_avx512f(auVar161,auVar162,1);
              auVar161 = vsubps_avx512f(auVar162,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar174._0_4_ = (uint)bVar6 * auVar161._0_4_ | (uint)!bVar6 * auVar162._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar174._4_4_ = (uint)bVar6 * auVar161._4_4_ | (uint)!bVar6 * auVar162._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar174._8_4_ = (uint)bVar6 * auVar161._8_4_ | (uint)!bVar6 * auVar162._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar174._12_4_ = (uint)bVar6 * auVar161._12_4_ | (uint)!bVar6 * auVar162._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar174._16_4_ = (uint)bVar6 * auVar161._16_4_ | (uint)!bVar6 * auVar162._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar174._20_4_ = (uint)bVar6 * auVar161._20_4_ | (uint)!bVar6 * auVar162._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar174._24_4_ = (uint)bVar6 * auVar161._24_4_ | (uint)!bVar6 * auVar162._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar174._28_4_ = (uint)bVar6 * auVar161._28_4_ | (uint)!bVar6 * auVar162._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar174._32_4_ = (uint)bVar6 * auVar161._32_4_ | (uint)!bVar6 * auVar162._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar174._36_4_ = (uint)bVar6 * auVar161._36_4_ | (uint)!bVar6 * auVar162._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar174._40_4_ = (uint)bVar6 * auVar161._40_4_ | (uint)!bVar6 * auVar162._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar174._44_4_ = (uint)bVar6 * auVar161._44_4_ | (uint)!bVar6 * auVar162._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar174._48_4_ = (uint)bVar6 * auVar161._48_4_ | (uint)!bVar6 * auVar162._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar174._52_4_ = (uint)bVar6 * auVar161._52_4_ | (uint)!bVar6 * auVar162._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar174._56_4_ = (uint)bVar6 * auVar161._56_4_ | (uint)!bVar6 * auVar162._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar174._60_4_ = (uint)bVar6 * auVar161._60_4_ | (uint)!bVar6 * auVar162._60_4_;
              auVar160 = vfmadd231ps_avx512f(auVar160,auVar174,auVar141);
              auVar160 = vfmadd231ps_avx512f(auVar160,auVar174,auVar140);
              auVar161 = vfmadd213ps_avx512f(auVar160,(undefined1  [64])::_ps512_cephes_exp_p0,
                                             (undefined1  [64])::_ps512_cephes_exp_p1);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar160,
                                             (undefined1  [64])::_ps512_cephes_exp_p2);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar160,
                                             (undefined1  [64])::_ps512_cephes_exp_p3);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar160,
                                             (undefined1  [64])::_ps512_cephes_exp_p4);
              auVar161 = vfmadd213ps_avx512f(auVar161,auVar160,(undefined1  [64])afVar73);
              auVar162 = vmulps_avx512f(auVar160,auVar160);
              auVar160 = vfmadd213ps_avx512f(auVar161,auVar162,auVar160);
              auVar142 = vaddps_avx512f((undefined1  [64])afVar270,auVar142);
              auVar161 = vcvttps2dq_avx512f(auVar182);
              auVar162 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
              auVar161 = vpaddd_avx512f(auVar161,auVar162);
              auVar161 = vpslld_avx512f(auVar161,0x17);
              auVar143 = vaddps_avx512f((undefined1  [64])afVar270,auVar143);
              auVar164 = vcvttps2dq_avx512f(auVar183);
              auVar164 = vpaddd_avx512f(auVar164,auVar162);
              auVar164 = vpslld_avx512f(auVar164,0x17);
              auVar145 = vaddps_avx512f(auVar145,(undefined1  [64])afVar270);
              auVar175 = vcvttps2dq_avx512f(auVar185);
              auVar175 = vpaddd_avx512f(auVar175,auVar162);
              auVar175 = vpslld_avx512f(auVar175,0x17);
              auVar188 = vaddps_avx512f(auVar188,(undefined1  [64])afVar270);
              auVar176 = vcvttps2dq_avx512f(auVar186);
              auVar176 = vpaddd_avx512f(auVar176,auVar162);
              auVar176 = vpslld_avx512f(auVar176,0x17);
              auVar189 = vaddps_avx512f(auVar189,(undefined1  [64])afVar270);
              auVar177 = vcvttps2dq_avx512f(auVar159);
              auVar177 = vpaddd_avx512f(auVar177,auVar162);
              auVar177 = vpslld_avx512f(auVar177,0x17);
              auVar142 = vmulps_avx512f(auVar142,auVar161);
              auVar149 = vaddps_avx512f(auVar149,(undefined1  [64])afVar270);
              auVar161 = vcvttps2dq_avx512f(auVar163);
              auVar161 = vpaddd_avx512f(auVar161,auVar162);
              auVar143 = vmulps_avx512f(auVar143,auVar164);
              auVar161 = vpslld_avx512f(auVar161,0x17);
              auVar144 = vaddps_avx512f(auVar144,(undefined1  [64])afVar270);
              auVar164 = vcvttps2dq_avx512f(auVar165);
              auVar145 = vmulps_avx512f(auVar145,auVar175);
              auVar164 = vpaddd_avx512f(auVar164,auVar162);
              auVar164 = vpslld_avx512f(auVar164,0x17);
              auVar146 = vaddps_avx512f(auVar146,(undefined1  [64])afVar270);
              auVar188 = vmulps_avx512f(auVar188,auVar176);
              auVar175 = vcvttps2dq_avx512f(auVar166);
              auVar175 = vpaddd_avx512f(auVar175,auVar162);
              auVar175 = vpslld_avx512f(auVar175,0x17);
              auVar189 = vmulps_avx512f(auVar189,auVar177);
              auVar147 = vaddps_avx512f(auVar147,(undefined1  [64])afVar270);
              auVar176 = vcvttps2dq_avx512f(auVar167);
              auVar176 = vpaddd_avx512f(auVar176,auVar162);
              auVar149 = vmulps_avx512f(auVar149,auVar161);
              auVar161 = vpslld_avx512f(auVar176,0x17);
              auVar150 = vaddps_avx512f(auVar150,(undefined1  [64])afVar270);
              auVar176 = vcvttps2dq_avx512f(auVar168);
              auVar144 = vmulps_avx512f(auVar144,auVar164);
              auVar164 = vpaddd_avx512f(auVar176,auVar162);
              auVar164 = vpslld_avx512f(auVar164,0x17);
              auVar156 = vaddps_avx512f(auVar156,(undefined1  [64])afVar270);
              auVar146 = vmulps_avx512f(auVar146,auVar175);
              auVar175 = vcvttps2dq_avx512f(auVar169);
              auVar175 = vpaddd_avx512f(auVar175,auVar162);
              auVar175 = vpslld_avx512f(auVar175,0x17);
              auVar147 = vmulps_avx512f(auVar147,auVar161);
              auVar148 = vaddps_avx512f(auVar148,(undefined1  [64])afVar270);
              auVar161 = vcvttps2dq_avx512f(auVar170);
              auVar161 = vpaddd_avx512f(auVar161,auVar162);
              auVar150 = vmulps_avx512f(auVar150,auVar164);
              auVar161 = vpslld_avx512f(auVar161,0x17);
              auVar157 = vaddps_avx512f(auVar157,(undefined1  [64])afVar270);
              auVar164 = vcvttps2dq_avx512f(auVar171);
              auVar156 = vmulps_avx512f(auVar156,auVar175);
              auVar164 = vpaddd_avx512f(auVar164,auVar162);
              auVar164 = vpslld_avx512f(auVar164,0x17);
              auVar151 = vaddps_avx512f(auVar151,(undefined1  [64])afVar270);
              auVar148 = vmulps_avx512f(auVar148,auVar161);
              auVar161 = vcvttps2dq_avx512f(auVar172);
              auVar161 = vpaddd_avx512f(auVar161,auVar162);
              auVar161 = vpslld_avx512f(auVar161,0x17);
              auVar157 = vmulps_avx512f(auVar157,auVar164);
              auVar158 = vaddps_avx512f(auVar158,(undefined1  [64])afVar270);
              auVar164 = vcvttps2dq_avx512f(auVar173);
              auVar164 = vpaddd_avx512f(auVar164,auVar162);
              auVar151 = vmulps_avx512f(auVar151,auVar161);
              auVar161 = vpslld_avx512f(auVar164,0x17);
              auVar160 = vaddps_avx512f(auVar160,(undefined1  [64])afVar270);
              auVar164 = vcvttps2dq_avx512f(auVar174);
              auVar158 = vmulps_avx512f(auVar158,auVar161);
              auVar161 = vpaddd_avx512f(auVar164,auVar162);
              auVar161 = vpslld_avx512f(auVar161,0x17);
              auVar160 = vmulps_avx512f(auVar160,auVar161);
              *pauVar74 = auVar142;
              pauVar74[1] = auVar143;
              pauVar74[2] = auVar145;
              pauVar74[3] = auVar188;
              pauVar74[4] = auVar189;
              pauVar74[5] = auVar149;
              pauVar74[6] = auVar144;
              pauVar74[7] = auVar146;
              pauVar74[8] = auVar147;
              pauVar74[9] = auVar150;
              pauVar74[10] = auVar156;
              pauVar74[0xb] = auVar148;
              pauVar74[0xc] = auVar157;
              pauVar74[0xd] = auVar151;
              pauVar74[0xe] = auVar158;
              pauVar74[0xf] = auVar160;
              afVar268 = ::_ps512_exp_lo;
              auVar161 = vunpcklps_avx512f(auVar142,auVar143);
              auVar142 = vunpckhps_avx512f(auVar142,auVar143);
              auVar143 = vunpcklps_avx512f(auVar145,auVar188);
              auVar145 = vunpckhps_avx512f(auVar145,auVar188);
              auVar142 = vaddps_avx512f(auVar161,auVar142);
              auVar143 = vaddps_avx512f(auVar143,auVar145);
              auVar145 = vunpcklps_avx512f(auVar189,auVar149);
              auVar188 = vunpckhps_avx512f(auVar189,auVar149);
              auVar145 = vaddps_avx512f(auVar145,auVar188);
              auVar188 = vunpcklps_avx512f(auVar144,auVar146);
              auVar144 = vunpckhps_avx512f(auVar144,auVar146);
              auVar189 = vunpcklps_avx512f(auVar147,auVar150);
              auVar144 = vaddps_avx512f(auVar188,auVar144);
              auVar188 = vunpckhps_avx512f(auVar147,auVar150);
              auVar149 = vunpcklps_avx512f(auVar156,auVar148);
              auVar156 = vunpckhps_avx512f(auVar156,auVar148);
              auVar188 = vaddps_avx512f(auVar189,auVar188);
              auVar189 = vaddps_avx512f(auVar149,auVar156);
              auVar156 = vunpcklps_avx512f(auVar157,auVar151);
              auVar149 = vunpckhps_avx512f(auVar157,auVar151);
              auVar156 = vaddps_avx512f(auVar156,auVar149);
              auVar149 = vunpcklps_avx512f(auVar158,auVar160);
              auVar146 = vunpckhps_avx512f(auVar158,auVar160);
              auVar149 = vaddps_avx512f(auVar149,auVar146);
              auVar146 = vunpcklpd_avx512f(auVar142,auVar143);
              auVar142 = vunpckhpd_avx512f(auVar142,auVar143);
              auVar143 = vunpcklpd_avx512f(auVar145,auVar144);
              auVar144 = vunpckhpd_avx512f(auVar145,auVar144);
              auVar142 = vaddps_avx512f(auVar146,auVar142);
              auVar143 = vaddps_avx512f(auVar143,auVar144);
              auVar144 = vunpcklpd_avx512f(auVar188,auVar189);
              auVar145 = vunpckhpd_avx512f(auVar188,auVar189);
              auVar144 = vaddps_avx512f(auVar144,auVar145);
              auVar145 = vunpcklpd_avx512f(auVar156,auVar149);
              auVar188 = vunpckhpd_avx512f(auVar156,auVar149);
              auVar145 = vaddps_avx512f(auVar145,auVar188);
              auVar188 = vinsertf64x4_avx512f(auVar142,auVar143._0_32_,1);
              auVar142 = vshuff64x2_avx512f(auVar142,auVar143,0xee);
              auVar143 = vinsertf64x4_avx512f(auVar144,auVar145._0_32_,1);
              auVar144 = vshuff64x2_avx512f(auVar144,auVar145,0xee);
              auVar142 = vaddps_avx512f(auVar188,auVar142);
              auVar143 = vaddps_avx512f(auVar143,auVar144);
              auVar144 = vshuff64x2_avx512f(auVar142,auVar143,0xdd);
              auVar144 = vaddps_avx512f(auVar144,*pauVar78);
              auVar142 = vshuff64x2_avx512f(auVar142,auVar143,0x88);
              auVar142 = vaddps_avx512f(auVar144,auVar142);
              pauVar74 = pauVar74 + 0x10;
              *pauVar78 = auVar142;
              pfVar80 = pfVar80 + 0x10;
              pauVar78 = pauVar78 + 1;
              iVar79 = iVar79 + 0x10;
              afVar237 = afVar269;
            } while (iVar79 < size1);
            auVar142 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
            afVar237 = ::_ps512_cephes_exp_p0;
            afVar242 = ::_ps512_cephes_exp_p1;
            afVar246 = ::_ps512_cephes_exp_p2;
            afVar250 = ::_ps512_cephes_exp_p3;
            afVar255 = ::_ps512_cephes_exp_p4;
            uVar75 = size1 & 0xfffffff0;
          }
          if ((int)uVar75 < size1) {
            lVar83 = 0;
            do {
              fVar192 = pfVar80[lVar83];
              auVar58._4_4_ = fVar192;
              auVar58._0_4_ = fVar192;
              auVar58._8_4_ = fVar192;
              auVar58._12_4_ = fVar192;
              auVar58._16_4_ = fVar192;
              auVar58._20_4_ = fVar192;
              auVar58._24_4_ = fVar192;
              auVar58._28_4_ = fVar192;
              auVar58._32_4_ = fVar192;
              auVar58._36_4_ = fVar192;
              auVar58._40_4_ = fVar192;
              auVar58._44_4_ = fVar192;
              auVar58._48_4_ = fVar192;
              auVar58._52_4_ = fVar192;
              auVar58._56_4_ = fVar192;
              auVar58._60_4_ = fVar192;
              auVar143 = vsubps_avx512f(*pauVar74,auVar58);
              auVar143 = vminps_avx512f(auVar143,(undefined1  [64])afVar269);
              auVar143 = vmaxps_avx512f(auVar143,(undefined1  [64])afVar268);
              auVar144 = vfmadd213ps_avx512f((undefined1  [64])afVar272,auVar143,
                                             (undefined1  [64])afVar73);
              auVar145 = vrndscaleps_avx512f(auVar144,1);
              uVar20 = vcmpps_avx512f(auVar144,auVar145,1);
              auVar144 = vsubps_avx512f(auVar145,(undefined1  [64])afVar270);
              bVar6 = (bool)((byte)uVar20 & 1);
              auVar178._0_4_ = (uint)bVar6 * auVar144._0_4_ | (uint)!bVar6 * auVar145._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              auVar178._4_4_ = (uint)bVar6 * auVar144._4_4_ | (uint)!bVar6 * auVar145._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              auVar178._8_4_ = (uint)bVar6 * auVar144._8_4_ | (uint)!bVar6 * auVar145._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              auVar178._12_4_ = (uint)bVar6 * auVar144._12_4_ | (uint)!bVar6 * auVar145._12_4_;
              bVar6 = (bool)((byte)(uVar20 >> 4) & 1);
              auVar178._16_4_ = (uint)bVar6 * auVar144._16_4_ | (uint)!bVar6 * auVar145._16_4_;
              bVar6 = (bool)((byte)(uVar20 >> 5) & 1);
              auVar178._20_4_ = (uint)bVar6 * auVar144._20_4_ | (uint)!bVar6 * auVar145._20_4_;
              bVar6 = (bool)((byte)(uVar20 >> 6) & 1);
              auVar178._24_4_ = (uint)bVar6 * auVar144._24_4_ | (uint)!bVar6 * auVar145._24_4_;
              bVar6 = (bool)((byte)(uVar20 >> 7) & 1);
              auVar178._28_4_ = (uint)bVar6 * auVar144._28_4_ | (uint)!bVar6 * auVar145._28_4_;
              bVar6 = (bool)((byte)(uVar20 >> 8) & 1);
              auVar178._32_4_ = (uint)bVar6 * auVar144._32_4_ | (uint)!bVar6 * auVar145._32_4_;
              bVar6 = (bool)((byte)(uVar20 >> 9) & 1);
              auVar178._36_4_ = (uint)bVar6 * auVar144._36_4_ | (uint)!bVar6 * auVar145._36_4_;
              bVar6 = (bool)((byte)(uVar20 >> 10) & 1);
              auVar178._40_4_ = (uint)bVar6 * auVar144._40_4_ | (uint)!bVar6 * auVar145._40_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xb) & 1);
              auVar178._44_4_ = (uint)bVar6 * auVar144._44_4_ | (uint)!bVar6 * auVar145._44_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xc) & 1);
              auVar178._48_4_ = (uint)bVar6 * auVar144._48_4_ | (uint)!bVar6 * auVar145._48_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xd) & 1);
              auVar178._52_4_ = (uint)bVar6 * auVar144._52_4_ | (uint)!bVar6 * auVar145._52_4_;
              bVar6 = (bool)((byte)(uVar20 >> 0xe) & 1);
              auVar178._56_4_ = (uint)bVar6 * auVar144._56_4_ | (uint)!bVar6 * auVar145._56_4_;
              bVar6 = SUB81(uVar20 >> 0xf,0);
              auVar178._60_4_ = (uint)bVar6 * auVar144._60_4_ | (uint)!bVar6 * auVar145._60_4_;
              auVar143 = vfmadd231ps_avx512f(auVar143,auVar178,auVar141);
              auVar143 = vfmadd231ps_avx512f(auVar143,auVar178,auVar140);
              auVar144 = vmulps_avx512f(auVar143,auVar143);
              auVar145 = vfmadd213ps_avx512f(auVar143,(undefined1  [64])afVar237,
                                             (undefined1  [64])afVar242);
              auVar145 = vfmadd213ps_avx512f(auVar145,auVar143,(undefined1  [64])afVar246);
              auVar145 = vfmadd213ps_avx512f(auVar145,auVar143,(undefined1  [64])afVar250);
              auVar145 = vfmadd213ps_avx512f(auVar145,auVar143,(undefined1  [64])afVar255);
              auVar145 = vfmadd213ps_avx512f(auVar145,auVar143,(undefined1  [64])afVar73);
              auVar143 = vfmadd213ps_avx512f(auVar145,auVar144,auVar143);
              auVar143 = vaddps_avx512f(auVar143,(undefined1  [64])afVar270);
              auVar144 = vcvttps2dq_avx512f(auVar178);
              auVar144 = vpaddd_avx512f(auVar144,auVar142);
              auVar144 = vpslld_avx512f(auVar144,0x17);
              auVar143 = vmulps_avx512f(auVar143,auVar144);
              *pauVar74 = auVar143;
              auVar102 = vextractf64x4_avx512f(auVar143,1);
              fVar192 = auVar143._4_4_ + auVar102._4_4_;
              auVar90._0_4_ = auVar143._0_4_ + auVar102._0_4_ + auVar143._16_4_ + auVar102._16_4_;
              auVar90._4_4_ = fVar192 + fVar192;
              auVar90._8_4_ = auVar143._8_4_ + auVar102._8_4_ + auVar143._24_4_ + auVar102._24_4_;
              auVar90._12_4_ = auVar143._12_4_ + auVar102._12_4_ + auVar143._28_4_ + auVar102._28_4_
              ;
              auVar86 = vshufpd_avx(auVar90,auVar90,1);
              auVar91._0_4_ = auVar86._0_4_ + auVar90._0_4_;
              auVar91._4_4_ = auVar86._4_4_ + auVar90._4_4_;
              auVar91._8_4_ = auVar86._8_4_ + auVar90._8_4_;
              auVar91._12_4_ = auVar86._12_4_ + auVar90._12_4_;
              auVar86 = vmovshdup_avx(auVar91);
              *(float *)(*pauVar78 + lVar83 * 4) =
                   auVar86._0_4_ + *(float *)(*pauVar78 + lVar83 * 4) + auVar91._0_4_;
              pauVar74 = pauVar74 + 1;
              lVar83 = lVar83 + 1;
            } while (size1 - uVar75 != (int)lVar83);
          }
          uVar77 = uVar77 + 1;
        } while (uVar77 != uVar76);
      }
    }
    uVar75 = 0;
    pauVar74 = (undefined1 (*) [64])_sumptr;
    if (0xf < size1) {
      iVar79 = 0xf;
      auVar140 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        auVar141 = vdivps_avx512f(auVar140,*pauVar74);
        *pauVar74 = auVar141;
        pauVar74 = pauVar74 + 1;
        iVar79 = iVar79 + 0x10;
      } while (iVar79 < size1);
      uVar75 = size1 & 0x7ffffff0;
    }
    if ((int)(uVar75 | 7) < size1) {
      auVar198._8_4_ = 0x3f800000;
      auVar198._0_8_ = 0x3f8000003f800000;
      auVar198._12_4_ = 0x3f800000;
      auVar198._16_4_ = 0x3f800000;
      auVar198._20_4_ = 0x3f800000;
      auVar198._24_4_ = 0x3f800000;
      auVar198._28_4_ = 0x3f800000;
      uVar84 = uVar75;
      do {
        auVar102 = vdivps_avx(auVar198,*(undefined1 (*) [32])*pauVar74);
        *(undefined1 (*) [32])*pauVar74 = auVar102;
        pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x20);
        uVar75 = uVar84 + 8;
        iVar79 = uVar84 + 0xf;
        uVar84 = uVar75;
      } while (iVar79 < size1);
    }
    if ((int)(uVar75 | 3) < size1) {
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = 0x3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      uVar84 = uVar75;
      do {
        auVar86 = vdivps_avx(auVar93,*(undefined1 (*) [16])*pauVar74);
        *(undefined1 (*) [16])*pauVar74 = auVar86;
        pauVar74 = (undefined1 (*) [64])(*pauVar74 + 0x10);
        uVar75 = uVar84 + 4;
        iVar79 = uVar84 + 7;
        uVar84 = uVar75;
      } while (iVar79 < size1);
    }
    if ((int)uVar75 < size1) {
      auVar140 = vpbroadcastq_avx512f();
      uVar77 = 0;
      auVar141 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar142 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar143 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        auVar144 = vpbroadcastq_avx512f();
        auVar145 = vporq_avx512f(auVar144,auVar141);
        auVar144 = vporq_avx512f(auVar144,auVar142);
        uVar21 = vpcmpuq_avx512f(auVar144,auVar140,2);
        bVar59 = (byte)uVar21;
        uVar21 = vpcmpuq_avx512f(auVar145,auVar140,2);
        bVar62 = (byte)uVar21;
        uVar85 = CONCAT11(bVar62,bVar59);
        piVar2 = (int *)(*pauVar74 + uVar77 * 4);
        auVar190._4_4_ = (uint)((byte)(uVar85 >> 1) & 1) * piVar2[1];
        auVar190._0_4_ = (uint)(bVar59 & 1) * *piVar2;
        auVar190._8_4_ = (uint)((byte)(uVar85 >> 2) & 1) * piVar2[2];
        auVar190._12_4_ = (uint)((byte)(uVar85 >> 3) & 1) * piVar2[3];
        auVar190._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * piVar2[4];
        auVar190._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * piVar2[5];
        auVar190._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * piVar2[6];
        auVar190._28_4_ = (uint)((byte)(uVar85 >> 7) & 1) * piVar2[7];
        auVar190._32_4_ = (uint)(bVar62 & 1) * piVar2[8];
        auVar190._36_4_ = (uint)(bVar62 >> 1 & 1) * piVar2[9];
        auVar190._40_4_ = (uint)(bVar62 >> 2 & 1) * piVar2[10];
        auVar190._44_4_ = (uint)(bVar62 >> 3 & 1) * piVar2[0xb];
        auVar190._48_4_ = (uint)(bVar62 >> 4 & 1) * piVar2[0xc];
        auVar190._52_4_ = (uint)(bVar62 >> 5 & 1) * piVar2[0xd];
        auVar190._56_4_ = (uint)(bVar62 >> 6 & 1) * piVar2[0xe];
        auVar190._60_4_ = (uint)(bVar62 >> 7) * piVar2[0xf];
        auVar144 = vdivps_avx512f(auVar143,auVar190);
        puVar1 = (uint *)(*pauVar74 + uVar77 * 4);
        bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar85 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar85 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar85 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar85 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar85 >> 6) & 1);
        bVar12 = (bool)((byte)(uVar85 >> 7) & 1);
        bVar13 = (bool)(bVar62 >> 1 & 1);
        bVar14 = (bool)(bVar62 >> 2 & 1);
        bVar15 = (bool)(bVar62 >> 3 & 1);
        bVar16 = (bool)(bVar62 >> 4 & 1);
        bVar17 = (bool)(bVar62 >> 5 & 1);
        bVar18 = (bool)(bVar62 >> 6 & 1);
        *puVar1 = (uint)(bVar59 & 1) * auVar144._0_4_ | (uint)!(bool)(bVar59 & 1) * *puVar1;
        puVar1[1] = (uint)bVar6 * auVar144._4_4_ | (uint)!bVar6 * puVar1[1];
        puVar1[2] = (uint)bVar7 * auVar144._8_4_ | (uint)!bVar7 * puVar1[2];
        puVar1[3] = (uint)bVar8 * auVar144._12_4_ | (uint)!bVar8 * puVar1[3];
        puVar1[4] = (uint)bVar9 * auVar144._16_4_ | (uint)!bVar9 * puVar1[4];
        puVar1[5] = (uint)bVar10 * auVar144._20_4_ | (uint)!bVar10 * puVar1[5];
        puVar1[6] = (uint)bVar11 * auVar144._24_4_ | (uint)!bVar11 * puVar1[6];
        puVar1[7] = (uint)bVar12 * auVar144._28_4_ | (uint)!bVar12 * puVar1[7];
        puVar1[8] = (uint)(bVar62 & 1) * auVar144._32_4_ | (uint)!(bool)(bVar62 & 1) * puVar1[8];
        puVar1[9] = (uint)bVar13 * auVar144._36_4_ | (uint)!bVar13 * puVar1[9];
        puVar1[10] = (uint)bVar14 * auVar144._40_4_ | (uint)!bVar14 * puVar1[10];
        puVar1[0xb] = (uint)bVar15 * auVar144._44_4_ | (uint)!bVar15 * puVar1[0xb];
        puVar1[0xc] = (uint)bVar16 * auVar144._48_4_ | (uint)!bVar16 * puVar1[0xc];
        puVar1[0xd] = (uint)bVar17 * auVar144._52_4_ | (uint)!bVar17 * puVar1[0xd];
        puVar1[0xe] = (uint)bVar18 * auVar144._56_4_ | (uint)!bVar18 * puVar1[0xe];
        puVar1[0xf] = (uint)(bVar62 >> 7) * auVar144._60_4_ |
                      (uint)!(bool)(bVar62 >> 7) * puVar1[0xf];
        uVar77 = uVar77 + 0x10;
      } while (((ulong)(~uVar75 + size1) + 0x10 & 0xfffffffffffffff0) != uVar77);
    }
    if (0 < elemcount) {
      uVar77 = 0;
      do {
        pauVar74 = (undefined1 (*) [64])(_ptr + uVar77 * lVar81);
        pfVar80 = _sumptr;
        if (size1 < 4) {
          uVar75 = 0;
        }
        else {
          iVar79 = 3;
          do {
            auVar140 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar80));
            auVar140 = vmulps_avx512f(auVar140,*pauVar74);
            auVar141 = vbroadcastss_avx512f(ZEXT416((uint)pfVar80[1]));
            auVar141 = vmulps_avx512f(auVar141,pauVar74[1]);
            auVar142 = vbroadcastss_avx512f(ZEXT416((uint)pfVar80[2]));
            auVar142 = vmulps_avx512f(auVar142,pauVar74[2]);
            auVar143 = vbroadcastss_avx512f(ZEXT416((uint)pfVar80[3]));
            auVar143 = vmulps_avx512f(auVar143,pauVar74[3]);
            *pauVar74 = auVar140;
            pauVar74[1] = auVar141;
            pauVar74[2] = auVar142;
            pauVar74[3] = auVar143;
            pauVar74 = pauVar74 + 4;
            pfVar80 = pfVar80 + 4;
            iVar79 = iVar79 + 4;
            uVar75 = size1 & 0xfffffffc;
          } while (iVar79 < size1);
        }
        if ((int)uVar75 < size1) {
          lVar83 = 0;
          do {
            auVar140 = vbroadcastss_avx512f(ZEXT416((uint)pfVar80[lVar83]));
            auVar140 = vmulps_avx512f(auVar140,*pauVar74);
            *pauVar74 = auVar140;
            pauVar74 = pauVar74 + 1;
            lVar83 = lVar83 + 1;
          } while (size1 - uVar75 != (int)lVar83);
        }
        uVar77 = uVar77 + 1;
      } while (uVar77 != uVar76);
    }
  }
  return;
}

Assistant:

static void softmax(float* _ptr, int elemcount, int elempack, int stride, int size1, float* _maxptr, float* _sumptr)
{
    // reduce max
    {
        float* maxptr = _maxptr;

        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _negmax_avx512 = _mm512_set1_ps(-FLT_MAX);
        for (; j + 15 < size1; j += 16)
        {
            _mm512_storeu_ps(maxptr, _negmax_avx512);
            maxptr += 16;
        }
#endif // __AVX512F__
        __m256 _negmax_avx = _mm256_set1_ps(-FLT_MAX);
        for (; j + 7 < size1; j += 8)
        {
            _mm256_storeu_ps(maxptr, _negmax_avx);
            maxptr += 8;
        }
#endif // __AVX__
        __m128 _negmax = _mm_set1_ps(-FLT_MAX);
        for (; j + 3 < size1; j += 4)
        {
            _mm_storeu_ps(maxptr, _negmax);
            maxptr += 4;
        }
#endif // __SSE2__
        for (; j < size1; j++)
        {
            *maxptr++ = -FLT_MAX;
        }
    }

    // reduce exp(x - max)
    {
        float* sumptr = _sumptr;

        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_set1_ps(0.f);
        for (; j + 15 < size1; j += 16)
        {
            _mm512_storeu_ps(sumptr, _zero_avx512);
            sumptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_set1_ps(0.f);
        for (; j + 7 < size1; j += 8)
        {
            _mm256_storeu_ps(sumptr, _zero_avx);
            sumptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_set1_ps(0.f);
        for (; j + 3 < size1; j += 4)
        {
            _mm_storeu_ps(sumptr, _zero);
            sumptr += 4;
        }
#endif // __SSE2__
        for (; j < size1; j++)
        {
            *sumptr++ = 0.f;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        softmax_pack16(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        softmax_pack8(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
#endif // __AVX__
    if (elempack == 4)
    {
        softmax_pack4(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
#endif // __SSE2__
    if (elempack == 1)
    {
        softmax_pack1(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
}